

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  Primitive PVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [28];
  undefined1 auVar115 [28];
  undefined1 auVar116 [12];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  uint uVar122;
  int iVar123;
  ulong uVar124;
  RTCIntersectArguments *pRVar125;
  uint uVar126;
  ulong uVar127;
  long lVar128;
  float fVar133;
  float fVar134;
  float fVar135;
  long lVar129;
  Geometry *pGVar130;
  bool bVar131;
  float fVar132;
  float fVar150;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar148;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar149;
  float fVar151;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar170;
  vint4 bi;
  undefined1 auVar155 [16];
  float fVar168;
  float fVar172;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar177;
  float fVar181;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar169;
  float fVar171;
  float fVar174;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar160 [24];
  float fVar173;
  float fVar175;
  float fVar179;
  undefined1 auVar167 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  vint4 bi_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar193;
  undefined1 auVar190 [32];
  float fVar194;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar195;
  float fVar208;
  float fVar209;
  vint4 ai_1;
  undefined1 auVar196 [16];
  float fVar210;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar214;
  undefined1 auVar207 [64];
  float fVar215;
  float fVar224;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar216 [16];
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar227;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar228;
  float fVar233;
  float fVar234;
  undefined1 auVar229 [16];
  float fVar235;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar236;
  undefined1 auVar232 [32];
  float fVar237;
  float fVar238;
  float fVar246;
  float fVar248;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar247;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar245 [32];
  vint4 ai;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar268;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar269;
  float fVar274;
  float fVar275;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar276;
  undefined1 auVar273 [32];
  float fVar277;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar278 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar289;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar296;
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar301;
  float fVar303;
  float fVar304;
  undefined1 auVar302 [16];
  float fVar305;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [16];
  float fVar318;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [64];
  float fVar319;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar331 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7e4;
  uint local_7e0;
  undefined4 uStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [48];
  ulong local_770;
  Precalculations *local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [8];
  undefined8 uStack_668;
  undefined8 local_660;
  undefined4 local_658;
  float local_654;
  uint local_650;
  undefined4 local_64c;
  undefined4 local_648;
  uint local_644;
  uint local_640;
  ulong local_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  undefined8 uStack_598;
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  Primitive *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  local_768 = pre;
  PVar14 = prim[1];
  uVar127 = (ulong)(byte)PVar14;
  lVar18 = uVar127 * 0x25;
  fVar135 = *(float *)(prim + lVar18 + 0x12);
  auVar331 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar18 + 6));
  auVar155._0_4_ = fVar135 * auVar331._0_4_;
  auVar155._4_4_ = fVar135 * auVar331._4_4_;
  auVar155._8_4_ = fVar135 * auVar331._8_4_;
  auVar155._12_4_ = fVar135 * auVar331._12_4_;
  auVar261._0_4_ = fVar135 * (ray->dir).field_0.m128[0];
  auVar261._4_4_ = fVar135 * (ray->dir).field_0.m128[1];
  auVar261._8_4_ = fVar135 * (ray->dir).field_0.m128[2];
  auVar261._12_4_ = fVar135 * (ray->dir).field_0.m128[3];
  auVar331 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 4 + 6)));
  auVar331 = vcvtdq2ps_avx(auVar331);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 5 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar199 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 6 + 6)));
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0xf + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar127 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1a + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1b + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1c + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vshufps_avx(auVar261,auVar261,0);
  auVar28 = vshufps_avx(auVar261,auVar261,0x55);
  auVar29 = vshufps_avx(auVar261,auVar261,0xaa);
  fVar135 = auVar29._0_4_;
  fVar168 = auVar29._4_4_;
  fVar170 = auVar29._8_4_;
  fVar172 = auVar29._12_4_;
  fVar215 = auVar28._0_4_;
  fVar224 = auVar28._4_4_;
  fVar225 = auVar28._8_4_;
  fVar226 = auVar28._12_4_;
  fVar195 = auVar27._0_4_;
  fVar208 = auVar27._4_4_;
  fVar209 = auVar27._8_4_;
  fVar210 = auVar27._12_4_;
  auVar306._0_4_ = fVar195 * auVar331._0_4_ + fVar215 * auVar198._0_4_ + fVar135 * auVar199._0_4_;
  auVar306._4_4_ = fVar208 * auVar331._4_4_ + fVar224 * auVar198._4_4_ + fVar168 * auVar199._4_4_;
  auVar306._8_4_ = fVar209 * auVar331._8_4_ + fVar225 * auVar198._8_4_ + fVar170 * auVar199._8_4_;
  auVar306._12_4_ =
       fVar210 * auVar331._12_4_ + fVar226 * auVar198._12_4_ + fVar172 * auVar199._12_4_;
  auVar313._0_4_ = fVar195 * auVar200._0_4_ + fVar215 * auVar22._0_4_ + auVar23._0_4_ * fVar135;
  auVar313._4_4_ = fVar208 * auVar200._4_4_ + fVar224 * auVar22._4_4_ + auVar23._4_4_ * fVar168;
  auVar313._8_4_ = fVar209 * auVar200._8_4_ + fVar225 * auVar22._8_4_ + auVar23._8_4_ * fVar170;
  auVar313._12_4_ = fVar210 * auVar200._12_4_ + fVar226 * auVar22._12_4_ + auVar23._12_4_ * fVar172;
  auVar262._0_4_ = fVar195 * auVar24._0_4_ + fVar215 * auVar25._0_4_ + auVar26._0_4_ * fVar135;
  auVar262._4_4_ = fVar208 * auVar24._4_4_ + fVar224 * auVar25._4_4_ + auVar26._4_4_ * fVar168;
  auVar262._8_4_ = fVar209 * auVar24._8_4_ + fVar225 * auVar25._8_4_ + auVar26._8_4_ * fVar170;
  auVar262._12_4_ = fVar210 * auVar24._12_4_ + fVar226 * auVar25._12_4_ + auVar26._12_4_ * fVar172;
  auVar27 = vshufps_avx(auVar155,auVar155,0);
  auVar28 = vshufps_avx(auVar155,auVar155,0x55);
  auVar29 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar135 = auVar29._0_4_;
  fVar168 = auVar29._4_4_;
  fVar170 = auVar29._8_4_;
  fVar172 = auVar29._12_4_;
  fVar215 = auVar28._0_4_;
  fVar224 = auVar28._4_4_;
  fVar225 = auVar28._8_4_;
  fVar226 = auVar28._12_4_;
  fVar195 = auVar27._0_4_;
  fVar208 = auVar27._4_4_;
  fVar209 = auVar27._8_4_;
  fVar210 = auVar27._12_4_;
  auVar156._0_4_ = fVar195 * auVar331._0_4_ + fVar215 * auVar198._0_4_ + fVar135 * auVar199._0_4_;
  auVar156._4_4_ = fVar208 * auVar331._4_4_ + fVar224 * auVar198._4_4_ + fVar168 * auVar199._4_4_;
  auVar156._8_4_ = fVar209 * auVar331._8_4_ + fVar225 * auVar198._8_4_ + fVar170 * auVar199._8_4_;
  auVar156._12_4_ =
       fVar210 * auVar331._12_4_ + fVar226 * auVar198._12_4_ + fVar172 * auVar199._12_4_;
  auVar136._0_4_ = fVar195 * auVar200._0_4_ + auVar23._0_4_ * fVar135 + fVar215 * auVar22._0_4_;
  auVar136._4_4_ = fVar208 * auVar200._4_4_ + auVar23._4_4_ * fVar168 + fVar224 * auVar22._4_4_;
  auVar136._8_4_ = fVar209 * auVar200._8_4_ + auVar23._8_4_ * fVar170 + fVar225 * auVar22._8_4_;
  auVar136._12_4_ = fVar210 * auVar200._12_4_ + auVar23._12_4_ * fVar172 + fVar226 * auVar22._12_4_;
  auVar270._8_4_ = 0x7fffffff;
  auVar270._0_8_ = 0x7fffffff7fffffff;
  auVar270._12_4_ = 0x7fffffff;
  auVar331 = vandps_avx(auVar306,auVar270);
  auVar216._8_4_ = 0x219392ef;
  auVar216._0_8_ = 0x219392ef219392ef;
  auVar216._12_4_ = 0x219392ef;
  auVar331 = vcmpps_avx(auVar331,auVar216,1);
  auVar198 = vblendvps_avx(auVar306,auVar216,auVar331);
  auVar331 = vandps_avx(auVar313,auVar270);
  auVar331 = vcmpps_avx(auVar331,auVar216,1);
  auVar199 = vblendvps_avx(auVar313,auVar216,auVar331);
  auVar331 = vandps_avx(auVar270,auVar262);
  auVar331 = vcmpps_avx(auVar331,auVar216,1);
  auVar331 = vblendvps_avx(auVar262,auVar216,auVar331);
  auVar183._0_4_ = fVar195 * auVar24._0_4_ + fVar215 * auVar25._0_4_ + auVar26._0_4_ * fVar135;
  auVar183._4_4_ = fVar208 * auVar24._4_4_ + fVar224 * auVar25._4_4_ + auVar26._4_4_ * fVar168;
  auVar183._8_4_ = fVar209 * auVar24._8_4_ + fVar225 * auVar25._8_4_ + auVar26._8_4_ * fVar170;
  auVar183._12_4_ = fVar210 * auVar24._12_4_ + fVar226 * auVar25._12_4_ + auVar26._12_4_ * fVar172;
  auVar200 = vrcpps_avx(auVar198);
  fVar195 = auVar200._0_4_;
  auVar196._0_4_ = fVar195 * auVar198._0_4_;
  fVar208 = auVar200._4_4_;
  auVar196._4_4_ = fVar208 * auVar198._4_4_;
  fVar209 = auVar200._8_4_;
  auVar196._8_4_ = fVar209 * auVar198._8_4_;
  fVar210 = auVar200._12_4_;
  auVar196._12_4_ = fVar210 * auVar198._12_4_;
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = 0x3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar198 = vsubps_avx(auVar239,auVar196);
  fVar195 = fVar195 + fVar195 * auVar198._0_4_;
  fVar208 = fVar208 + fVar208 * auVar198._4_4_;
  fVar209 = fVar209 + fVar209 * auVar198._8_4_;
  fVar210 = fVar210 + fVar210 * auVar198._12_4_;
  auVar198 = vrcpps_avx(auVar199);
  fVar215 = auVar198._0_4_;
  auVar229._0_4_ = fVar215 * auVar199._0_4_;
  fVar224 = auVar198._4_4_;
  auVar229._4_4_ = fVar224 * auVar199._4_4_;
  fVar225 = auVar198._8_4_;
  auVar229._8_4_ = fVar225 * auVar199._8_4_;
  fVar226 = auVar198._12_4_;
  auVar229._12_4_ = fVar226 * auVar199._12_4_;
  auVar198 = vsubps_avx(auVar239,auVar229);
  fVar215 = fVar215 + fVar215 * auVar198._0_4_;
  fVar224 = fVar224 + fVar224 * auVar198._4_4_;
  fVar225 = fVar225 + fVar225 * auVar198._8_4_;
  fVar226 = fVar226 + fVar226 * auVar198._12_4_;
  auVar198 = vrcpps_avx(auVar331);
  fVar228 = auVar198._0_4_;
  auVar263._0_4_ = fVar228 * auVar331._0_4_;
  fVar233 = auVar198._4_4_;
  auVar263._4_4_ = fVar233 * auVar331._4_4_;
  fVar234 = auVar198._8_4_;
  auVar263._8_4_ = fVar234 * auVar331._8_4_;
  fVar235 = auVar198._12_4_;
  auVar263._12_4_ = fVar235 * auVar331._12_4_;
  auVar331 = vsubps_avx(auVar239,auVar263);
  fVar228 = fVar228 + fVar228 * auVar331._0_4_;
  fVar233 = fVar233 + fVar233 * auVar331._4_4_;
  fVar234 = fVar234 + fVar234 * auVar331._8_4_;
  fVar235 = fVar235 + fVar235 * auVar331._12_4_;
  auVar331 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar18 + 0x16)) *
                           *(float *)(prim + lVar18 + 0x1a)));
  auVar199 = vshufps_avx(auVar331,auVar331,0);
  auVar331._8_8_ = 0;
  auVar331._0_8_ = *(ulong *)(prim + uVar127 * 7 + 6);
  auVar331 = vpmovsxwd_avx(auVar331);
  auVar331 = vcvtdq2ps_avx(auVar331);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar127 * 0xb + 6);
  auVar198 = vpmovsxwd_avx(auVar198);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar200 = vsubps_avx(auVar198,auVar331);
  fVar135 = auVar199._0_4_;
  fVar168 = auVar199._4_4_;
  fVar170 = auVar199._8_4_;
  fVar172 = auVar199._12_4_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar127 * 9 + 6);
  auVar198 = vpmovsxwd_avx(auVar199);
  auVar264._0_4_ = auVar200._0_4_ * fVar135 + auVar331._0_4_;
  auVar264._4_4_ = auVar200._4_4_ * fVar168 + auVar331._4_4_;
  auVar264._8_4_ = auVar200._8_4_ * fVar170 + auVar331._8_4_;
  auVar264._12_4_ = auVar200._12_4_ * fVar172 + auVar331._12_4_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar127 * 0xd + 6);
  auVar199 = vpmovsxwd_avx(auVar200);
  auVar331 = vcvtdq2ps_avx(auVar198);
  auVar198 = vcvtdq2ps_avx(auVar199);
  auVar198 = vsubps_avx(auVar198,auVar331);
  auVar271._0_4_ = auVar198._0_4_ * fVar135 + auVar331._0_4_;
  auVar271._4_4_ = auVar198._4_4_ * fVar168 + auVar331._4_4_;
  auVar271._8_4_ = auVar198._8_4_ * fVar170 + auVar331._8_4_;
  auVar271._12_4_ = auVar198._12_4_ * fVar172 + auVar331._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar127 * 0x12 + 6);
  auVar331 = vpmovsxwd_avx(auVar22);
  uVar124 = (ulong)(uint)((int)(uVar127 * 5) << 2);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar127 * 2 + uVar124 + 6);
  auVar198 = vpmovsxwd_avx(auVar23);
  auVar331 = vcvtdq2ps_avx(auVar331);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar198 = vsubps_avx(auVar198,auVar331);
  auVar278._0_4_ = auVar198._0_4_ * fVar135 + auVar331._0_4_;
  auVar278._4_4_ = auVar198._4_4_ * fVar168 + auVar331._4_4_;
  auVar278._8_4_ = auVar198._8_4_ * fVar170 + auVar331._8_4_;
  auVar278._12_4_ = auVar198._12_4_ * fVar172 + auVar331._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar124 + 6);
  auVar331 = vpmovsxwd_avx(auVar24);
  auVar331 = vcvtdq2ps_avx(auVar331);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar127 * 0x18 + 6);
  auVar198 = vpmovsxwd_avx(auVar25);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar199 = vsubps_avx(auVar198,auVar331);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar127 * 0x1d + 6);
  auVar198 = vpmovsxwd_avx(auVar26);
  auVar297._0_4_ = auVar199._0_4_ * fVar135 + auVar331._0_4_;
  auVar297._4_4_ = auVar199._4_4_ * fVar168 + auVar331._4_4_;
  auVar297._8_4_ = auVar199._8_4_ * fVar170 + auVar331._8_4_;
  auVar297._12_4_ = auVar199._12_4_ * fVar172 + auVar331._12_4_;
  auVar331 = vcvtdq2ps_avx(auVar198);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar127 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar198 = vpmovsxwd_avx(auVar27);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar198 = vsubps_avx(auVar198,auVar331);
  auVar302._0_4_ = auVar198._0_4_ * fVar135 + auVar331._0_4_;
  auVar302._4_4_ = auVar198._4_4_ * fVar168 + auVar331._4_4_;
  auVar302._8_4_ = auVar198._8_4_ * fVar170 + auVar331._8_4_;
  auVar302._12_4_ = auVar198._12_4_ * fVar172 + auVar331._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar127) + 6);
  auVar331 = vpmovsxwd_avx(auVar28);
  auVar331 = vcvtdq2ps_avx(auVar331);
  local_4c8 = prim;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar127 * 0x23 + 6);
  auVar198 = vpmovsxwd_avx(auVar29);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar198 = vsubps_avx(auVar198,auVar331);
  auVar240._0_4_ = auVar331._0_4_ + auVar198._0_4_ * fVar135;
  auVar240._4_4_ = auVar331._4_4_ + auVar198._4_4_ * fVar168;
  auVar240._8_4_ = auVar331._8_4_ + auVar198._8_4_ * fVar170;
  auVar240._12_4_ = auVar331._12_4_ + auVar198._12_4_ * fVar172;
  auVar331 = vsubps_avx(auVar264,auVar156);
  auVar265._0_4_ = fVar195 * auVar331._0_4_;
  auVar265._4_4_ = fVar208 * auVar331._4_4_;
  auVar265._8_4_ = fVar209 * auVar331._8_4_;
  auVar265._12_4_ = fVar210 * auVar331._12_4_;
  auVar331 = vsubps_avx(auVar271,auVar156);
  auVar157._0_4_ = fVar195 * auVar331._0_4_;
  auVar157._4_4_ = fVar208 * auVar331._4_4_;
  auVar157._8_4_ = fVar209 * auVar331._8_4_;
  auVar157._12_4_ = fVar210 * auVar331._12_4_;
  auVar331 = vsubps_avx(auVar278,auVar136);
  auVar197._0_4_ = fVar215 * auVar331._0_4_;
  auVar197._4_4_ = fVar224 * auVar331._4_4_;
  auVar197._8_4_ = fVar225 * auVar331._8_4_;
  auVar197._12_4_ = fVar226 * auVar331._12_4_;
  auVar331 = vsubps_avx(auVar297,auVar136);
  auVar137._0_4_ = fVar215 * auVar331._0_4_;
  auVar137._4_4_ = fVar224 * auVar331._4_4_;
  auVar137._8_4_ = fVar225 * auVar331._8_4_;
  auVar137._12_4_ = fVar226 * auVar331._12_4_;
  auVar331 = vsubps_avx(auVar302,auVar183);
  auVar217._0_4_ = fVar228 * auVar331._0_4_;
  auVar217._4_4_ = fVar233 * auVar331._4_4_;
  auVar217._8_4_ = fVar234 * auVar331._8_4_;
  auVar217._12_4_ = fVar235 * auVar331._12_4_;
  auVar331 = vsubps_avx(auVar240,auVar183);
  auVar184._0_4_ = fVar228 * auVar331._0_4_;
  auVar184._4_4_ = fVar233 * auVar331._4_4_;
  auVar184._8_4_ = fVar234 * auVar331._8_4_;
  auVar184._12_4_ = fVar235 * auVar331._12_4_;
  auVar331 = vpminsd_avx(auVar265,auVar157);
  auVar198 = vpminsd_avx(auVar197,auVar137);
  auVar331 = vmaxps_avx(auVar331,auVar198);
  auVar198 = vpminsd_avx(auVar217,auVar184);
  uVar12 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar272._4_4_ = uVar12;
  auVar272._0_4_ = uVar12;
  auVar272._8_4_ = uVar12;
  auVar272._12_4_ = uVar12;
  auVar198 = vmaxps_avx(auVar198,auVar272);
  auVar331 = vmaxps_avx(auVar331,auVar198);
  local_2d0._0_4_ = auVar331._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar331._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar331._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar331._12_4_ * 0.99999964;
  auVar331 = vpmaxsd_avx(auVar265,auVar157);
  auVar198 = vpmaxsd_avx(auVar197,auVar137);
  auVar331 = vminps_avx(auVar331,auVar198);
  auVar198 = vpmaxsd_avx(auVar217,auVar184);
  fVar135 = ray->tfar;
  auVar185._4_4_ = fVar135;
  auVar185._0_4_ = fVar135;
  auVar185._8_4_ = fVar135;
  auVar185._12_4_ = fVar135;
  auVar198 = vminps_avx(auVar198,auVar185);
  auVar331 = vminps_avx(auVar331,auVar198);
  auVar138._0_4_ = auVar331._0_4_ * 1.0000004;
  auVar138._4_4_ = auVar331._4_4_ * 1.0000004;
  auVar138._8_4_ = auVar331._8_4_ * 1.0000004;
  auVar138._12_4_ = auVar331._12_4_ * 1.0000004;
  auVar331 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar198 = vpcmpgtd_avx(auVar331,_DAT_01f7fcf0);
  auVar331 = vcmpps_avx(local_2d0,auVar138,2);
  auVar331 = vandps_avx(auVar331,auVar198);
  uVar122 = vmovmskps_avx(auVar331);
  if (uVar122 != 0) {
    local_4c0 = mm_lookupmask_ps._16_8_;
    uStack_4b8 = mm_lookupmask_ps._24_8_;
    uStack_4b0 = mm_lookupmask_ps._16_8_;
    uStack_4a8 = mm_lookupmask_ps._24_8_;
    uVar122 = uVar122 & 0xff;
    do {
      lVar18 = 0;
      if (uVar122 != 0) {
        for (; (uVar122 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      local_770 = (ulong)*(uint *)(local_4c8 + 2);
      pGVar130 = (context->scene->geometries).items[*(uint *)(local_4c8 + 2)].ptr;
      local_628 = (ulong)*(uint *)(local_4c8 + lVar18 * 4 + 6);
      uVar127 = (ulong)*(uint *)(*(long *)&pGVar130->field_0x58 +
                                (ulong)*(uint *)(local_4c8 + lVar18 * 4 + 6) *
                                pGVar130[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar135 = (pGVar130->time_range).lower;
      fVar135 = pGVar130->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar135) / ((pGVar130->time_range).upper - fVar135));
      auVar331 = vroundss_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),9);
      auVar331 = vminss_avx(auVar331,ZEXT416((uint)(pGVar130->fnumTimeSegments + -1.0)));
      auVar331 = vmaxss_avx(ZEXT816(0) << 0x20,auVar331);
      fVar135 = fVar135 - auVar331._0_4_;
      _Var15 = pGVar130[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar331._0_4_ * 0x38;
      lVar18 = *(long *)(_Var15 + 0x10 + lVar129);
      lVar128 = *(long *)(_Var15 + 0x38 + lVar129);
      lVar16 = *(long *)(_Var15 + 0x48 + lVar129);
      auVar331 = vshufps_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),0);
      pfVar1 = (float *)(lVar128 + uVar127 * lVar16);
      fVar168 = auVar331._0_4_;
      fVar170 = auVar331._4_4_;
      fVar172 = auVar331._8_4_;
      fVar195 = auVar331._12_4_;
      pfVar2 = (float *)(lVar128 + (uVar127 + 1) * lVar16);
      pfVar3 = (float *)(lVar128 + (uVar127 + 2) * lVar16);
      pfVar4 = (float *)(lVar128 + lVar16 * (uVar127 + 3));
      lVar128 = *(long *)(_Var15 + lVar129);
      auVar331 = vshufps_avx(ZEXT416((uint)(1.0 - fVar135)),ZEXT416((uint)(1.0 - fVar135)),0);
      pfVar5 = (float *)(lVar128 + lVar18 * uVar127);
      fVar135 = auVar331._0_4_;
      fVar208 = auVar331._4_4_;
      fVar209 = auVar331._8_4_;
      fVar210 = auVar331._12_4_;
      pfVar6 = (float *)(lVar128 + lVar18 * (uVar127 + 1));
      pfVar7 = (float *)(lVar128 + lVar18 * (uVar127 + 2));
      pfVar8 = (float *)(lVar128 + lVar18 * (uVar127 + 3));
      uVar126 = (uint)pGVar130[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar18 = (long)(int)uVar126 * 0x44;
      local_670 = (undefined1  [8])
                  CONCAT44(fVar170 * pfVar1[1] + fVar208 * pfVar5[1],
                           fVar168 * *pfVar1 + fVar135 * *pfVar5);
      uStack_668._0_4_ = fVar172 * pfVar1[2] + fVar209 * pfVar5[2];
      uStack_668._4_4_ = fVar195 * pfVar1[3] + fVar210 * pfVar5[3];
      local_590 = (undefined1  [8])
                  CONCAT44(fVar208 * pfVar6[1] + fVar170 * pfVar2[1],
                           fVar135 * *pfVar6 + fVar168 * *pfVar2);
      uStack_588._0_4_ = fVar209 * pfVar6[2] + fVar172 * pfVar2[2];
      uStack_588._4_4_ = fVar210 * pfVar6[3] + fVar195 * pfVar2[3];
      local_5a0 = (undefined1  [8])
                  CONCAT44(fVar208 * pfVar7[1] + fVar170 * pfVar3[1],
                           fVar135 * *pfVar7 + fVar168 * *pfVar3);
      uStack_598._0_4_ = fVar209 * pfVar7[2] + fVar172 * pfVar3[2];
      uStack_598._4_4_ = fVar210 * pfVar7[3] + fVar195 * pfVar3[3];
      local_5b0._0_4_ = fVar135 * *pfVar8 + fVar168 * *pfVar4;
      local_5b0._4_4_ = fVar208 * pfVar8[1] + fVar170 * pfVar4[1];
      fStack_5a8 = fVar209 * pfVar8[2] + fVar172 * pfVar4[2];
      fStack_5a4 = fVar210 * pfVar8[3] + fVar195 * pfVar4[3];
      aVar13 = (ray->org).field_0.field_1;
      auVar199 = vsubps_avx(_local_670,(undefined1  [16])aVar13);
      auVar24 = _local_670;
      auVar331 = vshufps_avx(auVar199,auVar199,0);
      auVar198 = vshufps_avx(auVar199,auVar199,0x55);
      auVar199 = vshufps_avx(auVar199,auVar199,0xaa);
      fVar135 = (local_768->ray_space).vx.field_0.m128[0];
      fVar168 = (local_768->ray_space).vx.field_0.m128[1];
      fVar170 = (local_768->ray_space).vx.field_0.m128[2];
      fVar172 = (local_768->ray_space).vx.field_0.m128[3];
      fVar195 = (local_768->ray_space).vy.field_0.m128[0];
      fVar208 = (local_768->ray_space).vy.field_0.m128[1];
      fVar209 = (local_768->ray_space).vy.field_0.m128[2];
      fVar210 = (local_768->ray_space).vy.field_0.m128[3];
      fVar215 = (local_768->ray_space).vz.field_0.m128[0];
      fVar224 = (local_768->ray_space).vz.field_0.m128[1];
      fVar225 = (local_768->ray_space).vz.field_0.m128[2];
      fVar226 = (local_768->ray_space).vz.field_0.m128[3];
      auVar186._0_4_ =
           auVar331._0_4_ * fVar135 + auVar199._0_4_ * fVar215 + auVar198._0_4_ * fVar195;
      auVar186._4_4_ =
           auVar331._4_4_ * fVar168 + auVar199._4_4_ * fVar224 + auVar198._4_4_ * fVar208;
      auVar186._8_4_ =
           auVar331._8_4_ * fVar170 + auVar199._8_4_ * fVar225 + auVar198._8_4_ * fVar209;
      auVar186._12_4_ =
           auVar331._12_4_ * fVar172 + auVar199._12_4_ * fVar226 + auVar198._12_4_ * fVar210;
      auVar331 = vblendps_avx(auVar186,_local_670,8);
      auVar200 = vsubps_avx(_local_590,(undefined1  [16])aVar13);
      auVar198 = vshufps_avx(auVar200,auVar200,0);
      auVar199 = vshufps_avx(auVar200,auVar200,0x55);
      auVar200 = vshufps_avx(auVar200,auVar200,0xaa);
      auVar307._0_4_ =
           auVar198._0_4_ * fVar135 + auVar200._0_4_ * fVar215 + auVar199._0_4_ * fVar195;
      auVar307._4_4_ =
           auVar198._4_4_ * fVar168 + auVar200._4_4_ * fVar224 + auVar199._4_4_ * fVar208;
      auVar307._8_4_ =
           auVar198._8_4_ * fVar170 + auVar200._8_4_ * fVar225 + auVar199._8_4_ * fVar209;
      auVar307._12_4_ =
           auVar198._12_4_ * fVar172 + auVar200._12_4_ * fVar226 + auVar199._12_4_ * fVar210;
      auVar198 = vblendps_avx(auVar307,_local_590,8);
      auVar22 = vsubps_avx(_local_5a0,(undefined1  [16])aVar13);
      auVar199 = vshufps_avx(auVar22,auVar22,0);
      auVar200 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar218._0_4_ = auVar199._0_4_ * fVar135 + auVar200._0_4_ * fVar195 + auVar22._0_4_ * fVar215
      ;
      auVar218._4_4_ = auVar199._4_4_ * fVar168 + auVar200._4_4_ * fVar208 + auVar22._4_4_ * fVar224
      ;
      auVar218._8_4_ = auVar199._8_4_ * fVar170 + auVar200._8_4_ * fVar209 + auVar22._8_4_ * fVar225
      ;
      auVar218._12_4_ =
           auVar199._12_4_ * fVar172 + auVar200._12_4_ * fVar210 + auVar22._12_4_ * fVar226;
      auVar199 = vblendps_avx(auVar218,_local_5a0,8);
      local_4a0 = aVar13.x;
      fStack_49c = aVar13.y;
      fStack_498 = aVar13.z;
      aStack_494 = aVar13.field_3;
      auVar23 = vsubps_avx(_local_5b0,(undefined1  [16])aVar13);
      auVar200 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar22 = vshufps_avx(auVar23,auVar23,0);
      auVar23 = vshufps_avx(auVar23,auVar23,0x55);
      auVar158._0_4_ = auVar22._0_4_ * fVar135 + auVar200._0_4_ * fVar215 + auVar23._0_4_ * fVar195;
      auVar158._4_4_ = auVar22._4_4_ * fVar168 + auVar200._4_4_ * fVar224 + auVar23._4_4_ * fVar208;
      auVar158._8_4_ = auVar22._8_4_ * fVar170 + auVar200._8_4_ * fVar225 + auVar23._8_4_ * fVar209;
      auVar158._12_4_ =
           auVar22._12_4_ * fVar172 + auVar200._12_4_ * fVar226 + auVar23._12_4_ * fVar210;
      auVar200 = vblendps_avx(auVar158,_local_5b0,8);
      auVar219._8_4_ = 0x7fffffff;
      auVar219._0_8_ = 0x7fffffff7fffffff;
      auVar219._12_4_ = 0x7fffffff;
      auVar331 = vandps_avx(auVar331,auVar219);
      auVar198 = vandps_avx(auVar198,auVar219);
      auVar22 = vmaxps_avx(auVar331,auVar198);
      auVar331 = vandps_avx(auVar199,auVar219);
      auVar198 = vandps_avx(auVar200,auVar219);
      auVar331 = vmaxps_avx(auVar331,auVar198);
      auVar331 = vmaxps_avx(auVar22,auVar331);
      auVar198 = vmovshdup_avx(auVar331);
      auVar198 = vmaxss_avx(auVar198,auVar331);
      auVar331 = vshufpd_avx(auVar331,auVar331,1);
      auVar331 = vmaxss_avx(auVar331,auVar198);
      fVar225 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0x908);
      fVar226 = *(float *)(catmullrom_basis0 + lVar18 + 0x90c);
      fVar234 = *(float *)(catmullrom_basis0 + lVar18 + 0x910);
      fVar235 = *(float *)(catmullrom_basis0 + lVar18 + 0x914);
      fVar329 = *(float *)(catmullrom_basis0 + lVar18 + 0x918);
      fVar330 = *(float *)(catmullrom_basis0 + lVar18 + 0x91c);
      fVar250 = *(float *)(catmullrom_basis0 + lVar18 + 0x920);
      auVar115 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0x908);
      local_7a0._0_16_ = auVar218;
      auVar198 = vshufps_avx(auVar218,auVar218,0);
      local_740._16_16_ = auVar198;
      local_740._0_16_ = auVar198;
      fVar212 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0xd8c);
      fVar150 = *(float *)(catmullrom_basis0 + lVar18 + 0xd90);
      fVar151 = *(float *)(catmullrom_basis0 + lVar18 + 0xd94);
      fVar152 = *(float *)(catmullrom_basis0 + lVar18 + 0xd98);
      fVar153 = *(float *)(catmullrom_basis0 + lVar18 + 0xd9c);
      fVar154 = *(float *)(catmullrom_basis0 + lVar18 + 0xda0);
      fVar237 = *(float *)(catmullrom_basis0 + lVar18 + 0xda4);
      auVar114 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0xd8c);
      auVar199 = vshufps_avx(auVar158,auVar158,0);
      register0x00001210 = auVar199;
      _local_400 = auVar199;
      fVar135 = auVar199._0_4_;
      fVar195 = auVar199._4_4_;
      fVar215 = auVar199._8_4_;
      fVar228 = auVar199._12_4_;
      fVar134 = auVar198._0_4_;
      fVar227 = auVar198._4_4_;
      fVar259 = auVar198._8_4_;
      fVar173 = auVar198._12_4_;
      auVar198 = vshufps_avx(auVar218,auVar218,0x55);
      register0x00001410 = auVar198;
      _local_700 = auVar198;
      auVar199 = vshufps_avx(auVar158,auVar158,0x55);
      register0x00001350 = auVar199;
      _local_760 = auVar199;
      fVar168 = auVar199._0_4_;
      fVar208 = auVar199._4_4_;
      fVar224 = auVar199._8_4_;
      fVar233 = auVar199._12_4_;
      fVar269 = auVar198._0_4_;
      fVar274 = auVar198._4_4_;
      fVar275 = auVar198._8_4_;
      fVar276 = auVar198._12_4_;
      auVar23 = _local_5a0;
      auVar198 = vshufps_avx(_local_5a0,_local_5a0,0xff);
      register0x00001310 = auVar198;
      _local_80 = auVar198;
      auVar199 = vshufps_avx(_local_5b0,_local_5b0,0xff);
      register0x000013d0 = auVar199;
      _local_100 = auVar199;
      fVar170 = auVar199._0_4_;
      fVar172 = auVar199._4_4_;
      fVar209 = auVar199._8_4_;
      fVar210 = auVar199._12_4_;
      fVar211 = auVar198._0_4_;
      fVar169 = auVar198._4_4_;
      fVar171 = auVar198._8_4_;
      fVar174 = auVar198._12_4_;
      auVar198 = vshufps_avx(auVar307,auVar307,0);
      register0x00001550 = auVar198;
      _local_420 = auVar198;
      pauVar10 = (undefined1 (*) [16])(catmullrom_basis0 + lVar18 + 0x484);
      fVar246 = *(float *)*pauVar10;
      fVar248 = *(float *)(catmullrom_basis0 + lVar18 + 0x488);
      fVar251 = *(float *)(catmullrom_basis0 + lVar18 + 0x48c);
      auVar116 = *(undefined1 (*) [12])*pauVar10;
      fVar253 = *(float *)(catmullrom_basis0 + lVar18 + 0x490);
      fStack_310 = *(float *)(catmullrom_basis0 + lVar18 + 0x494);
      fStack_30c = *(float *)(catmullrom_basis0 + lVar18 + 0x498);
      fStack_308 = *(float *)(catmullrom_basis0 + lVar18 + 0x49c);
      fVar252 = auVar198._0_4_;
      fVar254 = auVar198._4_4_;
      fVar256 = auVar198._8_4_;
      fVar258 = auVar198._12_4_;
      auVar198 = vshufps_avx(auVar307,auVar307,0x55);
      register0x000014d0 = auVar198;
      _local_720 = auVar198;
      fVar301 = auVar198._0_4_;
      fVar303 = auVar198._4_4_;
      fVar304 = auVar198._8_4_;
      fVar305 = auVar198._12_4_;
      auVar25 = _local_590;
      auVar198 = vshufps_avx(_local_590,_local_590,0xff);
      register0x00001590 = auVar198;
      _local_120 = auVar198;
      _local_320 = *pauVar10;
      auVar26 = _local_320;
      uStack_304 = *(undefined4 *)(catmullrom_basis0 + lVar18 + 0x4a0);
      fVar260 = auVar198._0_4_;
      fVar286 = auVar198._4_4_;
      fVar288 = auVar198._8_4_;
      fVar290 = auVar198._12_4_;
      fVar193 = *(float *)(catmullrom_basis0 + lVar18 + 0x924) + 0.0 + 0.0;
      auVar198 = vshufps_avx(auVar186,auVar186,0);
      register0x00001390 = auVar198;
      _local_e0 = auVar198;
      pauVar9 = (undefined1 (*) [32])(catmullrom_basis0 + lVar18);
      fVar255 = *(float *)*pauVar9;
      fVar257 = *(float *)(catmullrom_basis0 + lVar18 + 4);
      fVar277 = *(float *)(catmullrom_basis0 + lVar18 + 8);
      fVar285 = *(float *)(catmullrom_basis0 + lVar18 + 0xc);
      fVar287 = *(float *)(catmullrom_basis0 + lVar18 + 0x10);
      fVar289 = *(float *)(catmullrom_basis0 + lVar18 + 0x14);
      fVar291 = *(float *)(catmullrom_basis0 + lVar18 + 0x18);
      auVar117 = *(undefined1 (*) [28])*pauVar9;
      fVar176 = auVar198._0_4_;
      fVar178 = auVar198._4_4_;
      fVar180 = auVar198._8_4_;
      fVar182 = auVar198._12_4_;
      auVar279._0_4_ = fVar176 * fVar255 + fVar252 * fVar246 + fVar134 * fVar225 + fVar212 * fVar135
      ;
      auVar279._4_4_ = fVar178 * fVar257 + fVar254 * fVar248 + fVar227 * fVar226 + fVar150 * fVar195
      ;
      auVar279._8_4_ = fVar180 * fVar277 + fVar256 * fVar251 + fVar259 * fVar234 + fVar151 * fVar215
      ;
      auVar279._12_4_ =
           fVar182 * fVar285 + fVar258 * fVar253 + fVar173 * fVar235 + fVar152 * fVar228;
      auVar279._16_4_ =
           fVar176 * fVar287 + fVar252 * fStack_310 + fVar134 * fVar329 + fVar153 * fVar135;
      auVar279._20_4_ =
           fVar178 * fVar289 + fVar254 * fStack_30c + fVar227 * fVar330 + fVar154 * fVar195;
      auVar279._24_4_ =
           fVar180 * fVar291 + fVar256 * fStack_308 + fVar259 * fVar250 + fVar237 * fVar215;
      auVar279._28_4_ = fVar182 + fVar173 + fVar228 + 0.0;
      auVar198 = vshufps_avx(auVar186,auVar186,0x55);
      register0x000015d0 = auVar198;
      _local_a0 = auVar198;
      fVar292 = auVar198._0_4_;
      fVar293 = auVar198._4_4_;
      fVar295 = auVar198._8_4_;
      fVar328 = auVar198._12_4_;
      auVar308._0_4_ = fVar292 * fVar255 + fVar301 * fVar246 + fVar269 * fVar225 + fVar212 * fVar168
      ;
      auVar308._4_4_ = fVar293 * fVar257 + fVar303 * fVar248 + fVar274 * fVar226 + fVar150 * fVar208
      ;
      auVar308._8_4_ = fVar295 * fVar277 + fVar304 * fVar251 + fVar275 * fVar234 + fVar151 * fVar224
      ;
      auVar308._12_4_ =
           fVar328 * fVar285 + fVar305 * fVar253 + fVar276 * fVar235 + fVar152 * fVar233;
      auVar308._16_4_ =
           fVar292 * fVar287 + fVar301 * fStack_310 + fVar269 * fVar329 + fVar153 * fVar168;
      auVar308._20_4_ =
           fVar293 * fVar289 + fVar303 * fStack_30c + fVar274 * fVar330 + fVar154 * fVar208;
      auVar308._24_4_ =
           fVar295 * fVar291 + fVar304 * fStack_308 + fVar275 * fVar250 + fVar237 * fVar224;
      auVar308._28_4_ = 0;
      auVar198 = vpermilps_avx(_local_670,0xff);
      register0x00001490 = auVar198;
      _local_140 = auVar198;
      _local_340 = *pauVar9;
      auVar32 = _local_340;
      fVar238 = auVar198._0_4_;
      fVar247 = auVar198._4_4_;
      fVar249 = auVar198._8_4_;
      fVar132 = fVar238 * fVar255 + fVar260 * fVar246 + fVar211 * fVar225 + fVar212 * fVar170;
      fVar148 = fVar247 * fVar257 + fVar286 * fVar248 + fVar169 * fVar226 + fVar150 * fVar172;
      fStack_7d8 = fVar249 * fVar277 + fVar288 * fVar251 + fVar171 * fVar234 + fVar151 * fVar209;
      fStack_7d4 = auVar198._12_4_ * fVar285 +
                   fVar290 * fVar253 + fVar174 * fVar235 + fVar152 * fVar210;
      fStack_7d0 = fVar238 * fVar287 + fVar260 * fStack_310 + fVar211 * fVar329 + fVar153 * fVar170;
      fStack_7cc = fVar247 * fVar289 + fVar286 * fStack_30c + fVar169 * fVar330 + fVar154 * fVar172;
      fStack_7c8 = fVar249 * fVar291 + fVar288 * fStack_308 + fVar171 * fVar250 + fVar237 * fVar209;
      fStack_7c4 = fVar193 + 0.0;
      auVar166 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar18 + 0x908);
      auVar167 = ZEXT3264(auVar166);
      fVar152 = *(float *)(catmullrom_basis1 + lVar18 + 0xd8c);
      fVar153 = *(float *)(catmullrom_basis1 + lVar18 + 0xd90);
      fVar154 = *(float *)(catmullrom_basis1 + lVar18 + 0xd94);
      fVar237 = *(float *)(catmullrom_basis1 + lVar18 + 0xd98);
      fVar246 = *(float *)(catmullrom_basis1 + lVar18 + 0xd9c);
      fVar248 = *(float *)(catmullrom_basis1 + lVar18 + 0xda0);
      fVar251 = *(float *)(catmullrom_basis1 + lVar18 + 0xda4);
      fVar149 = auVar166._0_4_;
      fVar236 = auVar166._4_4_;
      fVar181 = auVar166._8_4_;
      fVar268 = auVar166._12_4_;
      fVar175 = auVar166._16_4_;
      fVar177 = auVar166._20_4_;
      fVar179 = auVar166._24_4_;
      fVar255 = *(float *)(catmullrom_basis1 + lVar18 + 0x484);
      fVar257 = *(float *)(catmullrom_basis1 + lVar18 + 0x488);
      fVar277 = *(float *)(catmullrom_basis1 + lVar18 + 0x48c);
      fVar285 = *(float *)(catmullrom_basis1 + lVar18 + 0x490);
      fVar287 = *(float *)(catmullrom_basis1 + lVar18 + 0x494);
      fVar289 = *(float *)(catmullrom_basis1 + lVar18 + 0x498);
      fVar291 = *(float *)(catmullrom_basis1 + lVar18 + 0x49c);
      fVar226 = fVar258 + fVar193 + 0.0;
      fVar193 = *(float *)(catmullrom_basis1 + lVar18);
      fVar294 = *(float *)(catmullrom_basis1 + lVar18 + 4);
      fVar194 = *(float *)(catmullrom_basis1 + lVar18 + 8);
      fVar214 = *(float *)(catmullrom_basis1 + lVar18 + 0xc);
      fVar213 = *(float *)(catmullrom_basis1 + lVar18 + 0x10);
      fVar296 = *(float *)(catmullrom_basis1 + lVar18 + 0x14);
      fVar133 = *(float *)(catmullrom_basis1 + lVar18 + 0x18);
      local_380._0_4_ =
           fVar176 * fVar193 + fVar252 * fVar255 + fVar149 * fVar134 + fVar152 * fVar135;
      local_380._4_4_ =
           fVar178 * fVar294 + fVar254 * fVar257 + fVar236 * fVar227 + fVar153 * fVar195;
      local_380._8_4_ =
           fVar180 * fVar194 + fVar256 * fVar277 + fVar181 * fVar259 + fVar154 * fVar215;
      local_380._12_4_ =
           fVar182 * fVar214 + fVar258 * fVar285 + fVar268 * fVar173 + fVar237 * fVar228;
      local_380._16_4_ =
           fVar176 * fVar213 + fVar252 * fVar287 + fVar175 * fVar134 + fVar246 * fVar135;
      local_380._20_4_ =
           fVar178 * fVar296 + fVar254 * fVar289 + fVar177 * fVar227 + fVar248 * fVar195;
      local_380._24_4_ =
           fVar180 * fVar133 + fVar256 * fVar291 + fVar179 * fVar259 + fVar251 * fVar215;
      local_380._28_4_ = fVar290 + fVar226;
      local_440._0_4_ =
           fVar292 * fVar193 + fVar301 * fVar255 + fVar269 * fVar149 + fVar168 * fVar152;
      local_440._4_4_ =
           fVar293 * fVar294 + fVar303 * fVar257 + fVar274 * fVar236 + fVar208 * fVar153;
      fStack_438 = fVar295 * fVar194 + fVar304 * fVar277 + fVar275 * fVar181 + fVar224 * fVar154;
      fStack_434 = fVar328 * fVar214 + fVar305 * fVar285 + fVar276 * fVar268 + fVar233 * fVar237;
      fStack_430 = fVar292 * fVar213 + fVar301 * fVar287 + fVar269 * fVar175 + fVar168 * fVar246;
      fStack_42c = fVar293 * fVar296 + fVar303 * fVar289 + fVar274 * fVar177 + fVar208 * fVar248;
      fStack_428 = fVar295 * fVar133 + fVar304 * fVar291 + fVar275 * fVar179 + fVar224 * fVar251;
      fStack_424 = fVar226 + fVar258 + fVar182 + 0.0;
      local_480._0_4_ =
           fVar260 * fVar255 + fVar211 * fVar149 + fVar170 * fVar152 + fVar238 * fVar193;
      local_480._4_4_ =
           fVar286 * fVar257 + fVar169 * fVar236 + fVar172 * fVar153 + fVar247 * fVar294;
      local_480._8_4_ =
           fVar288 * fVar277 + fVar171 * fVar181 + fVar209 * fVar154 + fVar249 * fVar194;
      local_480._12_4_ =
           fVar290 * fVar285 + fVar174 * fVar268 + fVar210 * fVar237 + auVar198._12_4_ * fVar214;
      local_480._16_4_ =
           fVar260 * fVar287 + fVar211 * fVar175 + fVar170 * fVar246 + fVar238 * fVar213;
      local_480._20_4_ =
           fVar286 * fVar289 + fVar169 * fVar177 + fVar172 * fVar248 + fVar247 * fVar296;
      local_480._24_4_ =
           fVar288 * fVar291 + fVar171 * fVar179 + fVar209 * fVar251 + fVar249 * fVar133;
      local_480._28_4_ = fVar258 + fVar210 + fVar182 + fVar226;
      auVar30 = vsubps_avx(local_380,auVar279);
      _local_460 = vsubps_avx(_local_440,auVar308);
      fVar170 = auVar30._0_4_;
      fVar209 = auVar30._4_4_;
      auVar20._4_4_ = auVar308._4_4_ * fVar209;
      auVar20._0_4_ = auVar308._0_4_ * fVar170;
      fVar225 = auVar30._8_4_;
      auVar20._8_4_ = auVar308._8_4_ * fVar225;
      fVar234 = auVar30._12_4_;
      auVar20._12_4_ = auVar308._12_4_ * fVar234;
      fVar329 = auVar30._16_4_;
      auVar20._16_4_ = auVar308._16_4_ * fVar329;
      fVar250 = auVar30._20_4_;
      auVar20._20_4_ = auVar308._20_4_ * fVar250;
      fVar150 = auVar30._24_4_;
      auVar20._24_4_ = auVar308._24_4_ * fVar150;
      auVar20._28_4_ = fVar226;
      fVar172 = local_460._0_4_;
      fVar210 = local_460._4_4_;
      auVar31._4_4_ = auVar279._4_4_ * fVar210;
      auVar31._0_4_ = auVar279._0_4_ * fVar172;
      fVar226 = local_460._8_4_;
      auVar31._8_4_ = auVar279._8_4_ * fVar226;
      fVar235 = local_460._12_4_;
      auVar31._12_4_ = auVar279._12_4_ * fVar235;
      fVar330 = local_460._16_4_;
      auVar31._16_4_ = auVar279._16_4_ * fVar330;
      fVar212 = local_460._20_4_;
      auVar31._20_4_ = auVar279._20_4_ * fVar212;
      fVar151 = local_460._24_4_;
      auVar31._24_4_ = auVar279._24_4_ * fVar151;
      auVar31._28_4_ = fStack_424;
      auVar31 = vsubps_avx(auVar20,auVar31);
      auVar21._4_4_ = fVar148;
      auVar21._0_4_ = fVar132;
      auVar21._8_4_ = fStack_7d8;
      auVar21._12_4_ = fStack_7d4;
      auVar21._16_4_ = fStack_7d0;
      auVar21._20_4_ = fStack_7cc;
      auVar21._24_4_ = fStack_7c8;
      auVar21._28_4_ = fStack_7c4;
      auVar20 = vmaxps_avx(auVar21,local_480);
      auVar37._4_4_ = auVar20._4_4_ * auVar20._4_4_ * (fVar209 * fVar209 + fVar210 * fVar210);
      auVar37._0_4_ = auVar20._0_4_ * auVar20._0_4_ * (fVar170 * fVar170 + fVar172 * fVar172);
      auVar37._8_4_ = auVar20._8_4_ * auVar20._8_4_ * (fVar225 * fVar225 + fVar226 * fVar226);
      auVar37._12_4_ = auVar20._12_4_ * auVar20._12_4_ * (fVar234 * fVar234 + fVar235 * fVar235);
      auVar37._16_4_ = auVar20._16_4_ * auVar20._16_4_ * (fVar329 * fVar329 + fVar330 * fVar330);
      auVar37._20_4_ = auVar20._20_4_ * auVar20._20_4_ * (fVar250 * fVar250 + fVar212 * fVar212);
      auVar37._24_4_ = auVar20._24_4_ * auVar20._24_4_ * (fVar150 * fVar150 + fVar151 * fVar151);
      auVar37._28_4_ = fVar174 + fStack_424;
      auVar19._4_4_ = auVar31._4_4_ * auVar31._4_4_;
      auVar19._0_4_ = auVar31._0_4_ * auVar31._0_4_;
      auVar19._8_4_ = auVar31._8_4_ * auVar31._8_4_;
      auVar19._12_4_ = auVar31._12_4_ * auVar31._12_4_;
      auVar19._16_4_ = auVar31._16_4_ * auVar31._16_4_;
      auVar19._20_4_ = auVar31._20_4_ * auVar31._20_4_;
      auVar19._24_4_ = auVar31._24_4_ * auVar31._24_4_;
      auVar19._28_4_ = auVar31._28_4_;
      auVar20 = vcmpps_avx(auVar19,auVar37,2);
      auVar198 = ZEXT416((uint)(float)(int)uVar126);
      _local_3e0 = auVar198;
      auVar198 = vshufps_avx(auVar198,auVar198,0);
      auVar202._16_16_ = auVar198;
      auVar202._0_16_ = auVar198;
      auVar31 = vcmpps_avx(_DAT_01faff40,auVar202,1);
      auVar198 = vpermilps_avx(auVar186,0xaa);
      register0x00001490 = auVar198;
      _local_6a0 = auVar198;
      auVar199 = vpermilps_avx(auVar307,0xaa);
      register0x00001550 = auVar199;
      _local_300 = auVar199;
      auVar200 = vpermilps_avx(auVar218,0xaa);
      register0x00001590 = auVar200;
      _local_c0 = auVar200;
      auVar22 = vpermilps_avx(auVar158,0xaa);
      register0x00001310 = auVar22;
      _local_620 = auVar22;
      auVar37 = auVar31 & auVar20;
      auVar331 = ZEXT416((uint)(auVar331._0_4_ * 4.7683716e-07));
      fVar170 = fVar168;
      fVar172 = fVar208;
      fVar209 = fVar224;
      fVar210 = fVar233;
      fVar225 = fVar269;
      fVar226 = fVar274;
      fVar234 = fVar275;
      fVar235 = fVar301;
      fVar329 = fVar303;
      fVar330 = fVar304;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar37 >> 0x7f,0) == '\0') &&
            (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar37 >> 0xbf,0) == '\0') &&
          (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar37[0x1f])
      {
        bVar131 = false;
        auVar317 = ZEXT3264(local_740);
        auVar207 = ZEXT1664(auVar331);
        _local_670 = auVar24;
        _local_5a0 = auVar23;
        _local_590 = auVar25;
      }
      else {
        auVar20 = vandps_avx(auVar20,auVar31);
        fVar238 = auVar198._0_4_;
        fVar247 = auVar198._4_4_;
        fVar249 = auVar198._8_4_;
        fVar260 = auVar198._12_4_;
        fVar286 = auVar199._0_4_;
        fVar288 = auVar199._4_4_;
        fVar290 = auVar199._8_4_;
        fVar318 = auVar199._12_4_;
        fVar319 = auVar200._0_4_;
        fVar322 = auVar200._4_4_;
        fVar323 = auVar200._8_4_;
        fVar324 = auVar200._12_4_;
        fVar211 = auVar22._0_4_;
        fVar169 = auVar22._4_4_;
        fVar171 = auVar22._8_4_;
        fVar174 = auVar22._12_4_;
        fVar250 = auVar31._28_4_ + auVar166._28_4_ + local_380._28_4_;
        local_360._0_4_ =
             fVar238 * fVar193 + fVar286 * fVar255 + fVar319 * fVar149 + fVar211 * fVar152;
        local_360._4_4_ =
             fVar247 * fVar294 + fVar288 * fVar257 + fVar322 * fVar236 + fVar169 * fVar153;
        fStack_358 = fVar249 * fVar194 + fVar290 * fVar277 + fVar323 * fVar181 + fVar171 * fVar154;
        fStack_354 = fVar260 * fVar214 + fVar318 * fVar285 + fVar324 * fVar268 + fVar174 * fVar237;
        fStack_350 = fVar238 * fVar213 + fVar286 * fVar287 + fVar319 * fVar175 + fVar211 * fVar246;
        fStack_34c = fVar247 * fVar296 + fVar288 * fVar289 + fVar322 * fVar177 + fVar169 * fVar248;
        fStack_348 = fVar249 * fVar133 + fVar290 * fVar291 + fVar323 * fVar179 + fVar171 * fVar251;
        fStack_344 = auVar20._28_4_ + fVar250;
        local_340._0_4_ = auVar117._0_4_;
        local_340._4_4_ = auVar117._4_4_;
        fStack_338 = auVar117._8_4_;
        fStack_334 = auVar117._12_4_;
        fStack_330 = auVar117._16_4_;
        fStack_32c = auVar117._20_4_;
        fStack_328 = auVar117._24_4_;
        local_320._0_4_ = auVar116._0_4_;
        local_320._4_4_ = auVar116._4_4_;
        fStack_318 = auVar116._8_4_;
        local_580._0_4_ = auVar115._0_4_;
        local_580._4_4_ = auVar115._4_4_;
        fStack_578 = auVar115._8_4_;
        fStack_574 = auVar115._12_4_;
        fStack_570 = auVar115._16_4_;
        fStack_56c = auVar115._20_4_;
        fStack_568 = auVar115._24_4_;
        local_600._0_4_ = auVar114._0_4_;
        local_600._4_4_ = auVar114._4_4_;
        fStack_5f8 = auVar114._8_4_;
        fStack_5f4 = auVar114._12_4_;
        fStack_5f0 = auVar114._16_4_;
        fStack_5ec = auVar114._20_4_;
        fStack_5e8 = auVar114._24_4_;
        local_580._0_4_ =
             fVar238 * (float)local_340._0_4_ +
             fVar286 * (float)local_320._0_4_ +
             fVar319 * (float)local_580._0_4_ + fVar211 * (float)local_600._0_4_;
        local_580._4_4_ =
             fVar247 * (float)local_340._4_4_ +
             fVar288 * (float)local_320._4_4_ +
             fVar322 * (float)local_580._4_4_ + fVar169 * (float)local_600._4_4_;
        fStack_578 = fVar249 * fStack_338 +
                     fVar290 * fStack_318 + fVar323 * fStack_578 + fVar171 * fStack_5f8;
        fStack_574 = fVar260 * fStack_334 +
                     fVar318 * fVar253 + fVar324 * fStack_574 + fVar174 * fStack_5f4;
        fStack_570 = fVar238 * fStack_330 +
                     fVar286 * fStack_310 + fVar319 * fStack_570 + fVar211 * fStack_5f0;
        fStack_56c = fVar247 * fStack_32c +
                     fVar288 * fStack_30c + fVar322 * fStack_56c + fVar169 * fStack_5ec;
        fStack_568 = fVar249 * fStack_328 +
                     fVar290 * fStack_308 + fVar323 * fStack_568 + fVar171 * fStack_5e8;
        fStack_564 = fStack_344 + fVar250 + auVar20._28_4_ + auVar31._28_4_;
        fVar250 = *(float *)(catmullrom_basis0 + lVar18 + 0x1210);
        fVar212 = *(float *)(catmullrom_basis0 + lVar18 + 0x1214);
        fVar150 = *(float *)(catmullrom_basis0 + lVar18 + 0x1218);
        fVar151 = *(float *)(catmullrom_basis0 + lVar18 + 0x121c);
        fVar152 = *(float *)(catmullrom_basis0 + lVar18 + 0x1220);
        fVar153 = *(float *)(catmullrom_basis0 + lVar18 + 0x1224);
        fVar154 = *(float *)(catmullrom_basis0 + lVar18 + 0x1228);
        fVar237 = *(float *)(catmullrom_basis0 + lVar18 + 0x1694);
        fVar246 = *(float *)(catmullrom_basis0 + lVar18 + 0x1698);
        fVar248 = *(float *)(catmullrom_basis0 + lVar18 + 0x169c);
        fVar251 = *(float *)(catmullrom_basis0 + lVar18 + 0x16a0);
        fVar253 = *(float *)(catmullrom_basis0 + lVar18 + 0x16a4);
        fVar255 = *(float *)(catmullrom_basis0 + lVar18 + 0x16a8);
        fVar257 = *(float *)(catmullrom_basis0 + lVar18 + 0x16ac);
        fVar277 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b18);
        fVar285 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b1c);
        fVar287 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b20);
        fVar289 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b24);
        fVar291 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b28);
        fVar193 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b2c);
        fVar294 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b30);
        fVar194 = *(float *)(catmullrom_basis0 + lVar18 + 0x1f9c);
        fVar214 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fa0);
        fVar213 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fa4);
        fVar296 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fa8);
        fVar133 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fac);
        fVar149 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fb0);
        fVar236 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fb4);
        local_7a0._0_16_ = auVar331;
        fVar181 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar18 + 0x1fb8);
        fVar268 = *(float *)(catmullrom_basis0 + lVar18 + 0x16b0) + fVar181;
        local_600._4_4_ =
             fVar178 * fVar212 + fVar246 * fVar254 + fVar227 * fVar285 + fVar195 * fVar214;
        local_600._0_4_ =
             fVar176 * fVar250 + fVar237 * fVar252 + fVar134 * fVar277 + fVar135 * fVar194;
        fStack_5f8 = fVar180 * fVar150 + fVar248 * fVar256 + fVar259 * fVar287 + fVar215 * fVar213;
        fStack_5f4 = fVar182 * fVar151 + fVar251 * fVar258 + fVar173 * fVar289 + fVar228 * fVar296;
        fStack_5f0 = fVar176 * fVar152 + fVar253 * fVar252 + fVar134 * fVar291 + fVar135 * fVar133;
        fStack_5ec = fVar178 * fVar153 + fVar255 * fVar254 + fVar227 * fVar193 + fVar195 * fVar149;
        fStack_5e8 = fVar180 * fVar154 + fVar257 * fVar256 + fVar259 * fVar294 + fVar215 * fVar236;
        fStack_5e4 = *(float *)(catmullrom_basis0 + lVar18 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar18 + 0x1fb8) +
                     *(float *)(catmullrom_basis1 + lVar18 + 0x4a0) + 0.0;
        auVar161._0_4_ =
             fVar292 * fVar250 + fVar301 * fVar237 + fVar269 * fVar277 + fVar168 * fVar194;
        auVar161._4_4_ =
             fVar293 * fVar212 + fVar303 * fVar246 + fVar274 * fVar285 + fVar208 * fVar214;
        auVar161._8_4_ =
             fVar295 * fVar150 + fVar304 * fVar248 + fVar275 * fVar287 + fVar224 * fVar213;
        auVar161._12_4_ =
             fVar328 * fVar151 + fVar305 * fVar251 + fVar276 * fVar289 + fVar233 * fVar296;
        auVar161._16_4_ =
             fVar292 * fVar152 + fVar301 * fVar253 + fVar269 * fVar291 + fVar168 * fVar133;
        auVar161._20_4_ =
             fVar293 * fVar153 + fVar303 * fVar255 + fVar274 * fVar193 + fVar208 * fVar149;
        auVar161._24_4_ =
             fVar295 * fVar154 + fVar304 * fVar257 + fVar275 * fVar294 + fVar224 * fVar236;
        auVar161._28_4_ =
             fVar181 + *(float *)(catmullrom_basis1 + lVar18 + 0x4a0) + 0.0 +
                       *(float *)(catmullrom_basis1 + lVar18 + 0x1c) + 0.0;
        auVar241._0_4_ =
             fVar238 * fVar250 + fVar286 * fVar237 + fVar319 * fVar277 + fVar211 * fVar194;
        auVar241._4_4_ =
             fVar247 * fVar212 + fVar288 * fVar246 + fVar322 * fVar285 + fVar169 * fVar214;
        auVar241._8_4_ =
             fVar249 * fVar150 + fVar290 * fVar248 + fVar323 * fVar287 + fVar171 * fVar213;
        auVar241._12_4_ =
             fVar260 * fVar151 + fVar318 * fVar251 + fVar324 * fVar289 + fVar174 * fVar296;
        auVar241._16_4_ =
             fVar238 * fVar152 + fVar286 * fVar253 + fVar319 * fVar291 + fVar211 * fVar133;
        auVar241._20_4_ =
             fVar247 * fVar153 + fVar288 * fVar255 + fVar322 * fVar193 + fVar169 * fVar149;
        auVar241._24_4_ =
             fVar249 * fVar154 + fVar290 * fVar257 + fVar323 * fVar294 + fVar171 * fVar236;
        auVar241._28_4_ = *(float *)(catmullrom_basis0 + lVar18 + 0x122c) + fVar268;
        fVar250 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b18);
        fVar212 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b1c);
        fVar150 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b20);
        fVar151 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b24);
        fVar152 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b28);
        fVar153 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b2c);
        fVar154 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b30);
        fVar237 = *(float *)(catmullrom_basis1 + lVar18 + 0x1f9c);
        fVar246 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fa0);
        fVar248 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fa4);
        fVar251 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fa8);
        fVar253 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fac);
        fVar255 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fb0);
        fVar257 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fb4);
        fVar277 = *(float *)(catmullrom_basis1 + lVar18 + 0x1694);
        fVar285 = *(float *)(catmullrom_basis1 + lVar18 + 0x1698);
        fVar287 = *(float *)(catmullrom_basis1 + lVar18 + 0x169c);
        fVar289 = *(float *)(catmullrom_basis1 + lVar18 + 0x16a0);
        fVar291 = *(float *)(catmullrom_basis1 + lVar18 + 0x16a4);
        fVar193 = *(float *)(catmullrom_basis1 + lVar18 + 0x16a8);
        fVar294 = *(float *)(catmullrom_basis1 + lVar18 + 0x16ac);
        fVar194 = *(float *)(catmullrom_basis1 + lVar18 + 0x1210);
        fVar214 = *(float *)(catmullrom_basis1 + lVar18 + 0x1214);
        fVar213 = *(float *)(catmullrom_basis1 + lVar18 + 0x1218);
        fVar296 = *(float *)(catmullrom_basis1 + lVar18 + 0x121c);
        fVar133 = *(float *)(catmullrom_basis1 + lVar18 + 0x1220);
        fVar149 = *(float *)(catmullrom_basis1 + lVar18 + 0x1224);
        fVar236 = *(float *)(catmullrom_basis1 + lVar18 + 0x1228);
        auVar266._0_4_ =
             fVar176 * fVar194 + fVar277 * fVar252 + fVar134 * fVar250 + fVar135 * fVar237;
        auVar266._4_4_ =
             fVar178 * fVar214 + fVar285 * fVar254 + fVar227 * fVar212 + fVar195 * fVar246;
        auVar266._8_4_ =
             fVar180 * fVar213 + fVar287 * fVar256 + fVar259 * fVar150 + fVar215 * fVar248;
        auVar266._12_4_ =
             fVar182 * fVar296 + fVar289 * fVar258 + fVar173 * fVar151 + fVar228 * fVar251;
        auVar266._16_4_ =
             fVar176 * fVar133 + fVar291 * fVar252 + fVar134 * fVar152 + fVar135 * fVar253;
        auVar266._20_4_ =
             fVar178 * fVar149 + fVar193 * fVar254 + fVar227 * fVar153 + fVar195 * fVar255;
        auVar266._24_4_ =
             fVar180 * fVar236 + fVar294 * fVar256 + fVar259 * fVar154 + fVar215 * fVar257;
        auVar266._28_4_ = fVar228 + fVar228 + fVar268 + 0.0;
        auVar280._0_4_ =
             fVar292 * fVar194 + fVar301 * fVar277 + fVar269 * fVar250 + fVar168 * fVar237;
        auVar280._4_4_ =
             fVar293 * fVar214 + fVar303 * fVar285 + fVar274 * fVar212 + fVar208 * fVar246;
        auVar280._8_4_ =
             fVar295 * fVar213 + fVar304 * fVar287 + fVar275 * fVar150 + fVar224 * fVar248;
        auVar280._12_4_ =
             fVar328 * fVar296 + fVar305 * fVar289 + fVar276 * fVar151 + fVar233 * fVar251;
        auVar280._16_4_ =
             fVar292 * fVar133 + fVar301 * fVar291 + fVar269 * fVar152 + fVar168 * fVar253;
        auVar280._20_4_ =
             fVar293 * fVar149 + fVar303 * fVar193 + fVar274 * fVar153 + fVar208 * fVar255;
        auVar280._24_4_ =
             fVar295 * fVar236 + fVar304 * fVar294 + fVar275 * fVar154 + fVar224 * fVar257;
        auVar280._28_4_ = fVar228 + fVar228 + fVar228 + 0.0;
        auVar190._0_4_ =
             fVar238 * fVar194 + fVar286 * fVar277 + fVar319 * fVar250 + fVar237 * fVar211;
        auVar190._4_4_ =
             fVar247 * fVar214 + fVar288 * fVar285 + fVar322 * fVar212 + fVar246 * fVar169;
        auVar190._8_4_ =
             fVar249 * fVar213 + fVar290 * fVar287 + fVar323 * fVar150 + fVar248 * fVar171;
        auVar190._12_4_ =
             fVar260 * fVar296 + fVar318 * fVar289 + fVar324 * fVar151 + fVar251 * fVar174;
        auVar190._16_4_ =
             fVar238 * fVar133 + fVar286 * fVar291 + fVar319 * fVar152 + fVar253 * fVar211;
        auVar190._20_4_ =
             fVar247 * fVar149 + fVar288 * fVar193 + fVar322 * fVar153 + fVar255 * fVar169;
        auVar190._24_4_ =
             fVar249 * fVar236 + fVar290 * fVar294 + fVar323 * fVar154 + fVar257 * fVar171;
        auVar190._28_4_ =
             *(float *)(catmullrom_basis1 + lVar18 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar18 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar18 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar18 + 0x1fb8);
        auVar220._8_4_ = 0x7fffffff;
        auVar220._0_8_ = 0x7fffffff7fffffff;
        auVar220._12_4_ = 0x7fffffff;
        auVar220._16_4_ = 0x7fffffff;
        auVar220._20_4_ = 0x7fffffff;
        auVar220._24_4_ = 0x7fffffff;
        auVar220._28_4_ = 0x7fffffff;
        auVar166 = vandps_avx(_local_600,auVar220);
        auVar31 = vandps_avx(auVar161,auVar220);
        auVar31 = vmaxps_avx(auVar166,auVar31);
        auVar166 = vandps_avx(auVar241,auVar220);
        auVar166 = vmaxps_avx(auVar31,auVar166);
        auVar198 = vpermilps_avx(auVar331,0);
        auVar242._16_16_ = auVar198;
        auVar242._0_16_ = auVar198;
        auVar166 = vcmpps_avx(auVar166,auVar242,1);
        auVar37 = vblendvps_avx(_local_600,auVar30,auVar166);
        auVar19 = vblendvps_avx(auVar161,_local_460,auVar166);
        auVar166 = vandps_avx(auVar266,auVar220);
        auVar31 = vandps_avx(auVar280,auVar220);
        auVar21 = vmaxps_avx(auVar166,auVar31);
        auVar166 = vandps_avx(auVar190,auVar220);
        auVar166 = vmaxps_avx(auVar21,auVar166);
        auVar21 = vcmpps_avx(auVar166,auVar242,1);
        auVar166 = vblendvps_avx(auVar266,auVar30,auVar21);
        auVar30 = vblendvps_avx(auVar280,_local_460,auVar21);
        fVar133 = auVar37._0_4_;
        fVar134 = auVar37._4_4_;
        fVar149 = auVar37._8_4_;
        fVar227 = auVar37._12_4_;
        fVar236 = auVar37._16_4_;
        fVar259 = auVar37._20_4_;
        fVar181 = auVar37._24_4_;
        fVar173 = auVar166._0_4_;
        fVar268 = auVar166._4_4_;
        fVar175 = auVar166._8_4_;
        fVar177 = auVar166._12_4_;
        fVar179 = auVar166._16_4_;
        fVar211 = auVar166._20_4_;
        fVar169 = auVar166._24_4_;
        fVar171 = -auVar166._28_4_;
        fVar135 = auVar19._0_4_;
        fVar250 = auVar19._4_4_;
        fVar152 = auVar19._8_4_;
        fVar246 = auVar19._12_4_;
        fVar255 = auVar19._16_4_;
        fVar287 = auVar19._20_4_;
        fVar294 = auVar19._24_4_;
        auVar141._0_4_ = fVar135 * fVar135 + fVar133 * fVar133;
        auVar141._4_4_ = fVar250 * fVar250 + fVar134 * fVar134;
        auVar141._8_4_ = fVar152 * fVar152 + fVar149 * fVar149;
        auVar141._12_4_ = fVar246 * fVar246 + fVar227 * fVar227;
        auVar141._16_4_ = fVar255 * fVar255 + fVar236 * fVar236;
        auVar141._20_4_ = fVar287 * fVar287 + fVar259 * fVar259;
        auVar141._24_4_ = fVar294 * fVar294 + fVar181 * fVar181;
        auVar141._28_4_ = auVar280._28_4_ + auVar37._28_4_;
        auVar37 = vrsqrtps_avx(auVar141);
        fVar195 = auVar37._0_4_;
        fVar215 = auVar37._4_4_;
        auVar33._4_4_ = fVar215 * 1.5;
        auVar33._0_4_ = fVar195 * 1.5;
        fVar228 = auVar37._8_4_;
        auVar33._8_4_ = fVar228 * 1.5;
        fVar212 = auVar37._12_4_;
        auVar33._12_4_ = fVar212 * 1.5;
        fVar150 = auVar37._16_4_;
        auVar33._16_4_ = fVar150 * 1.5;
        fVar151 = auVar37._20_4_;
        auVar33._20_4_ = fVar151 * 1.5;
        fVar153 = auVar37._24_4_;
        fVar296 = auVar31._28_4_;
        auVar33._24_4_ = fVar153 * 1.5;
        auVar33._28_4_ = fVar296;
        auVar34._4_4_ = fVar215 * fVar215 * fVar215 * auVar141._4_4_ * 0.5;
        auVar34._0_4_ = fVar195 * fVar195 * fVar195 * auVar141._0_4_ * 0.5;
        auVar34._8_4_ = fVar228 * fVar228 * fVar228 * auVar141._8_4_ * 0.5;
        auVar34._12_4_ = fVar212 * fVar212 * fVar212 * auVar141._12_4_ * 0.5;
        auVar34._16_4_ = fVar150 * fVar150 * fVar150 * auVar141._16_4_ * 0.5;
        auVar34._20_4_ = fVar151 * fVar151 * fVar151 * auVar141._20_4_ * 0.5;
        auVar34._24_4_ = fVar153 * fVar153 * fVar153 * auVar141._24_4_ * 0.5;
        auVar34._28_4_ = auVar141._28_4_;
        auVar31 = vsubps_avx(auVar33,auVar34);
        fVar195 = auVar31._0_4_;
        fVar212 = auVar31._4_4_;
        fVar153 = auVar31._8_4_;
        fVar248 = auVar31._12_4_;
        fVar257 = auVar31._16_4_;
        fVar289 = auVar31._20_4_;
        fVar194 = auVar31._24_4_;
        fVar215 = auVar30._0_4_;
        fVar150 = auVar30._4_4_;
        fVar154 = auVar30._8_4_;
        fVar251 = auVar30._12_4_;
        fVar277 = auVar30._16_4_;
        fVar291 = auVar30._20_4_;
        fVar214 = auVar30._24_4_;
        auVar142._0_4_ = fVar215 * fVar215 + fVar173 * fVar173;
        auVar142._4_4_ = fVar150 * fVar150 + fVar268 * fVar268;
        auVar142._8_4_ = fVar154 * fVar154 + fVar175 * fVar175;
        auVar142._12_4_ = fVar251 * fVar251 + fVar177 * fVar177;
        auVar142._16_4_ = fVar277 * fVar277 + fVar179 * fVar179;
        auVar142._20_4_ = fVar291 * fVar291 + fVar211 * fVar211;
        auVar142._24_4_ = fVar214 * fVar214 + fVar169 * fVar169;
        auVar142._28_4_ = auVar166._28_4_ + auVar31._28_4_;
        auVar166 = vrsqrtps_avx(auVar142);
        fVar228 = auVar166._0_4_;
        fVar151 = auVar166._4_4_;
        auVar35._4_4_ = fVar151 * 1.5;
        auVar35._0_4_ = fVar228 * 1.5;
        fVar237 = auVar166._8_4_;
        auVar35._8_4_ = fVar237 * 1.5;
        fVar253 = auVar166._12_4_;
        auVar35._12_4_ = fVar253 * 1.5;
        fVar285 = auVar166._16_4_;
        auVar35._16_4_ = fVar285 * 1.5;
        fVar193 = auVar166._20_4_;
        auVar35._20_4_ = fVar193 * 1.5;
        fVar213 = auVar166._24_4_;
        auVar35._24_4_ = fVar213 * 1.5;
        auVar35._28_4_ = fVar296;
        auVar166._4_4_ = fVar151 * fVar151 * fVar151 * auVar142._4_4_ * 0.5;
        auVar166._0_4_ = fVar228 * fVar228 * fVar228 * auVar142._0_4_ * 0.5;
        auVar166._8_4_ = fVar237 * fVar237 * fVar237 * auVar142._8_4_ * 0.5;
        auVar166._12_4_ = fVar253 * fVar253 * fVar253 * auVar142._12_4_ * 0.5;
        auVar166._16_4_ = fVar285 * fVar285 * fVar285 * auVar142._16_4_ * 0.5;
        auVar166._20_4_ = fVar193 * fVar193 * fVar193 * auVar142._20_4_ * 0.5;
        auVar166._24_4_ = fVar213 * fVar213 * fVar213 * auVar142._24_4_ * 0.5;
        auVar166._28_4_ = auVar142._28_4_;
        auVar166 = vsubps_avx(auVar35,auVar166);
        fVar228 = auVar166._0_4_;
        fVar151 = auVar166._4_4_;
        fVar237 = auVar166._8_4_;
        fVar253 = auVar166._12_4_;
        fVar285 = auVar166._16_4_;
        fVar193 = auVar166._20_4_;
        fVar213 = auVar166._24_4_;
        fVar135 = fVar132 * fVar135 * fVar195;
        fVar250 = fVar148 * fVar250 * fVar212;
        auVar36._4_4_ = fVar250;
        auVar36._0_4_ = fVar135;
        fVar152 = fStack_7d8 * fVar152 * fVar153;
        auVar36._8_4_ = fVar152;
        fVar246 = fStack_7d4 * fVar246 * fVar248;
        auVar36._12_4_ = fVar246;
        fVar255 = fStack_7d0 * fVar255 * fVar257;
        auVar36._16_4_ = fVar255;
        fVar287 = fStack_7cc * fVar287 * fVar289;
        auVar36._20_4_ = fVar287;
        fVar294 = fStack_7c8 * fVar294 * fVar194;
        auVar36._24_4_ = fVar294;
        auVar36._28_4_ = fVar171;
        local_600._4_4_ = auVar279._4_4_ + fVar250;
        local_600._0_4_ = auVar279._0_4_ + fVar135;
        fStack_5f8 = auVar279._8_4_ + fVar152;
        fStack_5f4 = auVar279._12_4_ + fVar246;
        fStack_5f0 = auVar279._16_4_ + fVar255;
        fStack_5ec = auVar279._20_4_ + fVar287;
        fStack_5e8 = auVar279._24_4_ + fVar294;
        fStack_5e4 = auVar279._28_4_ + fVar171;
        fVar135 = fVar132 * fVar195 * -fVar133;
        fVar250 = fVar148 * fVar212 * -fVar134;
        auVar38._4_4_ = fVar250;
        auVar38._0_4_ = fVar135;
        fVar152 = fStack_7d8 * fVar153 * -fVar149;
        auVar38._8_4_ = fVar152;
        fVar246 = fStack_7d4 * fVar248 * -fVar227;
        auVar38._12_4_ = fVar246;
        fVar255 = fStack_7d0 * fVar257 * -fVar236;
        auVar38._16_4_ = fVar255;
        fVar287 = fStack_7cc * fVar289 * -fVar259;
        auVar38._20_4_ = fVar287;
        fVar294 = fStack_7c8 * fVar194 * -fVar181;
        auVar38._24_4_ = fVar294;
        auVar38._28_4_ = fVar296;
        local_560._4_4_ = fVar250 + auVar308._4_4_;
        local_560._0_4_ = fVar135 + auVar308._0_4_;
        fStack_558 = fVar152 + auVar308._8_4_;
        fStack_554 = fVar246 + auVar308._12_4_;
        fStack_550 = fVar255 + auVar308._16_4_;
        fStack_54c = fVar287 + auVar308._20_4_;
        fStack_548 = fVar294 + auVar308._24_4_;
        fStack_544 = fVar296 + 0.0;
        fVar135 = fVar132 * fVar195 * 0.0;
        fVar195 = fVar148 * fVar212 * 0.0;
        auVar39._4_4_ = fVar195;
        auVar39._0_4_ = fVar135;
        fVar250 = fStack_7d8 * fVar153 * 0.0;
        auVar39._8_4_ = fVar250;
        fVar212 = fStack_7d4 * fVar248 * 0.0;
        auVar39._12_4_ = fVar212;
        fVar152 = fStack_7d0 * fVar257 * 0.0;
        auVar39._16_4_ = fVar152;
        fVar153 = fStack_7cc * fVar289 * 0.0;
        auVar39._20_4_ = fVar153;
        fVar246 = fStack_7c8 * fVar194 * 0.0;
        auVar39._24_4_ = fVar246;
        auVar39._28_4_ = fVar233;
        auVar243._0_4_ = (float)local_580._0_4_ + fVar135;
        auVar243._4_4_ = (float)local_580._4_4_ + fVar195;
        auVar243._8_4_ = fStack_578 + fVar250;
        auVar243._12_4_ = fStack_574 + fVar212;
        auVar243._16_4_ = fStack_570 + fVar152;
        auVar243._20_4_ = fStack_56c + fVar153;
        auVar243._24_4_ = fStack_568 + fVar246;
        auVar243._28_4_ = fStack_564 + fVar233;
        fVar135 = (float)local_480._0_4_ * fVar215 * fVar228;
        fVar195 = local_480._4_4_ * fVar150 * fVar151;
        auVar40._4_4_ = fVar195;
        auVar40._0_4_ = fVar135;
        fVar215 = local_480._8_4_ * fVar154 * fVar237;
        auVar40._8_4_ = fVar215;
        fVar250 = local_480._12_4_ * fVar251 * fVar253;
        auVar40._12_4_ = fVar250;
        fVar212 = local_480._16_4_ * fVar277 * fVar285;
        auVar40._16_4_ = fVar212;
        fVar150 = local_480._20_4_ * fVar291 * fVar193;
        auVar40._20_4_ = fVar150;
        fVar152 = local_480._24_4_ * fVar214 * fVar213;
        auVar40._24_4_ = fVar152;
        auVar40._28_4_ = auVar30._28_4_;
        auVar19 = vsubps_avx(auVar279,auVar36);
        auVar281._0_4_ = local_380._0_4_ + fVar135;
        auVar281._4_4_ = local_380._4_4_ + fVar195;
        auVar281._8_4_ = local_380._8_4_ + fVar215;
        auVar281._12_4_ = local_380._12_4_ + fVar250;
        auVar281._16_4_ = local_380._16_4_ + fVar212;
        auVar281._20_4_ = local_380._20_4_ + fVar150;
        auVar281._24_4_ = local_380._24_4_ + fVar152;
        auVar281._28_4_ = local_380._28_4_ + auVar30._28_4_;
        fVar135 = (float)local_480._0_4_ * fVar228 * -fVar173;
        fVar195 = local_480._4_4_ * fVar151 * -fVar268;
        auVar30._4_4_ = fVar195;
        auVar30._0_4_ = fVar135;
        fVar215 = local_480._8_4_ * fVar237 * -fVar175;
        auVar30._8_4_ = fVar215;
        fVar250 = local_480._12_4_ * fVar253 * -fVar177;
        auVar30._12_4_ = fVar250;
        fVar212 = local_480._16_4_ * fVar285 * -fVar179;
        auVar30._16_4_ = fVar212;
        fVar150 = local_480._20_4_ * fVar193 * -fVar211;
        auVar30._20_4_ = fVar150;
        fVar152 = local_480._24_4_ * fVar213 * -fVar169;
        auVar30._24_4_ = fVar152;
        auVar30._28_4_ = fVar318;
        auVar21 = vsubps_avx(auVar308,auVar38);
        auVar298._0_4_ = fVar135 + (float)local_440._0_4_;
        auVar298._4_4_ = fVar195 + (float)local_440._4_4_;
        auVar298._8_4_ = fVar215 + fStack_438;
        auVar298._12_4_ = fVar250 + fStack_434;
        auVar298._16_4_ = fVar212 + fStack_430;
        auVar298._20_4_ = fVar150 + fStack_42c;
        auVar298._24_4_ = fVar152 + fStack_428;
        auVar298._28_4_ = fVar318 + fStack_424;
        fVar135 = (float)local_480._0_4_ * fVar228 * 0.0;
        fVar195 = local_480._4_4_ * fVar151 * 0.0;
        auVar41._4_4_ = fVar195;
        auVar41._0_4_ = fVar135;
        fVar215 = local_480._8_4_ * fVar237 * 0.0;
        auVar41._8_4_ = fVar215;
        fVar228 = local_480._12_4_ * fVar253 * 0.0;
        auVar41._12_4_ = fVar228;
        fVar250 = local_480._16_4_ * fVar285 * 0.0;
        auVar41._16_4_ = fVar250;
        fVar212 = local_480._20_4_ * fVar193 * 0.0;
        auVar41._20_4_ = fVar212;
        fVar150 = local_480._24_4_ * fVar213 * 0.0;
        auVar41._24_4_ = fVar150;
        auVar41._28_4_ = 0x3f000000;
        auVar279 = vsubps_avx(_local_580,auVar39);
        auVar320._0_4_ = fVar135 + (float)local_360._0_4_;
        auVar320._4_4_ = fVar195 + (float)local_360._4_4_;
        auVar320._8_4_ = fVar215 + fStack_358;
        auVar320._12_4_ = fVar228 + fStack_354;
        auVar320._16_4_ = fVar250 + fStack_350;
        auVar320._20_4_ = fVar212 + fStack_34c;
        auVar320._24_4_ = fVar150 + fStack_348;
        auVar320._28_4_ = fStack_344 + 0.5;
        auVar166 = vsubps_avx(local_380,auVar40);
        auVar31 = vsubps_avx(_local_440,auVar30);
        auVar308 = vsubps_avx(_local_360,auVar41);
        auVar30 = vsubps_avx(auVar298,auVar21);
        auVar37 = vsubps_avx(auVar320,auVar279);
        auVar42._4_4_ = auVar279._4_4_ * auVar30._4_4_;
        auVar42._0_4_ = auVar279._0_4_ * auVar30._0_4_;
        auVar42._8_4_ = auVar279._8_4_ * auVar30._8_4_;
        auVar42._12_4_ = auVar279._12_4_ * auVar30._12_4_;
        auVar42._16_4_ = auVar279._16_4_ * auVar30._16_4_;
        auVar42._20_4_ = auVar279._20_4_ * auVar30._20_4_;
        auVar42._24_4_ = auVar279._24_4_ * auVar30._24_4_;
        auVar42._28_4_ = fVar305;
        auVar43._4_4_ = auVar21._4_4_ * auVar37._4_4_;
        auVar43._0_4_ = auVar21._0_4_ * auVar37._0_4_;
        auVar43._8_4_ = auVar21._8_4_ * auVar37._8_4_;
        auVar43._12_4_ = auVar21._12_4_ * auVar37._12_4_;
        auVar43._16_4_ = auVar21._16_4_ * auVar37._16_4_;
        auVar43._20_4_ = auVar21._20_4_ * auVar37._20_4_;
        auVar43._24_4_ = auVar21._24_4_ * auVar37._24_4_;
        auVar43._28_4_ = fStack_344;
        auVar202 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar19._4_4_ * auVar37._4_4_;
        auVar44._0_4_ = auVar19._0_4_ * auVar37._0_4_;
        auVar44._8_4_ = auVar19._8_4_ * auVar37._8_4_;
        auVar44._12_4_ = auVar19._12_4_ * auVar37._12_4_;
        auVar44._16_4_ = auVar19._16_4_ * auVar37._16_4_;
        auVar44._20_4_ = auVar19._20_4_ * auVar37._20_4_;
        auVar44._24_4_ = auVar19._24_4_ * auVar37._24_4_;
        auVar44._28_4_ = auVar37._28_4_;
        auVar33 = vsubps_avx(auVar281,auVar19);
        auVar45._4_4_ = auVar279._4_4_ * auVar33._4_4_;
        auVar45._0_4_ = auVar279._0_4_ * auVar33._0_4_;
        auVar45._8_4_ = auVar279._8_4_ * auVar33._8_4_;
        auVar45._12_4_ = auVar279._12_4_ * auVar33._12_4_;
        auVar45._16_4_ = auVar279._16_4_ * auVar33._16_4_;
        auVar45._20_4_ = auVar279._20_4_ * auVar33._20_4_;
        auVar45._24_4_ = auVar279._24_4_ * auVar33._24_4_;
        auVar45._28_4_ = fStack_424;
        auVar34 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar33._4_4_ * auVar21._4_4_;
        auVar46._0_4_ = auVar33._0_4_ * auVar21._0_4_;
        auVar46._8_4_ = auVar33._8_4_ * auVar21._8_4_;
        auVar46._12_4_ = auVar33._12_4_ * auVar21._12_4_;
        auVar46._16_4_ = auVar33._16_4_ * auVar21._16_4_;
        auVar46._20_4_ = auVar33._20_4_ * auVar21._20_4_;
        auVar46._24_4_ = auVar33._24_4_ * auVar21._24_4_;
        auVar46._28_4_ = auVar37._28_4_;
        auVar47._4_4_ = auVar19._4_4_ * auVar30._4_4_;
        auVar47._0_4_ = auVar19._0_4_ * auVar30._0_4_;
        auVar47._8_4_ = auVar19._8_4_ * auVar30._8_4_;
        auVar47._12_4_ = auVar19._12_4_ * auVar30._12_4_;
        auVar47._16_4_ = auVar19._16_4_ * auVar30._16_4_;
        auVar47._20_4_ = auVar19._20_4_ * auVar30._20_4_;
        auVar47._24_4_ = auVar19._24_4_ * auVar30._24_4_;
        auVar47._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar47,auVar46);
        auVar143._0_4_ = auVar202._0_4_ * 0.0 + auVar30._0_4_ + auVar34._0_4_ * 0.0;
        auVar143._4_4_ = auVar202._4_4_ * 0.0 + auVar30._4_4_ + auVar34._4_4_ * 0.0;
        auVar143._8_4_ = auVar202._8_4_ * 0.0 + auVar30._8_4_ + auVar34._8_4_ * 0.0;
        auVar143._12_4_ = auVar202._12_4_ * 0.0 + auVar30._12_4_ + auVar34._12_4_ * 0.0;
        auVar143._16_4_ = auVar202._16_4_ * 0.0 + auVar30._16_4_ + auVar34._16_4_ * 0.0;
        auVar143._20_4_ = auVar202._20_4_ * 0.0 + auVar30._20_4_ + auVar34._20_4_ * 0.0;
        auVar143._24_4_ = auVar202._24_4_ * 0.0 + auVar30._24_4_ + auVar34._24_4_ * 0.0;
        auVar143._28_4_ = auVar30._28_4_ + auVar30._28_4_ + auVar34._28_4_;
        auVar202 = vcmpps_avx(auVar143,ZEXT432(0) << 0x20,2);
        _local_540 = vblendvps_avx(auVar166,_local_600,auVar202);
        _local_5e0 = vblendvps_avx(auVar31,_local_560,auVar202);
        auVar166 = vblendvps_avx(auVar308,auVar243,auVar202);
        auVar31 = vblendvps_avx(auVar19,auVar281,auVar202);
        auVar30 = vblendvps_avx(auVar21,auVar298,auVar202);
        auVar37 = vblendvps_avx(auVar279,auVar320,auVar202);
        auVar19 = vblendvps_avx(auVar281,auVar19,auVar202);
        auVar21 = vblendvps_avx(auVar298,auVar21,auVar202);
        local_7c0 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auStack_7b0 = auVar20._16_16_;
        auVar20 = vblendvps_avx(auVar320,auVar279,auVar202);
        auVar19 = vsubps_avx(auVar19,_local_540);
        auVar279 = vsubps_avx(auVar21,_local_5e0);
        auVar33 = vsubps_avx(auVar20,auVar166);
        auVar20 = vsubps_avx(_local_5e0,auVar30);
        fVar135 = auVar279._0_4_;
        fVar181 = auVar166._0_4_;
        fVar212 = auVar279._4_4_;
        fVar173 = auVar166._4_4_;
        auVar48._4_4_ = fVar173 * fVar212;
        auVar48._0_4_ = fVar181 * fVar135;
        fVar154 = auVar279._8_4_;
        fVar268 = auVar166._8_4_;
        auVar48._8_4_ = fVar268 * fVar154;
        fVar253 = auVar279._12_4_;
        fVar175 = auVar166._12_4_;
        auVar48._12_4_ = fVar175 * fVar253;
        fVar287 = auVar279._16_4_;
        fVar177 = auVar166._16_4_;
        auVar48._16_4_ = fVar177 * fVar287;
        fVar194 = auVar279._20_4_;
        fVar179 = auVar166._20_4_;
        auVar48._20_4_ = fVar179 * fVar194;
        fVar134 = auVar279._24_4_;
        fVar211 = auVar166._24_4_;
        auVar48._24_4_ = fVar211 * fVar134;
        auVar48._28_4_ = auVar21._28_4_;
        fVar195 = local_5e0._0_4_;
        fVar238 = auVar33._0_4_;
        fVar150 = local_5e0._4_4_;
        fVar247 = auVar33._4_4_;
        auVar49._4_4_ = fVar247 * fVar150;
        auVar49._0_4_ = fVar238 * fVar195;
        fVar237 = local_5e0._8_4_;
        fVar249 = auVar33._8_4_;
        auVar49._8_4_ = fVar249 * fVar237;
        fVar255 = local_5e0._12_4_;
        fVar252 = auVar33._12_4_;
        auVar49._12_4_ = fVar252 * fVar255;
        fVar289 = local_5e0._16_4_;
        fVar254 = auVar33._16_4_;
        auVar49._16_4_ = fVar254 * fVar289;
        fVar214 = local_5e0._20_4_;
        fVar256 = auVar33._20_4_;
        auVar49._20_4_ = fVar256 * fVar214;
        fVar149 = local_5e0._24_4_;
        fVar258 = auVar33._24_4_;
        uVar12 = auVar308._28_4_;
        auVar49._24_4_ = fVar258 * fVar149;
        auVar49._28_4_ = uVar12;
        auVar21 = vsubps_avx(auVar49,auVar48);
        fVar215 = local_540._0_4_;
        fVar151 = local_540._4_4_;
        auVar50._4_4_ = fVar247 * fVar151;
        auVar50._0_4_ = fVar238 * fVar215;
        fVar246 = local_540._8_4_;
        auVar50._8_4_ = fVar249 * fVar246;
        fVar257 = local_540._12_4_;
        auVar50._12_4_ = fVar252 * fVar257;
        fVar291 = local_540._16_4_;
        auVar50._16_4_ = fVar254 * fVar291;
        fVar213 = local_540._20_4_;
        auVar50._20_4_ = fVar256 * fVar213;
        fVar227 = local_540._24_4_;
        auVar50._24_4_ = fVar258 * fVar227;
        auVar50._28_4_ = uVar12;
        fVar228 = auVar19._0_4_;
        fVar152 = auVar19._4_4_;
        auVar51._4_4_ = fVar173 * fVar152;
        auVar51._0_4_ = fVar181 * fVar228;
        fVar248 = auVar19._8_4_;
        auVar51._8_4_ = fVar268 * fVar248;
        fVar277 = auVar19._12_4_;
        auVar51._12_4_ = fVar175 * fVar277;
        fVar193 = auVar19._16_4_;
        auVar51._16_4_ = fVar177 * fVar193;
        fVar296 = auVar19._20_4_;
        auVar51._20_4_ = fVar179 * fVar296;
        fVar236 = auVar19._24_4_;
        auVar51._24_4_ = fVar211 * fVar236;
        auVar51._28_4_ = auVar320._28_4_;
        auVar308 = vsubps_avx(auVar51,auVar50);
        auVar52._4_4_ = fVar150 * fVar152;
        auVar52._0_4_ = fVar195 * fVar228;
        auVar52._8_4_ = fVar237 * fVar248;
        auVar52._12_4_ = fVar255 * fVar277;
        auVar52._16_4_ = fVar289 * fVar193;
        auVar52._20_4_ = fVar214 * fVar296;
        auVar52._24_4_ = fVar149 * fVar236;
        auVar52._28_4_ = uVar12;
        auVar325._0_4_ = fVar215 * fVar135;
        auVar325._4_4_ = fVar151 * fVar212;
        auVar325._8_4_ = fVar246 * fVar154;
        auVar325._12_4_ = fVar257 * fVar253;
        auVar325._16_4_ = fVar291 * fVar287;
        auVar325._20_4_ = fVar213 * fVar194;
        auVar325._24_4_ = fVar227 * fVar134;
        auVar325._28_4_ = 0;
        auVar34 = vsubps_avx(auVar325,auVar52);
        auVar35 = vsubps_avx(auVar166,auVar37);
        fVar250 = auVar34._28_4_ + auVar308._28_4_;
        auVar162._0_4_ = auVar34._0_4_ + auVar308._0_4_ * 0.0 + auVar21._0_4_ * 0.0;
        auVar162._4_4_ = auVar34._4_4_ + auVar308._4_4_ * 0.0 + auVar21._4_4_ * 0.0;
        auVar162._8_4_ = auVar34._8_4_ + auVar308._8_4_ * 0.0 + auVar21._8_4_ * 0.0;
        auVar162._12_4_ = auVar34._12_4_ + auVar308._12_4_ * 0.0 + auVar21._12_4_ * 0.0;
        auVar162._16_4_ = auVar34._16_4_ + auVar308._16_4_ * 0.0 + auVar21._16_4_ * 0.0;
        auVar162._20_4_ = auVar34._20_4_ + auVar308._20_4_ * 0.0 + auVar21._20_4_ * 0.0;
        auVar162._24_4_ = auVar34._24_4_ + auVar308._24_4_ * 0.0 + auVar21._24_4_ * 0.0;
        auVar162._28_4_ = fVar250 + auVar21._28_4_;
        auVar167 = ZEXT3264(auVar162);
        fVar169 = auVar20._0_4_;
        fVar171 = auVar20._4_4_;
        auVar53._4_4_ = fVar171 * auVar37._4_4_;
        auVar53._0_4_ = fVar169 * auVar37._0_4_;
        fVar174 = auVar20._8_4_;
        auVar53._8_4_ = fVar174 * auVar37._8_4_;
        fVar176 = auVar20._12_4_;
        auVar53._12_4_ = fVar176 * auVar37._12_4_;
        fVar178 = auVar20._16_4_;
        auVar53._16_4_ = fVar178 * auVar37._16_4_;
        fVar180 = auVar20._20_4_;
        auVar53._20_4_ = fVar180 * auVar37._20_4_;
        fVar182 = auVar20._24_4_;
        auVar53._24_4_ = fVar182 * auVar37._24_4_;
        auVar53._28_4_ = fVar250;
        fVar250 = auVar35._0_4_;
        fVar153 = auVar35._4_4_;
        auVar54._4_4_ = auVar30._4_4_ * fVar153;
        auVar54._0_4_ = auVar30._0_4_ * fVar250;
        fVar251 = auVar35._8_4_;
        auVar54._8_4_ = auVar30._8_4_ * fVar251;
        fVar285 = auVar35._12_4_;
        auVar54._12_4_ = auVar30._12_4_ * fVar285;
        fVar294 = auVar35._16_4_;
        auVar54._16_4_ = auVar30._16_4_ * fVar294;
        fVar133 = auVar35._20_4_;
        auVar54._20_4_ = auVar30._20_4_ * fVar133;
        fVar259 = auVar35._24_4_;
        auVar54._24_4_ = auVar30._24_4_ * fVar259;
        auVar54._28_4_ = auVar34._28_4_;
        auVar20 = vsubps_avx(auVar54,auVar53);
        auVar308 = vsubps_avx(_local_540,auVar31);
        fVar260 = auVar308._0_4_;
        fVar286 = auVar308._4_4_;
        auVar55._4_4_ = fVar286 * auVar37._4_4_;
        auVar55._0_4_ = fVar260 * auVar37._0_4_;
        fVar288 = auVar308._8_4_;
        auVar55._8_4_ = fVar288 * auVar37._8_4_;
        fVar290 = auVar308._12_4_;
        auVar55._12_4_ = fVar290 * auVar37._12_4_;
        fVar292 = auVar308._16_4_;
        auVar55._16_4_ = fVar292 * auVar37._16_4_;
        fVar293 = auVar308._20_4_;
        auVar55._20_4_ = fVar293 * auVar37._20_4_;
        fVar295 = auVar308._24_4_;
        auVar55._24_4_ = fVar295 * auVar37._24_4_;
        auVar55._28_4_ = auVar37._28_4_;
        auVar56._4_4_ = auVar31._4_4_ * fVar153;
        auVar56._0_4_ = auVar31._0_4_ * fVar250;
        auVar56._8_4_ = auVar31._8_4_ * fVar251;
        auVar56._12_4_ = auVar31._12_4_ * fVar285;
        auVar56._16_4_ = auVar31._16_4_ * fVar294;
        auVar56._20_4_ = auVar31._20_4_ * fVar133;
        auVar56._24_4_ = auVar31._24_4_ * fVar259;
        auVar56._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = auVar30._4_4_ * fVar286;
        auVar57._0_4_ = auVar30._0_4_ * fVar260;
        auVar57._8_4_ = auVar30._8_4_ * fVar288;
        auVar57._12_4_ = auVar30._12_4_ * fVar290;
        auVar57._16_4_ = auVar30._16_4_ * fVar292;
        auVar57._20_4_ = auVar30._20_4_ * fVar293;
        auVar57._24_4_ = auVar30._24_4_ * fVar295;
        auVar57._28_4_ = auVar37._28_4_;
        auVar58._4_4_ = auVar31._4_4_ * fVar171;
        auVar58._0_4_ = auVar31._0_4_ * fVar169;
        auVar58._8_4_ = auVar31._8_4_ * fVar174;
        auVar58._12_4_ = auVar31._12_4_ * fVar176;
        auVar58._16_4_ = auVar31._16_4_ * fVar178;
        auVar58._20_4_ = auVar31._20_4_ * fVar180;
        auVar58._24_4_ = auVar31._24_4_ * fVar182;
        auVar58._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar58,auVar57);
        auVar221._0_4_ = auVar20._0_4_ * 0.0 + auVar31._0_4_ + auVar21._0_4_ * 0.0;
        auVar221._4_4_ = auVar20._4_4_ * 0.0 + auVar31._4_4_ + auVar21._4_4_ * 0.0;
        auVar221._8_4_ = auVar20._8_4_ * 0.0 + auVar31._8_4_ + auVar21._8_4_ * 0.0;
        auVar221._12_4_ = auVar20._12_4_ * 0.0 + auVar31._12_4_ + auVar21._12_4_ * 0.0;
        auVar221._16_4_ = auVar20._16_4_ * 0.0 + auVar31._16_4_ + auVar21._16_4_ * 0.0;
        auVar221._20_4_ = auVar20._20_4_ * 0.0 + auVar31._20_4_ + auVar21._20_4_ * 0.0;
        auVar221._24_4_ = auVar20._24_4_ * 0.0 + auVar31._24_4_ + auVar21._24_4_ * 0.0;
        auVar221._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar21._28_4_;
        auVar20 = vmaxps_avx(auVar162,auVar221);
        auVar20 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,2);
        auVar198 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auVar198 = vpand_avx(auVar198,local_7c0);
        auVar199 = vpmovsxwd_avx(auVar198);
        auVar200 = vpunpckhwd_avx(auVar198,auVar198);
        auVar203._16_16_ = auVar200;
        auVar203._0_16_ = auVar199;
        if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar203 >> 0x7f,0) == '\0') &&
              (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar200 >> 0x3f,0) == '\0') &&
            (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar200[0xf]) {
LAB_00fa6d6f:
          auVar147 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar321._4_4_ = fVar148;
          auVar321._0_4_ = fVar132;
          auVar321._8_4_ = fStack_7d8;
          auVar321._12_4_ = fStack_7d4;
          auVar321._16_4_ = fStack_7d0;
          auVar321._20_4_ = fStack_7cc;
          auVar321._24_4_ = fStack_7c8;
          auVar321._28_4_ = fStack_7c4;
        }
        else {
          auVar59._4_4_ = fVar153 * fVar212;
          auVar59._0_4_ = fVar250 * fVar135;
          auVar59._8_4_ = fVar251 * fVar154;
          auVar59._12_4_ = fVar285 * fVar253;
          auVar59._16_4_ = fVar294 * fVar287;
          auVar59._20_4_ = fVar133 * fVar194;
          auVar59._24_4_ = fVar259 * fVar134;
          auVar59._28_4_ = auVar200._12_4_;
          auVar309._0_4_ = fVar169 * fVar238;
          auVar309._4_4_ = fVar171 * fVar247;
          auVar309._8_4_ = fVar174 * fVar249;
          auVar309._12_4_ = fVar176 * fVar252;
          auVar309._16_4_ = fVar178 * fVar254;
          auVar309._20_4_ = fVar180 * fVar256;
          auVar309._24_4_ = fVar182 * fVar258;
          auVar309._28_4_ = 0;
          auVar31 = vsubps_avx(auVar309,auVar59);
          auVar60._4_4_ = fVar286 * fVar247;
          auVar60._0_4_ = fVar260 * fVar238;
          auVar60._8_4_ = fVar288 * fVar249;
          auVar60._12_4_ = fVar290 * fVar252;
          auVar60._16_4_ = fVar292 * fVar254;
          auVar60._20_4_ = fVar293 * fVar256;
          auVar60._24_4_ = fVar295 * fVar258;
          auVar60._28_4_ = auVar33._28_4_;
          auVar61._4_4_ = fVar153 * fVar152;
          auVar61._0_4_ = fVar250 * fVar228;
          auVar61._8_4_ = fVar251 * fVar248;
          auVar61._12_4_ = fVar285 * fVar277;
          auVar61._16_4_ = fVar294 * fVar193;
          auVar61._20_4_ = fVar133 * fVar296;
          auVar61._24_4_ = fVar259 * fVar236;
          auVar61._28_4_ = auVar35._28_4_;
          auVar30 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar171 * fVar152;
          auVar62._0_4_ = fVar169 * fVar228;
          auVar62._8_4_ = fVar174 * fVar248;
          auVar62._12_4_ = fVar176 * fVar277;
          auVar62._16_4_ = fVar178 * fVar193;
          auVar62._20_4_ = fVar180 * fVar296;
          auVar62._24_4_ = fVar182 * fVar236;
          auVar62._28_4_ = auVar162._28_4_;
          auVar63._4_4_ = fVar286 * fVar212;
          auVar63._0_4_ = fVar260 * fVar135;
          auVar63._8_4_ = fVar288 * fVar154;
          auVar63._12_4_ = fVar290 * fVar253;
          auVar63._16_4_ = fVar292 * fVar287;
          auVar63._20_4_ = fVar293 * fVar194;
          auVar63._24_4_ = fVar295 * fVar134;
          auVar63._28_4_ = auVar279._28_4_;
          auVar37 = vsubps_avx(auVar63,auVar62);
          auVar267._0_4_ = auVar31._0_4_ * 0.0 + auVar37._0_4_ + auVar30._0_4_ * 0.0;
          auVar267._4_4_ = auVar31._4_4_ * 0.0 + auVar37._4_4_ + auVar30._4_4_ * 0.0;
          auVar267._8_4_ = auVar31._8_4_ * 0.0 + auVar37._8_4_ + auVar30._8_4_ * 0.0;
          auVar267._12_4_ = auVar31._12_4_ * 0.0 + auVar37._12_4_ + auVar30._12_4_ * 0.0;
          auVar267._16_4_ = auVar31._16_4_ * 0.0 + auVar37._16_4_ + auVar30._16_4_ * 0.0;
          auVar267._20_4_ = auVar31._20_4_ * 0.0 + auVar37._20_4_ + auVar30._20_4_ * 0.0;
          auVar267._24_4_ = auVar31._24_4_ * 0.0 + auVar37._24_4_ + auVar30._24_4_ * 0.0;
          auVar267._28_4_ = auVar279._28_4_ + auVar37._28_4_ + auVar162._28_4_;
          auVar20 = vrcpps_avx(auVar267);
          fVar228 = auVar20._0_4_;
          fVar250 = auVar20._4_4_;
          auVar64._4_4_ = auVar267._4_4_ * fVar250;
          auVar64._0_4_ = auVar267._0_4_ * fVar228;
          fVar212 = auVar20._8_4_;
          auVar64._8_4_ = auVar267._8_4_ * fVar212;
          fVar152 = auVar20._12_4_;
          auVar64._12_4_ = auVar267._12_4_ * fVar152;
          fVar153 = auVar20._16_4_;
          auVar64._16_4_ = auVar267._16_4_ * fVar153;
          fVar154 = auVar20._20_4_;
          auVar64._20_4_ = auVar267._20_4_ * fVar154;
          fVar248 = auVar20._24_4_;
          auVar64._24_4_ = auVar267._24_4_ * fVar248;
          auVar64._28_4_ = auVar35._28_4_;
          auVar310._8_4_ = 0x3f800000;
          auVar310._0_8_ = 0x3f8000003f800000;
          auVar310._12_4_ = 0x3f800000;
          auVar310._16_4_ = 0x3f800000;
          auVar310._20_4_ = 0x3f800000;
          auVar310._24_4_ = 0x3f800000;
          auVar310._28_4_ = 0x3f800000;
          auVar21 = vsubps_avx(auVar310,auVar64);
          fVar228 = auVar21._0_4_ * fVar228 + fVar228;
          fVar250 = auVar21._4_4_ * fVar250 + fVar250;
          fVar212 = auVar21._8_4_ * fVar212 + fVar212;
          fVar152 = auVar21._12_4_ * fVar152 + fVar152;
          fVar153 = auVar21._16_4_ * fVar153 + fVar153;
          fVar154 = auVar21._20_4_ * fVar154 + fVar154;
          fVar248 = auVar21._24_4_ * fVar248 + fVar248;
          fVar251 = auVar21._28_4_ + auVar20._28_4_;
          auVar167 = ZEXT3264(CONCAT428(fVar251,CONCAT424(fVar248,CONCAT420(fVar154,CONCAT416(
                                                  fVar153,CONCAT412(fVar152,CONCAT48(fVar212,
                                                  CONCAT44(fVar250,fVar228))))))));
          auVar65._4_4_ =
               (auVar31._4_4_ * fVar151 + auVar30._4_4_ * fVar150 + auVar37._4_4_ * fVar173) *
               fVar250;
          auVar65._0_4_ =
               (auVar31._0_4_ * fVar215 + auVar30._0_4_ * fVar195 + auVar37._0_4_ * fVar181) *
               fVar228;
          auVar65._8_4_ =
               (auVar31._8_4_ * fVar246 + auVar30._8_4_ * fVar237 + auVar37._8_4_ * fVar268) *
               fVar212;
          auVar65._12_4_ =
               (auVar31._12_4_ * fVar257 + auVar30._12_4_ * fVar255 + auVar37._12_4_ * fVar175) *
               fVar152;
          auVar65._16_4_ =
               (auVar31._16_4_ * fVar291 + auVar30._16_4_ * fVar289 + auVar37._16_4_ * fVar177) *
               fVar153;
          auVar65._20_4_ =
               (auVar31._20_4_ * fVar213 + auVar30._20_4_ * fVar214 + auVar37._20_4_ * fVar179) *
               fVar154;
          auVar65._24_4_ =
               (auVar31._24_4_ * fVar227 + auVar30._24_4_ * fVar149 + auVar37._24_4_ * fVar211) *
               fVar248;
          auVar65._28_4_ = local_540._28_4_ + auVar19._28_4_ + auVar166._28_4_;
          auVar199 = vpermilps_avx((undefined1  [16])aVar13,0xff);
          auVar204._16_16_ = auVar199;
          auVar204._0_16_ = auVar199;
          auVar166 = vcmpps_avx(auVar204,auVar65,2);
          fVar135 = ray->tfar;
          auVar230._4_4_ = fVar135;
          auVar230._0_4_ = fVar135;
          auVar230._8_4_ = fVar135;
          auVar230._12_4_ = fVar135;
          auVar230._16_4_ = fVar135;
          auVar230._20_4_ = fVar135;
          auVar230._24_4_ = fVar135;
          auVar230._28_4_ = fVar135;
          auVar20 = vcmpps_avx(auVar65,auVar230,2);
          auVar166 = vandps_avx(auVar20,auVar166);
          auVar199 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
          auVar198 = vpand_avx(auVar198,auVar199);
          auVar199 = vpmovsxwd_avx(auVar198);
          auVar200 = vpshufd_avx(auVar198,0xee);
          auVar200 = vpmovsxwd_avx(auVar200);
          auVar205._16_16_ = auVar200;
          auVar205._0_16_ = auVar199;
          if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar205 >> 0x7f,0) == '\0') &&
                (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar200 >> 0x3f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar200[0xf]) goto LAB_00fa6d6f;
          auVar166 = vcmpps_avx(ZEXT832(0) << 0x20,auVar267,4);
          auVar199 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
          auVar198 = vpand_avx(auVar198,auVar199);
          auVar199 = vpmovsxwd_avx(auVar198);
          auVar198 = vpunpckhwd_avx(auVar198,auVar198);
          auVar244._16_16_ = auVar198;
          auVar244._0_16_ = auVar199;
          auVar147 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar321._4_4_ = fVar148;
          auVar321._0_4_ = fVar132;
          auVar321._8_4_ = fStack_7d8;
          auVar321._12_4_ = fStack_7d4;
          auVar321._16_4_ = fStack_7d0;
          auVar321._20_4_ = fStack_7cc;
          auVar321._24_4_ = fStack_7c8;
          auVar321._28_4_ = fStack_7c4;
          if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar244 >> 0x7f,0) != '\0') ||
                (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar198 >> 0x3f,0) != '\0') ||
              (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar198[0xf] < '\0') {
            auVar206._0_4_ = auVar162._0_4_ * fVar228;
            auVar206._4_4_ = auVar162._4_4_ * fVar250;
            auVar206._8_4_ = auVar162._8_4_ * fVar212;
            auVar206._12_4_ = auVar162._12_4_ * fVar152;
            auVar206._16_4_ = auVar162._16_4_ * fVar153;
            auVar206._20_4_ = auVar162._20_4_ * fVar154;
            auVar206._24_4_ = auVar162._24_4_ * fVar248;
            auVar206._28_4_ = 0;
            auVar66._4_4_ = auVar221._4_4_ * fVar250;
            auVar66._0_4_ = auVar221._0_4_ * fVar228;
            auVar66._8_4_ = auVar221._8_4_ * fVar212;
            auVar66._12_4_ = auVar221._12_4_ * fVar152;
            auVar66._16_4_ = auVar221._16_4_ * fVar153;
            auVar66._20_4_ = auVar221._20_4_ * fVar154;
            auVar66._24_4_ = auVar221._24_4_ * fVar248;
            auVar66._28_4_ = fVar251;
            auVar231._8_4_ = 0x3f800000;
            auVar231._0_8_ = 0x3f8000003f800000;
            auVar231._12_4_ = 0x3f800000;
            auVar231._16_4_ = 0x3f800000;
            auVar231._20_4_ = 0x3f800000;
            auVar231._24_4_ = 0x3f800000;
            auVar231._28_4_ = 0x3f800000;
            auVar166 = vsubps_avx(auVar231,auVar206);
            local_500 = vblendvps_avx(auVar166,auVar206,auVar202);
            auVar166 = vsubps_avx(auVar231,auVar66);
            _local_3a0 = vblendvps_avx(auVar166,auVar66,auVar202);
            auVar167 = ZEXT3264(_local_3a0);
            auVar147 = ZEXT3264(auVar244);
            local_520 = auVar65;
          }
        }
        auVar207 = ZEXT1664(auVar331);
        auVar317 = ZEXT3264(local_740);
        auVar166 = auVar147._0_32_;
        if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar166 >> 0x7f,0) != '\0') ||
              (auVar147 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar166 >> 0xbf,0) != '\0') ||
            (auVar147 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar147[0x1f] < '\0') {
          auVar20 = vsubps_avx(local_480,auVar321);
          fVar195 = auVar321._0_4_ + local_500._0_4_ * auVar20._0_4_;
          fVar215 = auVar321._4_4_ + local_500._4_4_ * auVar20._4_4_;
          fVar228 = auVar321._8_4_ + local_500._8_4_ * auVar20._8_4_;
          fVar250 = auVar321._12_4_ + local_500._12_4_ * auVar20._12_4_;
          fVar212 = auVar321._16_4_ + local_500._16_4_ * auVar20._16_4_;
          fVar150 = auVar321._20_4_ + local_500._20_4_ * auVar20._20_4_;
          fVar151 = auVar321._24_4_ + local_500._24_4_ * auVar20._24_4_;
          fVar152 = auVar321._28_4_ + auVar20._28_4_;
          fVar135 = local_768->depth_scale;
          auVar167 = ZEXT3264(CONCAT428(fVar135,CONCAT424(fVar135,CONCAT420(fVar135,CONCAT416(
                                                  fVar135,CONCAT412(fVar135,CONCAT48(fVar135,
                                                  CONCAT44(fVar135,fVar135))))))));
          auVar67._4_4_ = (fVar215 + fVar215) * fVar135;
          auVar67._0_4_ = (fVar195 + fVar195) * fVar135;
          auVar67._8_4_ = (fVar228 + fVar228) * fVar135;
          auVar67._12_4_ = (fVar250 + fVar250) * fVar135;
          auVar67._16_4_ = (fVar212 + fVar212) * fVar135;
          auVar67._20_4_ = (fVar150 + fVar150) * fVar135;
          auVar67._24_4_ = (fVar151 + fVar151) * fVar135;
          auVar67._28_4_ = fVar152 + fVar152;
          auVar20 = vcmpps_avx(local_520,auVar67,6);
          auVar31 = auVar166 & auVar20;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            local_200 = vandps_avx(auVar20,auVar166);
            local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            fStack_398 = fStack_398 + fStack_398 + -1.0;
            fStack_394 = fStack_394 + fStack_394 + -1.0;
            fStack_390 = fStack_390 + fStack_390 + -1.0;
            fStack_38c = fStack_38c + fStack_38c + -1.0;
            fStack_388 = fStack_388 + fStack_388 + -1.0;
            fStack_384 = fStack_384 + fStack_384 + -1.0;
            local_2c0 = local_500;
            local_2a0._4_4_ = local_3a0._4_4_;
            local_2a0._0_4_ = local_3a0._0_4_;
            fStack_298 = fStack_398;
            fStack_294 = fStack_394;
            fStack_290 = fStack_390;
            fStack_28c = fStack_38c;
            fStack_288 = fStack_388;
            fStack_284 = fStack_384;
            local_280 = local_520;
            local_260 = 0;
            local_25c = uVar126;
            local_250 = local_670;
            uStack_248 = uStack_668;
            local_240 = local_590;
            uStack_238 = uStack_588;
            local_230 = local_5a0;
            uStack_228 = uStack_598;
            auVar167 = ZEXT1664(_local_5b0);
            local_220 = _local_5b0;
            if ((pGVar130->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar131 = true, _local_670 = auVar24, _local_5a0 = auVar23, _local_590 = auVar25,
                 pGVar130->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar187._0_4_ = 1.0 / (float)(int)uVar126;
                auVar187._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar331 = vshufps_avx(auVar187,auVar187,0);
                local_1e0[0] = auVar331._0_4_ * (local_500._0_4_ + 0.0);
                local_1e0[1] = auVar331._4_4_ * (local_500._4_4_ + 1.0);
                local_1e0[2] = auVar331._8_4_ * (local_500._8_4_ + 2.0);
                local_1e0[3] = auVar331._12_4_ * (local_500._12_4_ + 3.0);
                fStack_1d0 = auVar331._0_4_ * (local_500._16_4_ + 4.0);
                fStack_1cc = auVar331._4_4_ * (local_500._20_4_ + 5.0);
                fStack_1c8 = auVar331._8_4_ * (local_500._24_4_ + 6.0);
                fStack_1c4 = local_500._28_4_ + 7.0;
                auVar167 = ZEXT3264(_local_3a0);
                local_1c0 = _local_3a0;
                local_1a0 = local_520;
                uStack_7dc = (undefined4)((ulong)context->args >> 0x20);
                local_7e0 = vmovmskps_avx(local_200);
                uVar124 = CONCAT44(uStack_7dc,local_7e0);
                uVar127 = 0;
                if (uVar124 != 0) {
                  for (; (uVar124 >> uVar127 & 1) == 0; uVar127 = uVar127 + 1) {
                  }
                }
                if (local_7e0 == 0) {
                  bVar131 = false;
                  _local_670 = auVar24;
                  _local_5a0 = auVar23;
                  _local_590 = auVar25;
                }
                else {
                  local_7c0._0_4_ = ray->tfar;
                  _local_670 = auVar24;
                  _local_5a0 = auVar23;
                  _local_590 = auVar25;
                  _local_340 = auVar32;
                  _local_320 = auVar26;
                  do {
                    local_654 = local_1e0[uVar127];
                    local_650 = *(uint *)(local_1c0 + uVar127 * 4);
                    auVar167 = ZEXT464(local_650);
                    ray->tfar = *(float *)(local_1a0 + uVar127 * 4);
                    fVar168 = 1.0 - local_654;
                    fVar135 = local_654 * 3.0;
                    auVar331 = ZEXT416((uint)((fVar168 * -2.0 * local_654 + local_654 * local_654) *
                                             0.5));
                    auVar331 = vshufps_avx(auVar331,auVar331,0);
                    auVar198 = ZEXT416((uint)(((fVar168 + fVar168) * (fVar135 + 2.0) +
                                              fVar168 * fVar168 * -3.0) * 0.5));
                    auVar198 = vshufps_avx(auVar198,auVar198,0);
                    auVar199 = ZEXT416((uint)(((local_654 + local_654) * (fVar135 + -5.0) +
                                              local_654 * fVar135) * 0.5));
                    auVar199 = vshufps_avx(auVar199,auVar199,0);
                    auVar200 = ZEXT416((uint)((local_654 * (fVar168 + fVar168) - fVar168 * fVar168)
                                             * 0.5));
                    auVar200 = vshufps_avx(auVar200,auVar200,0);
                    auVar188._0_4_ =
                         auVar200._0_4_ * (float)local_670._0_4_ +
                         auVar199._0_4_ * (float)local_590._0_4_ +
                         auVar331._0_4_ * (float)local_5b0._0_4_ +
                         auVar198._0_4_ * (float)local_5a0._0_4_;
                    auVar188._4_4_ =
                         auVar200._4_4_ * (float)local_670._4_4_ +
                         auVar199._4_4_ * (float)local_590._4_4_ +
                         auVar331._4_4_ * (float)local_5b0._4_4_ +
                         auVar198._4_4_ * (float)local_5a0._4_4_;
                    auVar188._8_4_ =
                         auVar200._8_4_ * (float)uStack_668 +
                         auVar199._8_4_ * (float)uStack_588 +
                         auVar331._8_4_ * fStack_5a8 + auVar198._8_4_ * (float)uStack_598;
                    auVar188._12_4_ =
                         auVar200._12_4_ * uStack_668._4_4_ +
                         auVar199._12_4_ * uStack_588._4_4_ +
                         auVar331._12_4_ * fStack_5a4 + auVar198._12_4_ * uStack_598._4_4_;
                    local_6d0.context = context->user;
                    local_660 = vmovlps_avx(auVar188);
                    local_658 = vextractps_avx(auVar188,2);
                    local_64c = (int)local_628;
                    local_648 = (int)local_770;
                    local_644 = (local_6d0.context)->instID[0];
                    local_640 = (local_6d0.context)->instPrimID[0];
                    local_7e4 = -1;
                    local_6d0.valid = &local_7e4;
                    local_6d0.geometryUserPtr = pGVar130->userPtr;
                    local_6d0.ray = (RTCRayN *)ray;
                    local_6d0.hit = (RTCHitN *)&local_660;
                    local_6d0.N = 1;
                    if (pGVar130->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fa5ebd:
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar130->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var17)(&local_6d0);
                        auVar167._8_56_ = extraout_var_02;
                        auVar167._0_8_ = extraout_XMM1_Qa_00;
                        if (*local_6d0.valid == 0) goto LAB_00fa5f00;
                      }
                      bVar131 = true;
                      auVar317 = ZEXT3264(local_740);
                      auVar207 = ZEXT1664(local_7a0._0_16_);
                      fVar168 = (float)local_760._0_4_;
                      fVar208 = (float)local_760._4_4_;
                      fVar224 = fStack_758;
                      fVar233 = fStack_754;
                      fVar170 = fStack_750;
                      fVar172 = fStack_74c;
                      fVar209 = fStack_748;
                      fVar210 = fStack_744;
                      fVar269 = (float)local_700._0_4_;
                      fVar274 = (float)local_700._4_4_;
                      fVar275 = fStack_6f8;
                      fVar276 = fStack_6f4;
                      fVar225 = fStack_6f0;
                      fVar226 = fStack_6ec;
                      fVar234 = fStack_6e8;
                      fVar301 = (float)local_720._0_4_;
                      fVar303 = (float)local_720._4_4_;
                      fVar304 = fStack_718;
                      fVar305 = fStack_714;
                      fVar235 = fStack_710;
                      fVar329 = fStack_70c;
                      fVar330 = fStack_708;
                      break;
                    }
                    (*pGVar130->occlusionFilterN)(&local_6d0);
                    auVar167._8_56_ = extraout_var_01;
                    auVar167._0_8_ = extraout_XMM1_Qa;
                    if (*local_6d0.valid != 0) goto LAB_00fa5ebd;
LAB_00fa5f00:
                    ray->tfar = (float)local_7c0._0_4_;
                    uVar124 = CONCAT44(uStack_7dc,local_7e0) ^ 1L << (uVar127 & 0x3f);
                    uVar127 = 0;
                    if (uVar124 != 0) {
                      for (; (uVar124 >> uVar127 & 1) == 0; uVar127 = uVar127 + 1) {
                      }
                    }
                    bVar131 = false;
                    local_7e0 = (uint)uVar124;
                    uStack_7dc = (undefined4)(uVar124 >> 0x20);
                    auVar317 = ZEXT3264(local_740);
                    auVar207 = ZEXT1664(local_7a0._0_16_);
                    fVar168 = (float)local_760._0_4_;
                    fVar208 = (float)local_760._4_4_;
                    fVar224 = fStack_758;
                    fVar233 = fStack_754;
                    fVar170 = fStack_750;
                    fVar172 = fStack_74c;
                    fVar209 = fStack_748;
                    fVar210 = fStack_744;
                    fVar269 = (float)local_700._0_4_;
                    fVar274 = (float)local_700._4_4_;
                    fVar275 = fStack_6f8;
                    fVar276 = fStack_6f4;
                    fVar225 = fStack_6f0;
                    fVar226 = fStack_6ec;
                    fVar234 = fStack_6e8;
                    fVar301 = (float)local_720._0_4_;
                    fVar303 = (float)local_720._4_4_;
                    fVar304 = fStack_718;
                    fVar305 = fStack_714;
                    fVar235 = fStack_710;
                    fVar329 = fStack_70c;
                    fVar330 = fStack_708;
                  } while (uVar124 != 0);
                }
              }
              goto LAB_00fa5b5f;
            }
          }
        }
        bVar131 = false;
        _local_670 = auVar24;
        _local_5a0 = auVar23;
        _local_590 = auVar25;
      }
LAB_00fa5b5f:
      if (8 < (int)uVar126) {
        _local_320 = vpshufd_avx(ZEXT416(uVar126),0);
        auVar331 = vshufps_avx(auVar207._0_16_,auVar207._0_16_,0);
        register0x00001210 = auVar331;
        _local_360 = auVar331;
        auVar112._4_4_ = fStack_49c;
        auVar112._0_4_ = local_4a0;
        auVar112._8_4_ = fStack_498;
        auVar112._12_4_ = aStack_494.a;
        auVar331 = vpermilps_avx(auVar112,0xff);
        local_380._16_16_ = auVar331;
        local_380._0_16_ = auVar331;
        auVar140._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar140._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar331 = vshufps_avx(auVar140,auVar140,0);
        _fStack_3d0 = auVar331;
        _local_3e0 = auVar331;
        auVar147 = ZEXT3264(_local_3e0);
        lVar128 = 8;
        do {
          pfVar1 = (float *)(catmullrom_basis0 + lVar128 * 4 + lVar18);
          fVar215 = *pfVar1;
          fVar228 = pfVar1[1];
          fVar250 = pfVar1[2];
          fVar212 = pfVar1[3];
          fStack_490 = pfVar1[4];
          fStack_48c = pfVar1[5];
          fStack_488 = pfVar1[6];
          pauVar11 = (undefined1 (*) [28])(lVar18 + 0x21b37f0 + lVar128 * 4);
          fVar135 = *(float *)*pauVar11;
          fVar195 = *(float *)(*pauVar11 + 4);
          fVar150 = *(float *)(*pauVar11 + 8);
          fVar151 = *(float *)(*pauVar11 + 0xc);
          fVar152 = *(float *)(*pauVar11 + 0x10);
          fVar153 = *(float *)(*pauVar11 + 0x14);
          fVar154 = *(float *)(*pauVar11 + 0x18);
          auVar117 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar18 + 0x21b3c74 + lVar128 * 4);
          fVar237 = *(float *)*pauVar11;
          fVar246 = *(float *)(*pauVar11 + 4);
          fVar248 = *(float *)(*pauVar11 + 8);
          fVar251 = *(float *)(*pauVar11 + 0xc);
          fVar253 = *(float *)(*pauVar11 + 0x10);
          fVar255 = *(float *)(*pauVar11 + 0x14);
          fVar257 = *(float *)(*pauVar11 + 0x18);
          auVar115 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar18 + 0x21b40f8 + lVar128 * 4);
          fVar277 = *(float *)*pauVar11;
          fVar285 = *(float *)(*pauVar11 + 4);
          fVar287 = *(float *)(*pauVar11 + 8);
          fVar289 = *(float *)(*pauVar11 + 0xc);
          fVar291 = *(float *)(*pauVar11 + 0x10);
          fVar193 = *(float *)(*pauVar11 + 0x14);
          fVar294 = *(float *)(*pauVar11 + 0x18);
          auVar114 = *pauVar11;
          fVar181 = auVar317._0_4_;
          fVar173 = auVar317._4_4_;
          fVar268 = auVar317._8_4_;
          fVar175 = auVar317._12_4_;
          fVar177 = auVar317._16_4_;
          fVar179 = auVar317._20_4_;
          fVar211 = auVar317._24_4_;
          fVar214 = auVar207._28_4_;
          fVar194 = fVar214 + *(float *)pauVar11[1];
          fStack_7c4 = fVar214 + fVar214 + auVar147._28_4_;
          auVar282._0_4_ =
               (float)local_e0._0_4_ * fVar215 +
               (float)local_420._0_4_ * fVar135 +
               fVar181 * fVar237 + (float)local_400._0_4_ * fVar277;
          auVar282._4_4_ =
               (float)local_e0._4_4_ * fVar228 +
               (float)local_420._4_4_ * fVar195 +
               fVar173 * fVar246 + (float)local_400._4_4_ * fVar285;
          auVar282._8_4_ =
               fStack_d8 * fVar250 + fStack_418 * fVar150 + fVar268 * fVar248 + fStack_3f8 * fVar287
          ;
          auVar282._12_4_ =
               fStack_d4 * fVar212 + fStack_414 * fVar151 + fVar175 * fVar251 + fStack_3f4 * fVar289
          ;
          auVar282._16_4_ =
               fStack_d0 * fStack_490 +
               fStack_410 * fVar152 + fVar177 * fVar253 + fStack_3f0 * fVar291;
          auVar282._20_4_ =
               fStack_cc * fStack_48c +
               fStack_40c * fVar153 + fVar179 * fVar255 + fStack_3ec * fVar193;
          auVar282._24_4_ =
               fStack_c8 * fStack_488 +
               fStack_408 * fVar154 + fVar211 * fVar257 + fStack_3e8 * fVar294;
          auVar282._28_4_ = fVar194 + fStack_7c4;
          local_7a0._0_4_ =
               (float)local_a0._0_4_ * fVar215 +
               fVar301 * fVar135 + fVar269 * fVar237 + fVar168 * fVar277;
          local_7a0._4_4_ =
               (float)local_a0._4_4_ * fVar228 +
               fVar303 * fVar195 + fVar274 * fVar246 + fVar208 * fVar285;
          local_7a0._8_4_ =
               fStack_98 * fVar250 + fVar304 * fVar150 + fVar275 * fVar248 + fVar224 * fVar287;
          local_7a0._12_4_ =
               fStack_94 * fVar212 + fVar305 * fVar151 + fVar276 * fVar251 + fVar233 * fVar289;
          local_7a0._16_4_ =
               fStack_90 * fStack_490 + fVar235 * fVar152 + fVar225 * fVar253 + fVar170 * fVar291;
          local_7a0._20_4_ =
               fStack_8c * fStack_48c + fVar329 * fVar153 + fVar226 * fVar255 + fVar172 * fVar193;
          local_7a0._24_4_ =
               fStack_88 * fStack_488 + fVar330 * fVar154 + fVar234 * fVar257 + fVar209 * fVar294;
          local_7a0._28_4_ = fStack_7c4 + fVar214 + fVar214 + auVar167._28_4_;
          auVar207 = ZEXT3264(local_7a0._0_32_);
          fStack_484 = pfVar1[7];
          fVar134 = fVar215 * (float)local_140._0_4_ +
                    fVar135 * (float)local_120._0_4_ +
                    (float)local_80._0_4_ * fVar237 + fVar277 * (float)local_100._0_4_;
          fVar149 = fVar228 * (float)local_140._4_4_ +
                    fVar195 * (float)local_120._4_4_ +
                    (float)local_80._4_4_ * fVar246 + fVar285 * (float)local_100._4_4_;
          fStack_7d8 = fVar250 * fStack_138 +
                       fVar150 * fStack_118 + fStack_78 * fVar248 + fVar287 * fStack_f8;
          fStack_7d4 = fVar212 * fStack_134 +
                       fVar151 * fStack_114 + fStack_74 * fVar251 + fVar289 * fStack_f4;
          fStack_7d0 = fStack_490 * fStack_130 +
                       fVar152 * fStack_110 + fStack_70 * fVar253 + fVar291 * fStack_f0;
          fStack_7cc = fStack_48c * fStack_12c +
                       fVar153 * fStack_10c + fStack_6c * fVar255 + fVar193 * fStack_ec;
          fStack_7c8 = fStack_488 * fStack_128 +
                       fVar154 * fStack_108 + fStack_68 * fVar257 + fVar294 * fStack_e8;
          fStack_7c4 = fStack_7c4 + fVar214 + fVar194;
          pauVar11 = (undefined1 (*) [28])(catmullrom_basis1 + lVar128 * 4 + lVar18);
          fVar135 = *(float *)*pauVar11;
          fVar195 = *(float *)(*pauVar11 + 4);
          fVar150 = *(float *)(*pauVar11 + 8);
          fVar151 = *(float *)(*pauVar11 + 0xc);
          fVar152 = *(float *)(*pauVar11 + 0x10);
          fVar153 = *(float *)(*pauVar11 + 0x14);
          fVar154 = *(float *)(*pauVar11 + 0x18);
          auVar121 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar18 + 0x21b5c10 + lVar128 * 4);
          fVar237 = *(float *)*pauVar11;
          fVar246 = *(float *)(*pauVar11 + 4);
          fVar248 = *(float *)(*pauVar11 + 8);
          fVar251 = *(float *)(*pauVar11 + 0xc);
          fVar253 = *(float *)(*pauVar11 + 0x10);
          fVar255 = *(float *)(*pauVar11 + 0x14);
          fVar257 = *(float *)(*pauVar11 + 0x18);
          auVar120 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar18 + 0x21b6094 + lVar128 * 4);
          fVar277 = *(float *)*pauVar11;
          fVar285 = *(float *)(*pauVar11 + 4);
          fVar287 = *(float *)(*pauVar11 + 8);
          fVar289 = *(float *)(*pauVar11 + 0xc);
          fVar291 = *(float *)(*pauVar11 + 0x10);
          fVar193 = *(float *)(*pauVar11 + 0x14);
          fVar294 = *(float *)(*pauVar11 + 0x18);
          auVar119 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar18 + 0x21b6518 + lVar128 * 4);
          fVar194 = *(float *)*pauVar11;
          fVar214 = *(float *)(*pauVar11 + 4);
          fVar213 = *(float *)(*pauVar11 + 8);
          fVar296 = *(float *)(*pauVar11 + 0xc);
          fVar133 = *(float *)(*pauVar11 + 0x10);
          fVar132 = *(float *)(*pauVar11 + 0x14);
          fVar148 = *(float *)(*pauVar11 + 0x18);
          auVar118 = *pauVar11;
          fVar259 = fVar210 + *(float *)pauVar11[1];
          fVar227 = fVar210 + fVar210 + fStack_3e4;
          fVar236 = fVar210 + fVar210 + pfVar1[7];
          auVar326._0_4_ =
               (float)local_e0._0_4_ * fVar135 +
               (float)local_420._0_4_ * fVar237 +
               fVar181 * fVar277 + (float)local_400._0_4_ * fVar194;
          auVar326._4_4_ =
               (float)local_e0._4_4_ * fVar195 +
               (float)local_420._4_4_ * fVar246 +
               fVar173 * fVar285 + (float)local_400._4_4_ * fVar214;
          auVar326._8_4_ =
               fStack_d8 * fVar150 + fStack_418 * fVar248 + fVar268 * fVar287 + fStack_3f8 * fVar213
          ;
          auVar326._12_4_ =
               fStack_d4 * fVar151 + fStack_414 * fVar251 + fVar175 * fVar289 + fStack_3f4 * fVar296
          ;
          auVar326._16_4_ =
               fStack_d0 * fVar152 + fStack_410 * fVar253 + fVar177 * fVar291 + fStack_3f0 * fVar133
          ;
          auVar326._20_4_ =
               fStack_cc * fVar153 + fStack_40c * fVar255 + fVar179 * fVar193 + fStack_3ec * fVar132
          ;
          auVar326._24_4_ =
               fStack_c8 * fVar154 + fStack_408 * fVar257 + fVar211 * fVar294 + fStack_3e8 * fVar148
          ;
          auVar326._28_4_ = fVar259 + fVar227;
          auVar191._0_4_ =
               fVar135 * (float)local_a0._0_4_ +
               fVar301 * fVar237 + fVar269 * fVar277 + fVar168 * fVar194;
          auVar191._4_4_ =
               fVar195 * (float)local_a0._4_4_ +
               fVar303 * fVar246 + fVar274 * fVar285 + fVar208 * fVar214;
          auVar191._8_4_ =
               fVar150 * fStack_98 + fVar304 * fVar248 + fVar275 * fVar287 + fVar224 * fVar213;
          auVar191._12_4_ =
               fVar151 * fStack_94 + fVar305 * fVar251 + fVar276 * fVar289 + fVar233 * fVar296;
          auVar191._16_4_ =
               fVar152 * fStack_90 + fVar235 * fVar253 + fVar225 * fVar291 + fVar170 * fVar133;
          auVar191._20_4_ =
               fVar153 * fStack_8c + fVar329 * fVar255 + fVar226 * fVar193 + fVar172 * fVar132;
          auVar191._24_4_ =
               fVar154 * fStack_88 + fVar330 * fVar257 + fVar234 * fVar294 + fVar209 * fVar148;
          auVar191._28_4_ = fVar227 + fVar236;
          auVar314._0_4_ =
               fVar237 * (float)local_120._0_4_ +
               (float)local_80._0_4_ * fVar277 + fVar194 * (float)local_100._0_4_ +
               fVar135 * (float)local_140._0_4_;
          auVar314._4_4_ =
               fVar246 * (float)local_120._4_4_ +
               (float)local_80._4_4_ * fVar285 + fVar214 * (float)local_100._4_4_ +
               fVar195 * (float)local_140._4_4_;
          auVar314._8_4_ =
               fVar248 * fStack_118 + fStack_78 * fVar287 + fVar213 * fStack_f8 +
               fVar150 * fStack_138;
          auVar314._12_4_ =
               fVar251 * fStack_114 + fStack_74 * fVar289 + fVar296 * fStack_f4 +
               fVar151 * fStack_134;
          auVar314._16_4_ =
               fVar253 * fStack_110 + fStack_70 * fVar291 + fVar133 * fStack_f0 +
               fVar152 * fStack_130;
          auVar314._20_4_ =
               fVar255 * fStack_10c + fStack_6c * fVar193 + fVar132 * fStack_ec +
               fVar153 * fStack_12c;
          auVar314._24_4_ =
               fVar257 * fStack_108 + fStack_68 * fVar294 + fVar148 * fStack_e8 +
               fVar154 * fStack_128;
          auVar314._28_4_ = fVar210 + fVar259 + fVar227;
          auVar20 = vsubps_avx(auVar326,auVar282);
          _local_340 = vsubps_avx(auVar191,local_7a0._0_32_);
          fVar210 = auVar20._0_4_;
          fVar224 = auVar20._4_4_;
          auVar32._4_4_ = fVar224 * local_7a0._4_4_;
          auVar32._0_4_ = fVar210 * local_7a0._0_4_;
          fVar225 = auVar20._8_4_;
          auVar32._8_4_ = fVar225 * local_7a0._8_4_;
          fVar226 = auVar20._12_4_;
          auVar32._12_4_ = fVar226 * local_7a0._12_4_;
          fVar233 = auVar20._16_4_;
          auVar32._16_4_ = fVar233 * local_7a0._16_4_;
          fVar234 = auVar20._20_4_;
          auVar32._20_4_ = fVar234 * local_7a0._20_4_;
          fVar235 = auVar20._24_4_;
          auVar32._24_4_ = fVar235 * local_7a0._24_4_;
          auVar32._28_4_ = fVar227;
          fVar135 = local_340._0_4_;
          fVar168 = local_340._4_4_;
          auVar68._4_4_ = auVar282._4_4_ * fVar168;
          auVar68._0_4_ = auVar282._0_4_ * fVar135;
          fVar170 = local_340._8_4_;
          auVar68._8_4_ = auVar282._8_4_ * fVar170;
          fVar172 = local_340._12_4_;
          auVar68._12_4_ = auVar282._12_4_ * fVar172;
          fVar195 = local_340._16_4_;
          auVar68._16_4_ = auVar282._16_4_ * fVar195;
          fVar208 = local_340._20_4_;
          auVar68._20_4_ = auVar282._20_4_ * fVar208;
          fVar209 = local_340._24_4_;
          auVar68._24_4_ = auVar282._24_4_ * fVar209;
          auVar68._28_4_ = fVar236;
          auVar31 = vsubps_avx(auVar32,auVar68);
          auVar110._4_4_ = fVar149;
          auVar110._0_4_ = fVar134;
          auVar110._8_4_ = fStack_7d8;
          auVar110._12_4_ = fStack_7d4;
          auVar110._16_4_ = fStack_7d0;
          auVar110._20_4_ = fStack_7cc;
          auVar110._24_4_ = fStack_7c8;
          auVar110._28_4_ = fStack_7c4;
          auVar147 = ZEXT3264(auVar110);
          auVar166 = vmaxps_avx(auVar110,auVar314);
          auVar69._4_4_ = auVar166._4_4_ * auVar166._4_4_ * (fVar224 * fVar224 + fVar168 * fVar168);
          auVar69._0_4_ = auVar166._0_4_ * auVar166._0_4_ * (fVar210 * fVar210 + fVar135 * fVar135);
          auVar69._8_4_ = auVar166._8_4_ * auVar166._8_4_ * (fVar225 * fVar225 + fVar170 * fVar170);
          auVar69._12_4_ =
               auVar166._12_4_ * auVar166._12_4_ * (fVar226 * fVar226 + fVar172 * fVar172);
          auVar69._16_4_ =
               auVar166._16_4_ * auVar166._16_4_ * (fVar233 * fVar233 + fVar195 * fVar195);
          auVar69._20_4_ =
               auVar166._20_4_ * auVar166._20_4_ * (fVar234 * fVar234 + fVar208 * fVar208);
          auVar69._24_4_ =
               auVar166._24_4_ * auVar166._24_4_ * (fVar235 * fVar235 + fVar209 * fVar209);
          auVar69._28_4_ = fVar259 + fVar236;
          auVar70._4_4_ = auVar31._4_4_ * auVar31._4_4_;
          auVar70._0_4_ = auVar31._0_4_ * auVar31._0_4_;
          auVar70._8_4_ = auVar31._8_4_ * auVar31._8_4_;
          auVar70._12_4_ = auVar31._12_4_ * auVar31._12_4_;
          auVar70._16_4_ = auVar31._16_4_ * auVar31._16_4_;
          auVar70._20_4_ = auVar31._20_4_ * auVar31._20_4_;
          auVar70._24_4_ = auVar31._24_4_ * auVar31._24_4_;
          auVar70._28_4_ = auVar31._28_4_;
          auVar166 = vcmpps_avx(auVar70,auVar69,2);
          auVar167 = ZEXT3264(auVar166);
          local_260 = (uint)lVar128;
          auVar198 = vpshufd_avx(ZEXT416(local_260),0);
          auVar331 = vpor_avx(auVar198,_DAT_01f7fcf0);
          auVar198 = vpor_avx(auVar198,_DAT_01fafea0);
          auVar331 = vpcmpgtd_avx(_local_320,auVar331);
          auVar198 = vpcmpgtd_avx(_local_320,auVar198);
          auVar192._16_16_ = auVar198;
          auVar192._0_16_ = auVar331;
          auVar31 = auVar192 & auVar166;
          fVar168 = (float)local_760._0_4_;
          fVar208 = (float)local_760._4_4_;
          fVar224 = fStack_758;
          fVar233 = fStack_754;
          fVar170 = fStack_750;
          fVar172 = fStack_74c;
          fVar209 = fStack_748;
          fVar210 = fStack_744;
          fVar269 = (float)local_700._0_4_;
          fVar274 = (float)local_700._4_4_;
          fVar275 = fStack_6f8;
          fVar276 = fStack_6f4;
          fVar225 = fStack_6f0;
          fVar226 = fStack_6ec;
          fVar234 = fStack_6e8;
          fVar301 = (float)local_720._0_4_;
          fVar303 = (float)local_720._4_4_;
          fVar304 = fStack_718;
          fVar305 = fStack_714;
          fVar235 = fStack_710;
          fVar329 = fStack_70c;
          fVar330 = fStack_708;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar31 >> 0x7f,0) == '\0') &&
                (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar31 >> 0xbf,0) == '\0') &&
              (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar31[0x1f]) {
            auVar317 = ZEXT3264(auVar317._0_32_);
          }
          else {
            local_580._0_4_ = auVar121._0_4_;
            local_580._4_4_ = auVar121._4_4_;
            fStack_578 = auVar121._8_4_;
            fStack_574 = auVar121._12_4_;
            fStack_570 = auVar121._16_4_;
            fStack_56c = auVar121._20_4_;
            fStack_568 = auVar121._24_4_;
            fVar237 = (float)local_6a0._0_4_ * (float)local_580._0_4_;
            fVar246 = (float)local_6a0._4_4_ * (float)local_580._4_4_;
            fVar248 = fStack_698 * fStack_578;
            fVar251 = fStack_694 * fStack_574;
            fVar253 = fStack_690 * fStack_570;
            fVar255 = fStack_68c * fStack_56c;
            fVar257 = fStack_688 * fStack_568;
            local_600._0_4_ = auVar120._0_4_;
            local_600._4_4_ = auVar120._4_4_;
            fStack_5f8 = auVar120._8_4_;
            fStack_5f4 = auVar120._12_4_;
            fStack_5f0 = auVar120._16_4_;
            fStack_5ec = auVar120._20_4_;
            fStack_5e8 = auVar120._24_4_;
            fVar277 = (float)local_300._0_4_ * (float)local_600._0_4_;
            fVar285 = (float)local_300._4_4_ * (float)local_600._4_4_;
            fVar287 = fStack_2f8 * fStack_5f8;
            fVar289 = fStack_2f4 * fStack_5f4;
            fVar291 = fStack_2f0 * fStack_5f0;
            fVar193 = fStack_2ec * fStack_5ec;
            fVar294 = fStack_2e8 * fStack_5e8;
            _local_600 = auVar192;
            local_560._0_4_ = auVar119._0_4_;
            local_560._4_4_ = auVar119._4_4_;
            fStack_558 = auVar119._8_4_;
            fStack_554 = auVar119._12_4_;
            fStack_550 = auVar119._16_4_;
            fStack_54c = auVar119._20_4_;
            fStack_548 = auVar119._24_4_;
            fVar135 = (float)local_c0._0_4_ * (float)local_560._0_4_;
            fVar195 = (float)local_c0._4_4_ * (float)local_560._4_4_;
            fVar150 = fStack_b8 * fStack_558;
            fVar151 = fStack_b4 * fStack_554;
            fVar152 = fStack_b0 * fStack_550;
            fVar153 = fStack_ac * fStack_54c;
            fVar154 = fStack_a8 * fStack_548;
            _local_580 = auVar314;
            _local_560 = auVar166;
            local_460._0_4_ = auVar118._0_4_;
            local_460._4_4_ = auVar118._4_4_;
            fStack_458 = auVar118._8_4_;
            fStack_454 = auVar118._12_4_;
            fStack_450 = auVar118._16_4_;
            fStack_44c = auVar118._20_4_;
            fStack_448 = auVar118._24_4_;
            local_460._0_4_ =
                 fVar237 + fVar277 + fVar135 + (float)local_620._0_4_ * (float)local_460._0_4_;
            local_460._4_4_ =
                 fVar246 + fVar285 + fVar195 + (float)local_620._4_4_ * (float)local_460._4_4_;
            fStack_458 = fVar248 + fVar287 + fVar150 + fStack_618 * fStack_458;
            fStack_454 = fVar251 + fVar289 + fVar151 + fStack_614 * fStack_454;
            fStack_450 = fVar253 + fVar291 + fVar152 + fStack_610 * fStack_450;
            fStack_44c = fVar255 + fVar193 + fVar153 + fStack_60c * fStack_44c;
            fStack_448 = fVar257 + fVar294 + fVar154 + fStack_608 * fStack_448;
            fStack_444 = auVar282._28_4_ + fStack_684 + auVar166._28_4_ + 0.0;
            local_5e0._0_4_ = auVar117._0_4_;
            local_5e0._4_4_ = auVar117._4_4_;
            fStack_5d8 = auVar117._8_4_;
            fStack_5d4 = auVar117._12_4_;
            fStack_5d0 = auVar117._16_4_;
            fStack_5cc = auVar117._20_4_;
            fStack_5c8 = auVar117._24_4_;
            local_540._0_4_ = auVar115._0_4_;
            local_540._4_4_ = auVar115._4_4_;
            fStack_538 = auVar115._8_4_;
            fStack_534 = auVar115._12_4_;
            fStack_530 = auVar115._16_4_;
            fStack_52c = auVar115._20_4_;
            fStack_528 = auVar115._24_4_;
            fVar259 = (float)local_c0._0_4_ * (float)local_540._0_4_;
            fVar169 = (float)local_c0._4_4_ * (float)local_540._4_4_;
            fVar171 = fStack_b8 * fStack_538;
            fVar174 = fStack_b4 * fStack_534;
            fVar176 = fStack_b0 * fStack_530;
            fVar178 = fStack_ac * fStack_52c;
            fVar180 = fStack_a8 * fStack_528;
            local_440._0_4_ = auVar114._0_4_;
            local_440._4_4_ = auVar114._4_4_;
            fStack_438 = auVar114._8_4_;
            fStack_434 = auVar114._12_4_;
            fStack_430 = auVar114._16_4_;
            fStack_42c = auVar114._20_4_;
            fStack_428 = auVar114._24_4_;
            fVar238 = (float)local_620._0_4_ * (float)local_440._0_4_;
            fVar247 = (float)local_620._4_4_ * (float)local_440._4_4_;
            fVar249 = fStack_618 * fStack_438;
            fVar252 = fStack_614 * fStack_434;
            fVar254 = fStack_610 * fStack_430;
            fVar256 = fStack_60c * fStack_42c;
            fVar258 = fStack_608 * fStack_428;
            pfVar1 = (float *)(lVar18 + 0x21b4e84 + lVar128 * 4);
            fVar135 = *pfVar1;
            fVar150 = pfVar1[1];
            fVar151 = pfVar1[2];
            fVar152 = pfVar1[3];
            fVar153 = pfVar1[4];
            fVar154 = pfVar1[5];
            fVar237 = pfVar1[6];
            pfVar2 = (float *)(lVar18 + 0x21b5308 + lVar128 * 4);
            fVar246 = *pfVar2;
            fVar248 = pfVar2[1];
            fVar251 = pfVar2[2];
            fVar253 = pfVar2[3];
            fVar255 = pfVar2[4];
            fVar257 = pfVar2[5];
            fVar277 = pfVar2[6];
            _local_540 = auVar326;
            fVar195 = auVar317._28_4_;
            pfVar3 = (float *)(lVar18 + 0x21b4a00 + lVar128 * 4);
            fVar285 = *pfVar3;
            fVar287 = pfVar3[1];
            fVar289 = pfVar3[2];
            fVar291 = pfVar3[3];
            fVar193 = pfVar3[4];
            fVar294 = pfVar3[5];
            fVar194 = pfVar3[6];
            fVar236 = pfVar1[7] + pfVar2[7];
            fVar182 = pfVar2[7] + fVar195 + 0.0;
            fVar260 = fVar195 + auVar314._28_4_ + fVar195 + 0.0;
            pfVar1 = (float *)(lVar18 + 0x21b457c + lVar128 * 4);
            fVar214 = *pfVar1;
            fVar213 = pfVar1[1];
            fVar296 = pfVar1[2];
            fVar133 = pfVar1[3];
            fVar132 = pfVar1[4];
            fVar148 = pfVar1[5];
            fVar227 = pfVar1[6];
            local_440._4_4_ =
                 (float)local_e0._4_4_ * fVar213 +
                 fVar287 * (float)local_420._4_4_ +
                 fVar173 * fVar150 + (float)local_400._4_4_ * fVar248;
            local_440._0_4_ =
                 (float)local_e0._0_4_ * fVar214 +
                 fVar285 * (float)local_420._0_4_ +
                 fVar181 * fVar135 + (float)local_400._0_4_ * fVar246;
            fStack_438 = fStack_d8 * fVar296 +
                         fVar289 * fStack_418 + fVar268 * fVar151 + fStack_3f8 * fVar251;
            fStack_434 = fStack_d4 * fVar133 +
                         fVar291 * fStack_414 + fVar175 * fVar152 + fStack_3f4 * fVar253;
            fStack_430 = fStack_d0 * fVar132 +
                         fVar193 * fStack_410 + fVar177 * fVar153 + fStack_3f0 * fVar255;
            fStack_42c = fStack_cc * fVar148 +
                         fVar294 * fStack_40c + fVar179 * fVar154 + fStack_3ec * fVar257;
            fStack_428 = fStack_c8 * fVar227 +
                         fVar194 * fStack_408 + fVar211 * fVar237 + fStack_3e8 * fVar277;
            fStack_424 = fVar236 + fVar182;
            auVar163._0_4_ =
                 (float)local_a0._0_4_ * fVar214 +
                 (float)local_700._0_4_ * fVar135 + (float)local_760._0_4_ * fVar246 +
                 fVar285 * (float)local_720._0_4_;
            auVar163._4_4_ =
                 (float)local_a0._4_4_ * fVar213 +
                 (float)local_700._4_4_ * fVar150 + (float)local_760._4_4_ * fVar248 +
                 fVar287 * (float)local_720._4_4_;
            auVar163._8_4_ =
                 fStack_98 * fVar296 +
                 fStack_6f8 * fVar151 + fStack_758 * fVar251 + fVar289 * fStack_718;
            auVar163._12_4_ =
                 fStack_94 * fVar133 +
                 fStack_6f4 * fVar152 + fStack_754 * fVar253 + fVar291 * fStack_714;
            auVar163._16_4_ =
                 fStack_90 * fVar132 +
                 fStack_6f0 * fVar153 + fStack_750 * fVar255 + fVar193 * fStack_710;
            auVar163._20_4_ =
                 fStack_8c * fVar148 +
                 fStack_6ec * fVar154 + fStack_74c * fVar257 + fVar294 * fStack_70c;
            auVar163._24_4_ =
                 fStack_88 * fVar227 +
                 fStack_6e8 * fVar237 + fStack_748 * fVar277 + fVar194 * fStack_708;
            auVar163._28_4_ = fVar182 + fVar260;
            auVar315._0_4_ =
                 fVar285 * (float)local_300._0_4_ +
                 (float)local_c0._0_4_ * fVar135 + (float)local_620._0_4_ * fVar246 +
                 fVar214 * (float)local_6a0._0_4_;
            auVar315._4_4_ =
                 fVar287 * (float)local_300._4_4_ +
                 (float)local_c0._4_4_ * fVar150 + (float)local_620._4_4_ * fVar248 +
                 fVar213 * (float)local_6a0._4_4_;
            auVar315._8_4_ =
                 fVar289 * fStack_2f8 + fStack_b8 * fVar151 + fStack_618 * fVar251 +
                 fVar296 * fStack_698;
            auVar315._12_4_ =
                 fVar291 * fStack_2f4 + fStack_b4 * fVar152 + fStack_614 * fVar253 +
                 fVar133 * fStack_694;
            auVar315._16_4_ =
                 fVar193 * fStack_2f0 + fStack_b0 * fVar153 + fStack_610 * fVar255 +
                 fVar132 * fStack_690;
            auVar315._20_4_ =
                 fVar294 * fStack_2ec + fStack_ac * fVar154 + fStack_60c * fVar257 +
                 fVar148 * fStack_68c;
            auVar315._24_4_ =
                 fVar194 * fStack_2e8 + fStack_a8 * fVar237 + fStack_608 * fVar277 +
                 fVar227 * fStack_688;
            auVar315._28_4_ = pfVar3[7] + fVar236 + fVar260;
            pfVar1 = (float *)(lVar18 + 0x21b72a4 + lVar128 * 4);
            fVar135 = *pfVar1;
            fVar150 = pfVar1[1];
            fVar151 = pfVar1[2];
            fVar152 = pfVar1[3];
            fVar153 = pfVar1[4];
            fVar154 = pfVar1[5];
            fVar237 = pfVar1[6];
            pfVar2 = (float *)(lVar18 + 0x21b7728 + lVar128 * 4);
            fVar246 = *pfVar2;
            fVar248 = pfVar2[1];
            fVar251 = pfVar2[2];
            fVar253 = pfVar2[3];
            fVar255 = pfVar2[4];
            fVar257 = pfVar2[5];
            fVar277 = pfVar2[6];
            pfVar3 = (float *)(lVar18 + 0x21b6e20 + lVar128 * 4);
            fVar285 = *pfVar3;
            fVar287 = pfVar3[1];
            fVar289 = pfVar3[2];
            fVar291 = pfVar3[3];
            fVar193 = pfVar3[4];
            fVar294 = pfVar3[5];
            fVar194 = pfVar3[6];
            pfVar4 = (float *)(lVar18 + 0x21b699c + lVar128 * 4);
            fVar214 = *pfVar4;
            fVar213 = pfVar4[1];
            fVar296 = pfVar4[2];
            fVar133 = pfVar4[3];
            fVar132 = pfVar4[4];
            fVar148 = pfVar4[5];
            fVar227 = pfVar4[6];
            auVar283._0_4_ =
                 fVar214 * (float)local_e0._0_4_ +
                 fVar285 * (float)local_420._0_4_ +
                 fVar181 * fVar135 + fVar246 * (float)local_400._0_4_;
            auVar283._4_4_ =
                 fVar213 * (float)local_e0._4_4_ +
                 fVar287 * (float)local_420._4_4_ +
                 fVar173 * fVar150 + fVar248 * (float)local_400._4_4_;
            auVar283._8_4_ =
                 fVar296 * fStack_d8 +
                 fVar289 * fStack_418 + fVar268 * fVar151 + fVar251 * fStack_3f8;
            auVar283._12_4_ =
                 fVar133 * fStack_d4 +
                 fVar291 * fStack_414 + fVar175 * fVar152 + fVar253 * fStack_3f4;
            auVar283._16_4_ =
                 fVar132 * fStack_d0 +
                 fVar193 * fStack_410 + fVar177 * fVar153 + fVar255 * fStack_3f0;
            auVar283._20_4_ =
                 fVar148 * fStack_cc +
                 fVar294 * fStack_40c + fVar179 * fVar154 + fVar257 * fStack_3ec;
            auVar283._24_4_ =
                 fVar227 * fStack_c8 +
                 fVar194 * fStack_408 + fVar211 * fVar237 + fVar277 * fStack_3e8;
            auVar283._28_4_ = fStack_744 + fStack_744 + auVar282._28_4_ + fStack_3e4;
            auVar311._0_4_ =
                 (float)local_a0._0_4_ * fVar214 +
                 fVar285 * (float)local_720._0_4_ +
                 (float)local_700._0_4_ * fVar135 + (float)local_760._0_4_ * fVar246;
            auVar311._4_4_ =
                 (float)local_a0._4_4_ * fVar213 +
                 fVar287 * (float)local_720._4_4_ +
                 (float)local_700._4_4_ * fVar150 + (float)local_760._4_4_ * fVar248;
            auVar311._8_4_ =
                 fStack_98 * fVar296 +
                 fVar289 * fStack_718 + fStack_6f8 * fVar151 + fStack_758 * fVar251;
            auVar311._12_4_ =
                 fStack_94 * fVar133 +
                 fVar291 * fStack_714 + fStack_6f4 * fVar152 + fStack_754 * fVar253;
            auVar311._16_4_ =
                 fStack_90 * fVar132 +
                 fVar193 * fStack_710 + fStack_6f0 * fVar153 + fStack_750 * fVar255;
            auVar311._20_4_ =
                 fStack_8c * fVar148 +
                 fVar294 * fStack_70c + fStack_6ec * fVar154 + fStack_74c * fVar257;
            auVar311._24_4_ =
                 fStack_88 * fVar227 +
                 fVar194 * fStack_708 + fStack_6e8 * fVar237 + fStack_748 * fVar277;
            auVar311._28_4_ = fStack_744 + fStack_744 + fStack_c4 + fStack_744;
            auVar232._8_4_ = 0x7fffffff;
            auVar232._0_8_ = 0x7fffffff7fffffff;
            auVar232._12_4_ = 0x7fffffff;
            auVar232._16_4_ = 0x7fffffff;
            auVar232._20_4_ = 0x7fffffff;
            auVar232._24_4_ = 0x7fffffff;
            auVar232._28_4_ = 0x7fffffff;
            auVar31 = vandps_avx(_local_440,auVar232);
            auVar30 = vandps_avx(auVar163,auVar232);
            auVar30 = vmaxps_avx(auVar31,auVar30);
            auVar31 = vandps_avx(auVar315,auVar232);
            auVar30 = vmaxps_avx(auVar30,auVar31);
            auVar30 = vcmpps_avx(auVar30,_local_360,1);
            auVar37 = vblendvps_avx(_local_440,auVar20,auVar30);
            auVar144._0_4_ =
                 fVar214 * (float)local_6a0._0_4_ +
                 fVar285 * (float)local_300._0_4_ +
                 fVar246 * (float)local_620._0_4_ + (float)local_c0._0_4_ * fVar135;
            auVar144._4_4_ =
                 fVar213 * (float)local_6a0._4_4_ +
                 fVar287 * (float)local_300._4_4_ +
                 fVar248 * (float)local_620._4_4_ + (float)local_c0._4_4_ * fVar150;
            auVar144._8_4_ =
                 fVar296 * fStack_698 +
                 fVar289 * fStack_2f8 + fVar251 * fStack_618 + fStack_b8 * fVar151;
            auVar144._12_4_ =
                 fVar133 * fStack_694 +
                 fVar291 * fStack_2f4 + fVar253 * fStack_614 + fStack_b4 * fVar152;
            auVar144._16_4_ =
                 fVar132 * fStack_690 +
                 fVar193 * fStack_2f0 + fVar255 * fStack_610 + fStack_b0 * fVar153;
            auVar144._20_4_ =
                 fVar148 * fStack_68c +
                 fVar294 * fStack_2ec + fVar257 * fStack_60c + fStack_ac * fVar154;
            auVar144._24_4_ =
                 fVar227 * fStack_688 +
                 fVar194 * fStack_2e8 + fVar277 * fStack_608 + fStack_a8 * fVar237;
            auVar144._28_4_ = auVar31._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar19 = vblendvps_avx(auVar163,_local_340,auVar30);
            auVar31 = vandps_avx(auVar283,auVar232);
            auVar30 = vandps_avx(auVar311,auVar232);
            auVar21 = vmaxps_avx(auVar31,auVar30);
            auVar31 = vandps_avx(auVar144,auVar232);
            auVar31 = vmaxps_avx(auVar21,auVar31);
            auVar30 = vcmpps_avx(auVar31,_local_360,1);
            auVar31 = vblendvps_avx(auVar283,auVar20,auVar30);
            auVar145._0_4_ =
                 (float)local_6a0._0_4_ * fVar215 +
                 (float)local_300._0_4_ * (float)local_5e0._0_4_ + fVar259 + fVar238;
            auVar145._4_4_ =
                 (float)local_6a0._4_4_ * fVar228 +
                 (float)local_300._4_4_ * (float)local_5e0._4_4_ + fVar169 + fVar247;
            auVar145._8_4_ = fStack_698 * fVar250 + fStack_2f8 * fStack_5d8 + fVar171 + fVar249;
            auVar145._12_4_ = fStack_694 * fVar212 + fStack_2f4 * fStack_5d4 + fVar174 + fVar252;
            auVar145._16_4_ = fStack_690 * fStack_490 + fStack_2f0 * fStack_5d0 + fVar176 + fVar254;
            auVar145._20_4_ = fStack_68c * fStack_48c + fStack_2ec * fStack_5cc + fVar178 + fVar256;
            auVar145._24_4_ = fStack_688 * fStack_488 + fStack_2e8 * fStack_5c8 + fVar180 + fVar258;
            auVar145._28_4_ = auVar21._28_4_ + fStack_444 + auVar166._28_4_ + 0.0;
            auVar30 = vblendvps_avx(auVar311,_local_340,auVar30);
            fVar181 = auVar37._0_4_;
            fVar173 = auVar37._4_4_;
            fVar268 = auVar37._8_4_;
            fVar175 = auVar37._12_4_;
            fVar177 = auVar37._16_4_;
            fVar179 = auVar37._20_4_;
            fVar211 = auVar37._24_4_;
            fVar169 = auVar37._28_4_;
            fVar251 = auVar31._0_4_;
            fVar255 = auVar31._4_4_;
            fVar277 = auVar31._8_4_;
            fVar287 = auVar31._12_4_;
            fVar291 = auVar31._16_4_;
            fVar294 = auVar31._20_4_;
            fVar214 = auVar31._24_4_;
            fVar135 = auVar19._0_4_;
            fVar215 = auVar19._4_4_;
            fVar250 = auVar19._8_4_;
            fVar150 = auVar19._12_4_;
            fVar152 = auVar19._16_4_;
            fVar154 = auVar19._20_4_;
            fVar246 = auVar19._24_4_;
            auVar299._0_4_ = fVar135 * fVar135 + fVar181 * fVar181;
            auVar299._4_4_ = fVar215 * fVar215 + fVar173 * fVar173;
            auVar299._8_4_ = fVar250 * fVar250 + fVar268 * fVar268;
            auVar299._12_4_ = fVar150 * fVar150 + fVar175 * fVar175;
            auVar299._16_4_ = fVar152 * fVar152 + fVar177 * fVar177;
            auVar299._20_4_ = fVar154 * fVar154 + fVar179 * fVar179;
            auVar299._24_4_ = fVar246 * fVar246 + fVar211 * fVar211;
            auVar299._28_4_ = auVar20._28_4_ + fVar195;
            auVar20 = vrsqrtps_avx(auVar299);
            fVar195 = auVar20._0_4_;
            fVar228 = auVar20._4_4_;
            auVar71._4_4_ = fVar228 * 1.5;
            auVar71._0_4_ = fVar195 * 1.5;
            fVar212 = auVar20._8_4_;
            auVar71._8_4_ = fVar212 * 1.5;
            fVar151 = auVar20._12_4_;
            auVar71._12_4_ = fVar151 * 1.5;
            fVar153 = auVar20._16_4_;
            auVar71._16_4_ = fVar153 * 1.5;
            fVar237 = auVar20._20_4_;
            auVar71._20_4_ = fVar237 * 1.5;
            fVar248 = auVar20._24_4_;
            auVar71._24_4_ = fVar248 * 1.5;
            auVar71._28_4_ = auVar311._28_4_;
            auVar72._4_4_ = fVar228 * fVar228 * fVar228 * auVar299._4_4_ * 0.5;
            auVar72._0_4_ = fVar195 * fVar195 * fVar195 * auVar299._0_4_ * 0.5;
            auVar72._8_4_ = fVar212 * fVar212 * fVar212 * auVar299._8_4_ * 0.5;
            auVar72._12_4_ = fVar151 * fVar151 * fVar151 * auVar299._12_4_ * 0.5;
            auVar72._16_4_ = fVar153 * fVar153 * fVar153 * auVar299._16_4_ * 0.5;
            auVar72._20_4_ = fVar237 * fVar237 * fVar237 * auVar299._20_4_ * 0.5;
            auVar72._24_4_ = fVar248 * fVar248 * fVar248 * auVar299._24_4_ * 0.5;
            auVar72._28_4_ = auVar299._28_4_;
            auVar37 = vsubps_avx(auVar71,auVar72);
            fVar296 = auVar37._0_4_;
            fVar133 = auVar37._4_4_;
            fVar132 = auVar37._8_4_;
            fVar148 = auVar37._12_4_;
            fVar227 = auVar37._16_4_;
            fVar236 = auVar37._20_4_;
            fVar259 = auVar37._24_4_;
            fVar195 = auVar30._0_4_;
            fVar228 = auVar30._4_4_;
            fVar212 = auVar30._8_4_;
            fVar151 = auVar30._12_4_;
            fVar153 = auVar30._16_4_;
            fVar237 = auVar30._20_4_;
            fVar248 = auVar30._24_4_;
            auVar273._0_4_ = fVar195 * fVar195 + fVar251 * fVar251;
            auVar273._4_4_ = fVar228 * fVar228 + fVar255 * fVar255;
            auVar273._8_4_ = fVar212 * fVar212 + fVar277 * fVar277;
            auVar273._12_4_ = fVar151 * fVar151 + fVar287 * fVar287;
            auVar273._16_4_ = fVar153 * fVar153 + fVar291 * fVar291;
            auVar273._20_4_ = fVar237 * fVar237 + fVar294 * fVar294;
            auVar273._24_4_ = fVar248 * fVar248 + fVar214 * fVar214;
            auVar273._28_4_ = auVar20._28_4_ + auVar31._28_4_;
            auVar20 = vrsqrtps_avx(auVar273);
            fVar253 = auVar20._0_4_;
            fVar257 = auVar20._4_4_;
            auVar73._4_4_ = fVar257 * 1.5;
            auVar73._0_4_ = fVar253 * 1.5;
            fVar285 = auVar20._8_4_;
            auVar73._8_4_ = fVar285 * 1.5;
            fVar289 = auVar20._12_4_;
            auVar73._12_4_ = fVar289 * 1.5;
            fVar193 = auVar20._16_4_;
            auVar73._16_4_ = fVar193 * 1.5;
            fVar194 = auVar20._20_4_;
            auVar73._20_4_ = fVar194 * 1.5;
            fVar213 = auVar20._24_4_;
            auVar73._24_4_ = fVar213 * 1.5;
            auVar73._28_4_ = auVar311._28_4_;
            auVar74._4_4_ = fVar257 * fVar257 * fVar257 * auVar273._4_4_ * 0.5;
            auVar74._0_4_ = fVar253 * fVar253 * fVar253 * auVar273._0_4_ * 0.5;
            auVar74._8_4_ = fVar285 * fVar285 * fVar285 * auVar273._8_4_ * 0.5;
            auVar74._12_4_ = fVar289 * fVar289 * fVar289 * auVar273._12_4_ * 0.5;
            auVar74._16_4_ = fVar193 * fVar193 * fVar193 * auVar273._16_4_ * 0.5;
            auVar74._20_4_ = fVar194 * fVar194 * fVar194 * auVar273._20_4_ * 0.5;
            auVar74._24_4_ = fVar213 * fVar213 * fVar213 * auVar273._24_4_ * 0.5;
            auVar74._28_4_ = auVar273._28_4_;
            auVar31 = vsubps_avx(auVar73,auVar74);
            fVar253 = auVar31._0_4_;
            fVar257 = auVar31._4_4_;
            fVar285 = auVar31._8_4_;
            fVar289 = auVar31._12_4_;
            fVar193 = auVar31._16_4_;
            fVar194 = auVar31._20_4_;
            fVar213 = auVar31._24_4_;
            local_4a0 = fVar134 * fVar296 * fVar135;
            fStack_49c = fVar149 * fVar133 * fVar215;
            auVar75._4_4_ = fStack_49c;
            auVar75._0_4_ = local_4a0;
            fStack_498 = fStack_7d8 * fVar132 * fVar250;
            auVar75._8_4_ = fStack_498;
            fVar135 = fStack_7d4 * fVar148 * fVar150;
            auVar75._12_4_ = fVar135;
            fStack_490 = fStack_7d0 * fVar227 * fVar152;
            auVar75._16_4_ = fStack_490;
            fStack_48c = fStack_7cc * fVar236 * fVar154;
            auVar75._20_4_ = fStack_48c;
            fStack_488 = fStack_7c8 * fVar259 * fVar246;
            auVar75._24_4_ = fStack_488;
            auVar75._28_4_ = auVar20._28_4_;
            local_4a0 = local_4a0 + auVar282._0_4_;
            fStack_49c = fStack_49c + auVar282._4_4_;
            fStack_498 = fStack_498 + auVar282._8_4_;
            aStack_494.w = fVar135 + auVar282._12_4_;
            fStack_490 = fStack_490 + auVar282._16_4_;
            fStack_48c = fStack_48c + auVar282._20_4_;
            fStack_488 = fStack_488 + auVar282._24_4_;
            fStack_484 = auVar20._28_4_ + auVar282._28_4_;
            fVar135 = fVar134 * fVar296 * -fVar181;
            fVar215 = fVar149 * fVar133 * -fVar173;
            auVar76._4_4_ = fVar215;
            auVar76._0_4_ = fVar135;
            fVar250 = fStack_7d8 * fVar132 * -fVar268;
            auVar76._8_4_ = fVar250;
            fVar150 = fStack_7d4 * fVar148 * -fVar175;
            auVar76._12_4_ = fVar150;
            fVar152 = fStack_7d0 * fVar227 * -fVar177;
            auVar76._16_4_ = fVar152;
            fVar154 = fStack_7cc * fVar236 * -fVar179;
            auVar76._20_4_ = fVar154;
            fVar246 = fStack_7c8 * fVar259 * -fVar211;
            auVar76._24_4_ = fVar246;
            auVar76._28_4_ = -fVar169;
            local_5e0._4_4_ = local_7a0._4_4_ + fVar215;
            local_5e0._0_4_ = local_7a0._0_4_ + fVar135;
            fStack_5d8 = local_7a0._8_4_ + fVar250;
            fStack_5d4 = local_7a0._12_4_ + fVar150;
            fStack_5d0 = local_7a0._16_4_ + fVar152;
            fStack_5cc = local_7a0._20_4_ + fVar154;
            fStack_5c8 = local_7a0._24_4_ + fVar246;
            fStack_5c4 = local_7a0._28_4_ + -fVar169;
            fVar135 = fVar296 * 0.0 * fVar134;
            fVar215 = fVar133 * 0.0 * fVar149;
            auVar77._4_4_ = fVar215;
            auVar77._0_4_ = fVar135;
            fVar250 = fVar132 * 0.0 * fStack_7d8;
            auVar77._8_4_ = fVar250;
            fVar150 = fVar148 * 0.0 * fStack_7d4;
            auVar77._12_4_ = fVar150;
            fVar152 = fVar227 * 0.0 * fStack_7d0;
            auVar77._16_4_ = fVar152;
            fVar154 = fVar236 * 0.0 * fStack_7cc;
            auVar77._20_4_ = fVar154;
            fVar246 = fVar259 * 0.0 * fStack_7c8;
            auVar77._24_4_ = fVar246;
            auVar77._28_4_ = fVar169;
            auVar32 = vsubps_avx(auVar282,auVar75);
            auVar327._0_4_ = fVar135 + auVar145._0_4_;
            auVar327._4_4_ = fVar215 + auVar145._4_4_;
            auVar327._8_4_ = fVar250 + auVar145._8_4_;
            auVar327._12_4_ = fVar150 + auVar145._12_4_;
            auVar327._16_4_ = fVar152 + auVar145._16_4_;
            auVar327._20_4_ = fVar154 + auVar145._20_4_;
            auVar327._24_4_ = fVar246 + auVar145._24_4_;
            auVar327._28_4_ = fVar169 + auVar145._28_4_;
            fVar135 = auVar314._0_4_ * fVar253 * fVar195;
            fVar195 = auVar314._4_4_ * fVar257 * fVar228;
            auVar78._4_4_ = fVar195;
            auVar78._0_4_ = fVar135;
            fVar215 = auVar314._8_4_ * fVar285 * fVar212;
            auVar78._8_4_ = fVar215;
            fVar228 = auVar314._12_4_ * fVar289 * fVar151;
            auVar78._12_4_ = fVar228;
            fVar250 = auVar314._16_4_ * fVar193 * fVar153;
            auVar78._16_4_ = fVar250;
            fVar212 = auVar314._20_4_ * fVar194 * fVar237;
            auVar78._20_4_ = fVar212;
            fVar150 = auVar314._24_4_ * fVar213 * fVar248;
            auVar78._24_4_ = fVar150;
            auVar78._28_4_ = fStack_7c4;
            auVar33 = vsubps_avx(local_7a0._0_32_,auVar76);
            auVar316._0_4_ = auVar326._0_4_ + fVar135;
            auVar316._4_4_ = auVar326._4_4_ + fVar195;
            auVar316._8_4_ = auVar326._8_4_ + fVar215;
            auVar316._12_4_ = auVar326._12_4_ + fVar228;
            auVar316._16_4_ = auVar326._16_4_ + fVar250;
            auVar316._20_4_ = auVar326._20_4_ + fVar212;
            auVar316._24_4_ = auVar326._24_4_ + fVar150;
            auVar316._28_4_ = auVar326._28_4_ + fStack_7c4;
            fVar135 = fVar253 * -fVar251 * auVar314._0_4_;
            fVar195 = fVar257 * -fVar255 * auVar314._4_4_;
            auVar79._4_4_ = fVar195;
            auVar79._0_4_ = fVar135;
            fVar215 = fVar285 * -fVar277 * auVar314._8_4_;
            auVar79._8_4_ = fVar215;
            fVar228 = fVar289 * -fVar287 * auVar314._12_4_;
            auVar79._12_4_ = fVar228;
            fVar250 = fVar193 * -fVar291 * auVar314._16_4_;
            auVar79._16_4_ = fVar250;
            fVar212 = fVar194 * -fVar294 * auVar314._20_4_;
            auVar79._20_4_ = fVar212;
            fVar150 = fVar213 * -fVar214 * auVar314._24_4_;
            auVar79._24_4_ = fVar150;
            auVar79._28_4_ = auVar282._28_4_;
            auVar34 = vsubps_avx(auVar145,auVar77);
            auVar222._0_4_ = auVar191._0_4_ + fVar135;
            auVar222._4_4_ = auVar191._4_4_ + fVar195;
            auVar222._8_4_ = auVar191._8_4_ + fVar215;
            auVar222._12_4_ = auVar191._12_4_ + fVar228;
            auVar222._16_4_ = auVar191._16_4_ + fVar250;
            auVar222._20_4_ = auVar191._20_4_ + fVar212;
            auVar222._24_4_ = auVar191._24_4_ + fVar150;
            auVar222._28_4_ = auVar191._28_4_ + auVar282._28_4_;
            fVar135 = fVar253 * 0.0 * auVar314._0_4_;
            fVar195 = fVar257 * 0.0 * auVar314._4_4_;
            auVar80._4_4_ = fVar195;
            auVar80._0_4_ = fVar135;
            fVar215 = fVar285 * 0.0 * auVar314._8_4_;
            auVar80._8_4_ = fVar215;
            fVar228 = fVar289 * 0.0 * auVar314._12_4_;
            auVar80._12_4_ = fVar228;
            fVar250 = fVar193 * 0.0 * auVar314._16_4_;
            auVar80._16_4_ = fVar250;
            fVar212 = fVar194 * 0.0 * auVar314._20_4_;
            auVar80._20_4_ = fVar212;
            fVar150 = fVar213 * 0.0 * auVar314._24_4_;
            auVar80._24_4_ = fVar150;
            auVar80._28_4_ = auVar145._28_4_;
            auVar20 = vsubps_avx(auVar326,auVar78);
            auVar284._0_4_ = (float)local_460._0_4_ + fVar135;
            auVar284._4_4_ = (float)local_460._4_4_ + fVar195;
            auVar284._8_4_ = fStack_458 + fVar215;
            auVar284._12_4_ = fStack_454 + fVar228;
            auVar284._16_4_ = fStack_450 + fVar250;
            auVar284._20_4_ = fStack_44c + fVar212;
            auVar284._24_4_ = fStack_448 + fVar150;
            auVar284._28_4_ = fStack_444 + auVar145._28_4_;
            auVar30 = vsubps_avx(auVar191,auVar79);
            auVar37 = vsubps_avx(_local_460,auVar80);
            auVar19 = vsubps_avx(auVar222,auVar33);
            auVar21 = vsubps_avx(auVar284,auVar34);
            auVar81._4_4_ = auVar34._4_4_ * auVar19._4_4_;
            auVar81._0_4_ = auVar34._0_4_ * auVar19._0_4_;
            auVar81._8_4_ = auVar34._8_4_ * auVar19._8_4_;
            auVar81._12_4_ = auVar34._12_4_ * auVar19._12_4_;
            auVar81._16_4_ = auVar34._16_4_ * auVar19._16_4_;
            auVar81._20_4_ = auVar34._20_4_ * auVar19._20_4_;
            auVar81._24_4_ = auVar34._24_4_ * auVar19._24_4_;
            auVar81._28_4_ = auVar311._28_4_;
            auVar82._4_4_ = auVar33._4_4_ * auVar21._4_4_;
            auVar82._0_4_ = auVar33._0_4_ * auVar21._0_4_;
            auVar82._8_4_ = auVar33._8_4_ * auVar21._8_4_;
            auVar82._12_4_ = auVar33._12_4_ * auVar21._12_4_;
            auVar82._16_4_ = auVar33._16_4_ * auVar21._16_4_;
            auVar82._20_4_ = auVar33._20_4_ * auVar21._20_4_;
            auVar82._24_4_ = auVar33._24_4_ * auVar21._24_4_;
            auVar82._28_4_ = auVar191._28_4_;
            auVar202 = vsubps_avx(auVar82,auVar81);
            auVar83._4_4_ = auVar32._4_4_ * auVar21._4_4_;
            auVar83._0_4_ = auVar32._0_4_ * auVar21._0_4_;
            auVar83._8_4_ = auVar32._8_4_ * auVar21._8_4_;
            auVar83._12_4_ = auVar32._12_4_ * auVar21._12_4_;
            auVar83._16_4_ = auVar32._16_4_ * auVar21._16_4_;
            auVar83._20_4_ = auVar32._20_4_ * auVar21._20_4_;
            auVar83._24_4_ = auVar32._24_4_ * auVar21._24_4_;
            auVar83._28_4_ = auVar21._28_4_;
            auVar21 = vsubps_avx(auVar316,auVar32);
            auVar84._4_4_ = auVar34._4_4_ * auVar21._4_4_;
            auVar84._0_4_ = auVar34._0_4_ * auVar21._0_4_;
            auVar84._8_4_ = auVar34._8_4_ * auVar21._8_4_;
            auVar84._12_4_ = auVar34._12_4_ * auVar21._12_4_;
            auVar84._16_4_ = auVar34._16_4_ * auVar21._16_4_;
            auVar84._20_4_ = auVar34._20_4_ * auVar21._20_4_;
            auVar84._24_4_ = auVar34._24_4_ * auVar21._24_4_;
            auVar84._28_4_ = auVar31._28_4_;
            auVar279 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar33._4_4_ * auVar21._4_4_;
            auVar85._0_4_ = auVar33._0_4_ * auVar21._0_4_;
            auVar85._8_4_ = auVar33._8_4_ * auVar21._8_4_;
            auVar85._12_4_ = auVar33._12_4_ * auVar21._12_4_;
            auVar85._16_4_ = auVar33._16_4_ * auVar21._16_4_;
            auVar85._20_4_ = auVar33._20_4_ * auVar21._20_4_;
            auVar85._24_4_ = auVar33._24_4_ * auVar21._24_4_;
            auVar85._28_4_ = auVar31._28_4_;
            auVar86._4_4_ = auVar32._4_4_ * auVar19._4_4_;
            auVar86._0_4_ = auVar32._0_4_ * auVar19._0_4_;
            auVar86._8_4_ = auVar32._8_4_ * auVar19._8_4_;
            auVar86._12_4_ = auVar32._12_4_ * auVar19._12_4_;
            auVar86._16_4_ = auVar32._16_4_ * auVar19._16_4_;
            auVar86._20_4_ = auVar32._20_4_ * auVar19._20_4_;
            auVar86._24_4_ = auVar32._24_4_ * auVar19._24_4_;
            auVar86._28_4_ = auVar19._28_4_;
            auVar31 = vsubps_avx(auVar86,auVar85);
            auVar164._0_4_ = auVar202._0_4_ * 0.0 + auVar31._0_4_ + auVar279._0_4_ * 0.0;
            auVar164._4_4_ = auVar202._4_4_ * 0.0 + auVar31._4_4_ + auVar279._4_4_ * 0.0;
            auVar164._8_4_ = auVar202._8_4_ * 0.0 + auVar31._8_4_ + auVar279._8_4_ * 0.0;
            auVar164._12_4_ = auVar202._12_4_ * 0.0 + auVar31._12_4_ + auVar279._12_4_ * 0.0;
            auVar164._16_4_ = auVar202._16_4_ * 0.0 + auVar31._16_4_ + auVar279._16_4_ * 0.0;
            auVar164._20_4_ = auVar202._20_4_ * 0.0 + auVar31._20_4_ + auVar279._20_4_ * 0.0;
            auVar164._24_4_ = auVar202._24_4_ * 0.0 + auVar31._24_4_ + auVar279._24_4_ * 0.0;
            auVar164._28_4_ = auVar202._28_4_ + auVar31._28_4_ + auVar279._28_4_;
            auVar308 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
            auVar113._4_4_ = fStack_49c;
            auVar113._0_4_ = local_4a0;
            auVar113._8_4_ = fStack_498;
            auVar113._12_4_ = aStack_494;
            auVar113._16_4_ = fStack_490;
            auVar113._20_4_ = fStack_48c;
            auVar113._24_4_ = fStack_488;
            auVar113._28_4_ = fStack_484;
            auVar20 = vblendvps_avx(auVar20,auVar113,auVar308);
            auVar207 = ZEXT3264(auVar20);
            auVar31 = vblendvps_avx(auVar30,_local_5e0,auVar308);
            auVar30 = vblendvps_avx(auVar37,auVar327,auVar308);
            auVar37 = vblendvps_avx(auVar32,auVar316,auVar308);
            auVar19 = vblendvps_avx(auVar33,auVar222,auVar308);
            auVar21 = vblendvps_avx(auVar34,auVar284,auVar308);
            auVar32 = vblendvps_avx(auVar316,auVar32,auVar308);
            auVar202 = vblendvps_avx(auVar222,auVar33,auVar308);
            auVar279 = vblendvps_avx(auVar284,auVar34,auVar308);
            local_7a0._0_32_ = vandps_avx(auVar166,auVar192);
            auVar32 = vsubps_avx(auVar32,auVar20);
            auVar35 = vsubps_avx(auVar202,auVar31);
            auVar279 = vsubps_avx(auVar279,auVar30);
            auVar166 = vsubps_avx(auVar31,auVar19);
            fVar135 = auVar35._0_4_;
            fVar238 = auVar30._0_4_;
            fVar151 = auVar35._4_4_;
            fVar247 = auVar30._4_4_;
            auVar87._4_4_ = fVar247 * fVar151;
            auVar87._0_4_ = fVar238 * fVar135;
            fVar251 = auVar35._8_4_;
            fVar249 = auVar30._8_4_;
            auVar87._8_4_ = fVar249 * fVar251;
            fVar289 = auVar35._12_4_;
            fVar252 = auVar30._12_4_;
            auVar87._12_4_ = fVar252 * fVar289;
            fVar296 = auVar35._16_4_;
            fVar254 = auVar30._16_4_;
            auVar87._16_4_ = fVar254 * fVar296;
            fVar181 = auVar35._20_4_;
            fVar256 = auVar30._20_4_;
            auVar87._20_4_ = fVar256 * fVar181;
            fVar169 = auVar35._24_4_;
            fVar258 = auVar30._24_4_;
            auVar87._24_4_ = fVar258 * fVar169;
            auVar87._28_4_ = auVar202._28_4_;
            fVar195 = auVar31._0_4_;
            fVar260 = auVar279._0_4_;
            fVar152 = auVar31._4_4_;
            fVar286 = auVar279._4_4_;
            auVar88._4_4_ = fVar286 * fVar152;
            auVar88._0_4_ = fVar260 * fVar195;
            fVar253 = auVar31._8_4_;
            fVar288 = auVar279._8_4_;
            auVar88._8_4_ = fVar288 * fVar253;
            fVar291 = auVar31._12_4_;
            fVar290 = auVar279._12_4_;
            auVar88._12_4_ = fVar290 * fVar291;
            fVar133 = auVar31._16_4_;
            fVar292 = auVar279._16_4_;
            auVar88._16_4_ = fVar292 * fVar133;
            fVar173 = auVar31._20_4_;
            fVar293 = auVar279._20_4_;
            auVar88._20_4_ = fVar293 * fVar173;
            fVar171 = auVar31._24_4_;
            fVar295 = auVar279._24_4_;
            uVar12 = auVar33._28_4_;
            auVar88._24_4_ = fVar295 * fVar171;
            auVar88._28_4_ = uVar12;
            auVar202 = vsubps_avx(auVar88,auVar87);
            fVar215 = auVar20._0_4_;
            fVar153 = auVar20._4_4_;
            auVar89._4_4_ = fVar286 * fVar153;
            auVar89._0_4_ = fVar260 * fVar215;
            fVar255 = auVar20._8_4_;
            auVar89._8_4_ = fVar288 * fVar255;
            fVar193 = auVar20._12_4_;
            auVar89._12_4_ = fVar290 * fVar193;
            fVar132 = auVar20._16_4_;
            auVar89._16_4_ = fVar292 * fVar132;
            fVar268 = auVar20._20_4_;
            auVar89._20_4_ = fVar293 * fVar268;
            fVar174 = auVar20._24_4_;
            auVar89._24_4_ = fVar295 * fVar174;
            auVar89._28_4_ = uVar12;
            fVar228 = auVar32._0_4_;
            fVar154 = auVar32._4_4_;
            auVar90._4_4_ = fVar247 * fVar154;
            auVar90._0_4_ = fVar238 * fVar228;
            fVar257 = auVar32._8_4_;
            auVar90._8_4_ = fVar249 * fVar257;
            fVar294 = auVar32._12_4_;
            auVar90._12_4_ = fVar252 * fVar294;
            fVar148 = auVar32._16_4_;
            auVar90._16_4_ = fVar254 * fVar148;
            fVar175 = auVar32._20_4_;
            auVar90._20_4_ = fVar256 * fVar175;
            fVar176 = auVar32._24_4_;
            auVar90._24_4_ = fVar258 * fVar176;
            auVar90._28_4_ = auVar316._28_4_;
            auVar33 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = fVar152 * fVar154;
            auVar91._0_4_ = fVar195 * fVar228;
            auVar91._8_4_ = fVar253 * fVar257;
            auVar91._12_4_ = fVar291 * fVar294;
            auVar91._16_4_ = fVar133 * fVar148;
            auVar91._20_4_ = fVar173 * fVar175;
            auVar91._24_4_ = fVar171 * fVar176;
            auVar91._28_4_ = uVar12;
            auVar92._4_4_ = fVar153 * fVar151;
            auVar92._0_4_ = fVar215 * fVar135;
            auVar92._8_4_ = fVar255 * fVar251;
            auVar92._12_4_ = fVar193 * fVar289;
            auVar92._16_4_ = fVar132 * fVar296;
            auVar92._20_4_ = fVar268 * fVar181;
            auVar92._24_4_ = fVar174 * fVar169;
            auVar92._28_4_ = auVar34._28_4_;
            auVar34 = vsubps_avx(auVar92,auVar91);
            auVar36 = vsubps_avx(auVar30,auVar21);
            fVar212 = auVar34._28_4_ + auVar33._28_4_;
            auVar300._0_4_ = auVar34._0_4_ + auVar33._0_4_ * 0.0 + auVar202._0_4_ * 0.0;
            auVar300._4_4_ = auVar34._4_4_ + auVar33._4_4_ * 0.0 + auVar202._4_4_ * 0.0;
            auVar300._8_4_ = auVar34._8_4_ + auVar33._8_4_ * 0.0 + auVar202._8_4_ * 0.0;
            auVar300._12_4_ = auVar34._12_4_ + auVar33._12_4_ * 0.0 + auVar202._12_4_ * 0.0;
            auVar300._16_4_ = auVar34._16_4_ + auVar33._16_4_ * 0.0 + auVar202._16_4_ * 0.0;
            auVar300._20_4_ = auVar34._20_4_ + auVar33._20_4_ * 0.0 + auVar202._20_4_ * 0.0;
            auVar300._24_4_ = auVar34._24_4_ + auVar33._24_4_ * 0.0 + auVar202._24_4_ * 0.0;
            auVar300._28_4_ = fVar212 + auVar202._28_4_;
            fVar250 = auVar166._0_4_;
            fVar237 = auVar166._4_4_;
            auVar93._4_4_ = auVar21._4_4_ * fVar237;
            auVar93._0_4_ = auVar21._0_4_ * fVar250;
            fVar277 = auVar166._8_4_;
            auVar93._8_4_ = auVar21._8_4_ * fVar277;
            fVar194 = auVar166._12_4_;
            auVar93._12_4_ = auVar21._12_4_ * fVar194;
            fVar227 = auVar166._16_4_;
            auVar93._16_4_ = auVar21._16_4_ * fVar227;
            fVar177 = auVar166._20_4_;
            auVar93._20_4_ = auVar21._20_4_ * fVar177;
            fVar178 = auVar166._24_4_;
            auVar93._24_4_ = auVar21._24_4_ * fVar178;
            auVar93._28_4_ = fVar212;
            fVar212 = auVar36._0_4_;
            fVar246 = auVar36._4_4_;
            auVar94._4_4_ = auVar19._4_4_ * fVar246;
            auVar94._0_4_ = auVar19._0_4_ * fVar212;
            fVar285 = auVar36._8_4_;
            auVar94._8_4_ = auVar19._8_4_ * fVar285;
            fVar214 = auVar36._12_4_;
            auVar94._12_4_ = auVar19._12_4_ * fVar214;
            fVar236 = auVar36._16_4_;
            auVar94._16_4_ = auVar19._16_4_ * fVar236;
            fVar179 = auVar36._20_4_;
            auVar94._20_4_ = auVar19._20_4_ * fVar179;
            fVar180 = auVar36._24_4_;
            auVar94._24_4_ = auVar19._24_4_ * fVar180;
            auVar94._28_4_ = auVar34._28_4_;
            auVar166 = vsubps_avx(auVar94,auVar93);
            auVar33 = vsubps_avx(auVar20,auVar37);
            fVar150 = auVar33._0_4_;
            fVar248 = auVar33._4_4_;
            auVar95._4_4_ = auVar21._4_4_ * fVar248;
            auVar95._0_4_ = auVar21._0_4_ * fVar150;
            fVar287 = auVar33._8_4_;
            auVar95._8_4_ = auVar21._8_4_ * fVar287;
            fVar213 = auVar33._12_4_;
            auVar95._12_4_ = auVar21._12_4_ * fVar213;
            fVar259 = auVar33._16_4_;
            auVar95._16_4_ = auVar21._16_4_ * fVar259;
            fVar211 = auVar33._20_4_;
            auVar95._20_4_ = auVar21._20_4_ * fVar211;
            fVar182 = auVar33._24_4_;
            auVar95._24_4_ = auVar21._24_4_ * fVar182;
            auVar95._28_4_ = auVar21._28_4_;
            auVar96._4_4_ = fVar246 * auVar37._4_4_;
            auVar96._0_4_ = fVar212 * auVar37._0_4_;
            auVar96._8_4_ = fVar285 * auVar37._8_4_;
            auVar96._12_4_ = fVar214 * auVar37._12_4_;
            auVar96._16_4_ = fVar236 * auVar37._16_4_;
            auVar96._20_4_ = fVar179 * auVar37._20_4_;
            auVar96._24_4_ = fVar180 * auVar37._24_4_;
            auVar96._28_4_ = auVar202._28_4_;
            auVar21 = vsubps_avx(auVar95,auVar96);
            auVar97._4_4_ = auVar19._4_4_ * fVar248;
            auVar97._0_4_ = auVar19._0_4_ * fVar150;
            auVar97._8_4_ = auVar19._8_4_ * fVar287;
            auVar97._12_4_ = auVar19._12_4_ * fVar213;
            auVar97._16_4_ = auVar19._16_4_ * fVar259;
            auVar97._20_4_ = auVar19._20_4_ * fVar211;
            auVar97._24_4_ = auVar19._24_4_ * fVar182;
            auVar97._28_4_ = auVar19._28_4_;
            auVar98._4_4_ = fVar237 * auVar37._4_4_;
            auVar98._0_4_ = fVar250 * auVar37._0_4_;
            auVar98._8_4_ = fVar277 * auVar37._8_4_;
            auVar98._12_4_ = fVar194 * auVar37._12_4_;
            auVar98._16_4_ = fVar227 * auVar37._16_4_;
            auVar98._20_4_ = fVar177 * auVar37._20_4_;
            auVar98._24_4_ = fVar178 * auVar37._24_4_;
            auVar98._28_4_ = auVar37._28_4_;
            auVar37 = vsubps_avx(auVar98,auVar97);
            auVar146._0_4_ = auVar166._0_4_ * 0.0 + auVar37._0_4_ + auVar21._0_4_ * 0.0;
            auVar146._4_4_ = auVar166._4_4_ * 0.0 + auVar37._4_4_ + auVar21._4_4_ * 0.0;
            auVar146._8_4_ = auVar166._8_4_ * 0.0 + auVar37._8_4_ + auVar21._8_4_ * 0.0;
            auVar146._12_4_ = auVar166._12_4_ * 0.0 + auVar37._12_4_ + auVar21._12_4_ * 0.0;
            auVar146._16_4_ = auVar166._16_4_ * 0.0 + auVar37._16_4_ + auVar21._16_4_ * 0.0;
            auVar146._20_4_ = auVar166._20_4_ * 0.0 + auVar37._20_4_ + auVar21._20_4_ * 0.0;
            auVar146._24_4_ = auVar166._24_4_ * 0.0 + auVar37._24_4_ + auVar21._24_4_ * 0.0;
            auVar146._28_4_ = auVar21._28_4_ + auVar37._28_4_ + auVar21._28_4_;
            auVar147 = ZEXT3264(auVar146);
            auVar166 = vmaxps_avx(auVar300,auVar146);
            auVar166 = vcmpps_avx(auVar166,ZEXT432(0) << 0x20,2);
            auVar37 = local_7a0._0_32_ & auVar166;
            if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar37 >> 0x7f,0) == '\0') &&
                  (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0xbf,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar37[0x1f]) {
LAB_00fa6cfb:
              auVar167 = ZEXT3264(CONCAT824(uStack_4a8,
                                            CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
            }
            else {
              auVar37 = vandps_avx(auVar166,local_7a0._0_32_);
              auVar99._4_4_ = fVar246 * fVar151;
              auVar99._0_4_ = fVar212 * fVar135;
              auVar99._8_4_ = fVar285 * fVar251;
              auVar99._12_4_ = fVar214 * fVar289;
              auVar99._16_4_ = fVar236 * fVar296;
              auVar99._20_4_ = fVar179 * fVar181;
              auVar99._24_4_ = fVar180 * fVar169;
              auVar99._28_4_ = local_7a0._28_4_;
              auVar100._4_4_ = fVar237 * fVar286;
              auVar100._0_4_ = fVar250 * fVar260;
              auVar100._8_4_ = fVar277 * fVar288;
              auVar100._12_4_ = fVar194 * fVar290;
              auVar100._16_4_ = fVar227 * fVar292;
              auVar100._20_4_ = fVar177 * fVar293;
              auVar100._24_4_ = fVar178 * fVar295;
              auVar100._28_4_ = auVar166._28_4_;
              auVar19 = vsubps_avx(auVar100,auVar99);
              auVar101._4_4_ = fVar248 * fVar286;
              auVar101._0_4_ = fVar150 * fVar260;
              auVar101._8_4_ = fVar287 * fVar288;
              auVar101._12_4_ = fVar213 * fVar290;
              auVar101._16_4_ = fVar259 * fVar292;
              auVar101._20_4_ = fVar211 * fVar293;
              auVar101._24_4_ = fVar182 * fVar295;
              auVar101._28_4_ = auVar279._28_4_;
              auVar102._4_4_ = fVar246 * fVar154;
              auVar102._0_4_ = fVar212 * fVar228;
              auVar102._8_4_ = fVar285 * fVar257;
              auVar102._12_4_ = fVar214 * fVar294;
              auVar102._16_4_ = fVar236 * fVar148;
              auVar102._20_4_ = fVar179 * fVar175;
              auVar102._24_4_ = fVar180 * fVar176;
              auVar102._28_4_ = auVar36._28_4_;
              auVar21 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar237 * fVar154;
              auVar103._0_4_ = fVar250 * fVar228;
              auVar103._8_4_ = fVar277 * fVar257;
              auVar103._12_4_ = fVar194 * fVar294;
              auVar103._16_4_ = fVar227 * fVar148;
              auVar103._20_4_ = fVar177 * fVar175;
              auVar103._24_4_ = fVar178 * fVar176;
              auVar103._28_4_ = auVar32._28_4_;
              auVar104._4_4_ = fVar248 * fVar151;
              auVar104._0_4_ = fVar150 * fVar135;
              auVar104._8_4_ = fVar287 * fVar251;
              auVar104._12_4_ = fVar213 * fVar289;
              auVar104._16_4_ = fVar259 * fVar296;
              auVar104._20_4_ = fVar211 * fVar181;
              auVar104._24_4_ = fVar182 * fVar169;
              auVar104._28_4_ = auVar35._28_4_;
              auVar202 = vsubps_avx(auVar104,auVar103);
              auVar165._0_4_ = auVar19._0_4_ * 0.0 + auVar202._0_4_ + auVar21._0_4_ * 0.0;
              auVar165._4_4_ = auVar19._4_4_ * 0.0 + auVar202._4_4_ + auVar21._4_4_ * 0.0;
              auVar165._8_4_ = auVar19._8_4_ * 0.0 + auVar202._8_4_ + auVar21._8_4_ * 0.0;
              auVar165._12_4_ = auVar19._12_4_ * 0.0 + auVar202._12_4_ + auVar21._12_4_ * 0.0;
              auVar165._16_4_ = auVar19._16_4_ * 0.0 + auVar202._16_4_ + auVar21._16_4_ * 0.0;
              auVar165._20_4_ = auVar19._20_4_ * 0.0 + auVar202._20_4_ + auVar21._20_4_ * 0.0;
              auVar165._24_4_ = auVar19._24_4_ * 0.0 + auVar202._24_4_ + auVar21._24_4_ * 0.0;
              auVar165._28_4_ = auVar35._28_4_ + auVar202._28_4_ + auVar32._28_4_;
              auVar166 = vrcpps_avx(auVar165);
              fVar228 = auVar166._0_4_;
              fVar250 = auVar166._4_4_;
              auVar105._4_4_ = auVar165._4_4_ * fVar250;
              auVar105._0_4_ = auVar165._0_4_ * fVar228;
              fVar212 = auVar166._8_4_;
              auVar105._8_4_ = auVar165._8_4_ * fVar212;
              fVar150 = auVar166._12_4_;
              auVar105._12_4_ = auVar165._12_4_ * fVar150;
              fVar151 = auVar166._16_4_;
              auVar105._16_4_ = auVar165._16_4_ * fVar151;
              fVar154 = auVar166._20_4_;
              auVar105._20_4_ = auVar165._20_4_ * fVar154;
              fVar237 = auVar166._24_4_;
              auVar105._24_4_ = auVar165._24_4_ * fVar237;
              auVar105._28_4_ = auVar36._28_4_;
              auVar312._8_4_ = 0x3f800000;
              auVar312._0_8_ = 0x3f8000003f800000;
              auVar312._12_4_ = 0x3f800000;
              auVar312._16_4_ = 0x3f800000;
              auVar312._20_4_ = 0x3f800000;
              auVar312._24_4_ = 0x3f800000;
              auVar312._28_4_ = 0x3f800000;
              auVar166 = vsubps_avx(auVar312,auVar105);
              fVar228 = auVar166._0_4_ * fVar228 + fVar228;
              fVar250 = auVar166._4_4_ * fVar250 + fVar250;
              fVar212 = auVar166._8_4_ * fVar212 + fVar212;
              fVar150 = auVar166._12_4_ * fVar150 + fVar150;
              fVar151 = auVar166._16_4_ * fVar151 + fVar151;
              fVar154 = auVar166._20_4_ * fVar154 + fVar154;
              fVar237 = auVar166._24_4_ * fVar237 + fVar237;
              auVar106._4_4_ =
                   (fVar153 * auVar19._4_4_ + auVar21._4_4_ * fVar152 + auVar202._4_4_ * fVar247) *
                   fVar250;
              auVar106._0_4_ =
                   (fVar215 * auVar19._0_4_ + auVar21._0_4_ * fVar195 + auVar202._0_4_ * fVar238) *
                   fVar228;
              auVar106._8_4_ =
                   (fVar255 * auVar19._8_4_ + auVar21._8_4_ * fVar253 + auVar202._8_4_ * fVar249) *
                   fVar212;
              auVar106._12_4_ =
                   (fVar193 * auVar19._12_4_ + auVar21._12_4_ * fVar291 + auVar202._12_4_ * fVar252)
                   * fVar150;
              auVar106._16_4_ =
                   (fVar132 * auVar19._16_4_ + auVar21._16_4_ * fVar133 + auVar202._16_4_ * fVar254)
                   * fVar151;
              auVar106._20_4_ =
                   (fVar268 * auVar19._20_4_ + auVar21._20_4_ * fVar173 + auVar202._20_4_ * fVar256)
                   * fVar154;
              auVar106._24_4_ =
                   (fVar174 * auVar19._24_4_ + auVar21._24_4_ * fVar171 + auVar202._24_4_ * fVar258)
                   * fVar237;
              auVar106._28_4_ = auVar20._28_4_ + auVar31._28_4_ + auVar30._28_4_;
              auVar207 = ZEXT3264(auVar106);
              fVar135 = ray->tfar;
              auVar223._4_4_ = fVar135;
              auVar223._0_4_ = fVar135;
              auVar223._8_4_ = fVar135;
              auVar223._12_4_ = fVar135;
              auVar223._16_4_ = fVar135;
              auVar223._20_4_ = fVar135;
              auVar223._24_4_ = fVar135;
              auVar223._28_4_ = fVar135;
              auVar166 = vcmpps_avx(local_380,auVar106,2);
              auVar20 = vcmpps_avx(auVar106,auVar223,2);
              auVar166 = vandps_avx(auVar166,auVar20);
              auVar31 = auVar37 & auVar166;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar31 >> 0x7f,0) == '\0') &&
                    (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar31 >> 0xbf,0) == '\0') &&
                  (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar31[0x1f]) goto LAB_00fa6cfb;
              auVar166 = vandps_avx(auVar37,auVar166);
              auVar31 = vcmpps_avx(ZEXT432(0) << 0x20,auVar165,4);
              auVar30 = auVar166 & auVar31;
              auVar167 = ZEXT3264(CONCAT824(uStack_4a8,
                                            CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar166 = vandps_avx(auVar31,auVar166);
                auVar167 = ZEXT3264(auVar166);
                auVar107._4_4_ = fVar250 * auVar300._4_4_;
                auVar107._0_4_ = fVar228 * auVar300._0_4_;
                auVar107._8_4_ = fVar212 * auVar300._8_4_;
                auVar107._12_4_ = fVar150 * auVar300._12_4_;
                auVar107._16_4_ = fVar151 * auVar300._16_4_;
                auVar107._20_4_ = fVar154 * auVar300._20_4_;
                auVar107._24_4_ = fVar237 * auVar300._24_4_;
                auVar107._28_4_ = auVar20._28_4_;
                auVar108._4_4_ = auVar146._4_4_ * fVar250;
                auVar108._0_4_ = auVar146._0_4_ * fVar228;
                auVar108._8_4_ = auVar146._8_4_ * fVar212;
                auVar108._12_4_ = auVar146._12_4_ * fVar150;
                auVar108._16_4_ = auVar146._16_4_ * fVar151;
                auVar108._20_4_ = auVar146._20_4_ * fVar154;
                auVar108._24_4_ = auVar146._24_4_ * fVar237;
                auVar108._28_4_ = auVar146._28_4_;
                auVar245._8_4_ = 0x3f800000;
                auVar245._0_8_ = 0x3f8000003f800000;
                auVar245._12_4_ = 0x3f800000;
                auVar245._16_4_ = 0x3f800000;
                auVar245._20_4_ = 0x3f800000;
                auVar245._24_4_ = 0x3f800000;
                auVar245._28_4_ = 0x3f800000;
                auVar166 = vsubps_avx(auVar245,auVar107);
                local_160 = vblendvps_avx(auVar166,auVar107,auVar308);
                auVar166 = vsubps_avx(auVar245,auVar108);
                _local_3c0 = vblendvps_avx(auVar166,auVar108,auVar308);
                auVar147 = ZEXT3264(_local_3c0);
                local_180 = auVar106;
              }
            }
            auVar317 = ZEXT3264(local_740);
            auVar166 = auVar167._0_32_;
            auVar111._4_4_ = fVar149;
            auVar111._0_4_ = fVar134;
            auVar111._8_4_ = fStack_7d8;
            auVar111._12_4_ = fStack_7d4;
            auVar111._16_4_ = fStack_7d0;
            auVar111._20_4_ = fStack_7cc;
            auVar111._24_4_ = fStack_7c8;
            auVar111._28_4_ = fStack_7c4;
            if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar166 >> 0x7f,0) != '\0') ||
                  (auVar167 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar166 >> 0xbf,0) != '\0') ||
                (auVar167 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar167[0x1f] < '\0') {
              auVar20 = vsubps_avx(auVar314,auVar111);
              auVar207 = ZEXT3264(local_160);
              fVar134 = fVar134 + auVar20._0_4_ * local_160._0_4_;
              fVar149 = fVar149 + auVar20._4_4_ * local_160._4_4_;
              fVar195 = fStack_7d8 + auVar20._8_4_ * local_160._8_4_;
              fVar215 = fStack_7d4 + auVar20._12_4_ * local_160._12_4_;
              fVar228 = fStack_7d0 + auVar20._16_4_ * local_160._16_4_;
              fVar250 = fStack_7cc + auVar20._20_4_ * local_160._20_4_;
              fVar212 = fStack_7c8 + auVar20._24_4_ * local_160._24_4_;
              fVar150 = fStack_7c4 + auVar20._28_4_;
              fVar135 = local_768->depth_scale;
              auVar109._4_4_ = (fVar149 + fVar149) * fVar135;
              auVar109._0_4_ = (fVar134 + fVar134) * fVar135;
              auVar109._8_4_ = (fVar195 + fVar195) * fVar135;
              auVar109._12_4_ = (fVar215 + fVar215) * fVar135;
              auVar109._16_4_ = (fVar228 + fVar228) * fVar135;
              auVar109._20_4_ = (fVar250 + fVar250) * fVar135;
              auVar109._24_4_ = (fVar212 + fVar212) * fVar135;
              auVar109._28_4_ = fVar150 + fVar150;
              auVar20 = vcmpps_avx(local_180,auVar109,6);
              auVar147 = ZEXT3264(auVar20);
              auVar31 = auVar166 & auVar20;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                local_200 = vandps_avx(auVar20,auVar166);
                auVar147 = ZEXT3264(local_200);
                local_1c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
                local_1c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
                local_1c0._8_4_ = fStack_3b8 + fStack_3b8 + -1.0;
                local_1c0._12_4_ = fStack_3b4 + fStack_3b4 + -1.0;
                auVar160._16_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
                auVar160._0_16_ = local_1c0._0_16_;
                auVar160._20_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
                fStack_288 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
                _local_2a0 = auVar160;
                fStack_284 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
                auVar167 = ZEXT3264(_local_2a0);
                local_2c0 = local_160;
                local_280 = local_180;
                local_25c = uVar126;
                local_250 = local_670;
                uStack_248 = uStack_668;
                local_240 = local_590;
                uStack_238 = uStack_588;
                local_230 = local_5a0;
                uStack_228 = uStack_598;
                local_220 = _local_5b0;
                local_7c0._0_8_ = (context->scene->geometries).items[local_770].ptr;
                _local_3c0 = _local_2a0;
                auVar166 = _local_3c0;
                if ((((Geometry *)local_7c0._0_8_)->mask & ray->mask) == 0) {
                  pRVar125 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar125 = context->args;
                  if ((pRVar125->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar125 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar125 >> 8),1),
                     ((Geometry *)local_7c0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    stack0xfffffffffffff848 = auVar300._8_24_;
                    auVar159._0_4_ = (float)(int)local_260;
                    auVar159._4_8_ = SUB128(ZEXT812(0),4);
                    auVar159._12_4_ = 0;
                    auVar331 = vshufps_avx(auVar159,auVar159,0);
                    local_1e0[0] = (auVar331._0_4_ + local_160._0_4_ + 0.0) * (float)local_3e0._0_4_
                    ;
                    local_1e0[1] = (auVar331._4_4_ + local_160._4_4_ + 1.0) * (float)local_3e0._4_4_
                    ;
                    local_1e0[2] = (auVar331._8_4_ + local_160._8_4_ + 2.0) * fStack_3d8;
                    local_1e0[3] = (auVar331._12_4_ + local_160._12_4_ + 3.0) * fStack_3d4;
                    fStack_1d0 = (auVar331._0_4_ + local_160._16_4_ + 4.0) * fStack_3d0;
                    fStack_1cc = (auVar331._4_4_ + local_160._20_4_ + 5.0) * fStack_3cc;
                    fStack_1c8 = (auVar331._8_4_ + local_160._24_4_ + 6.0) * fStack_3c8;
                    fStack_1c4 = auVar331._12_4_ + (float)local_160._28_4_ + 7.0;
                    uStack_3b0 = auVar160._16_8_;
                    uStack_3a8 = local_2a0._24_8_;
                    local_1c0._16_8_ = uStack_3b0;
                    local_1c0._24_8_ = uStack_3a8;
                    auVar167 = ZEXT3264(local_180);
                    local_1a0 = local_180;
                    iVar123 = vmovmskps_avx(local_200);
                    uVar127 = CONCAT44((int)((ulong)pRVar125 >> 0x20),iVar123);
                    lVar16 = 0;
                    if (uVar127 != 0) {
                      for (; (uVar127 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                      }
                    }
                    local_7e0 = (uint)lVar16;
                    uStack_7dc = (undefined4)((ulong)lVar16 >> 0x20);
                    local_7a0._0_8_ = uVar127;
                    _local_3c0 = auVar166;
                    if (iVar123 == 0) {
                      pRVar125 = (RTCIntersectArguments *)0x0;
LAB_00fa6d18:
                      auVar317 = ZEXT3264(local_740);
                    }
                    else {
                      local_480._4_28_ = auVar191._4_28_;
                      local_480._0_4_ = ray->tfar;
                      pGVar130 = (Geometry *)local_7c0._0_8_;
                      do {
                        lVar16 = CONCAT44(uStack_7dc,local_7e0);
                        local_654 = local_1e0[lVar16];
                        auVar147 = ZEXT464((uint)local_654);
                        local_650 = *(uint *)(local_1c0 + lVar16 * 4);
                        auVar167 = ZEXT464(local_650);
                        ray->tfar = *(float *)(local_1a0 + lVar16 * 4);
                        fVar168 = 1.0 - local_654;
                        fVar135 = local_654 * 3.0;
                        auVar331 = ZEXT416((uint)((fVar168 * -2.0 * local_654 +
                                                  local_654 * local_654) * 0.5));
                        auVar331 = vshufps_avx(auVar331,auVar331,0);
                        auVar198 = ZEXT416((uint)(((fVar168 + fVar168) * (fVar135 + 2.0) +
                                                  fVar168 * fVar168 * -3.0) * 0.5));
                        auVar198 = vshufps_avx(auVar198,auVar198,0);
                        auVar199 = ZEXT416((uint)(((local_654 + local_654) * (fVar135 + -5.0) +
                                                  local_654 * fVar135) * 0.5));
                        auVar199 = vshufps_avx(auVar199,auVar199,0);
                        auVar200 = ZEXT416((uint)((local_654 * (fVar168 + fVar168) -
                                                  fVar168 * fVar168) * 0.5));
                        auVar200 = vshufps_avx(auVar200,auVar200,0);
                        auVar201._0_4_ = auVar200._0_4_ * (float)local_670._0_4_;
                        auVar201._4_4_ = auVar200._4_4_ * (float)local_670._4_4_;
                        auVar201._8_4_ = auVar200._8_4_ * (float)uStack_668;
                        auVar201._12_4_ = auVar200._12_4_ * uStack_668._4_4_;
                        auVar207 = ZEXT1664(auVar201);
                        auVar189._0_4_ =
                             auVar201._0_4_ +
                             auVar199._0_4_ * (float)local_590._0_4_ +
                             auVar331._0_4_ * (float)local_5b0._0_4_ +
                             auVar198._0_4_ * (float)local_5a0._0_4_;
                        auVar189._4_4_ =
                             auVar201._4_4_ +
                             auVar199._4_4_ * (float)local_590._4_4_ +
                             auVar331._4_4_ * (float)local_5b0._4_4_ +
                             auVar198._4_4_ * (float)local_5a0._4_4_;
                        auVar189._8_4_ =
                             auVar201._8_4_ +
                             auVar199._8_4_ * (float)uStack_588 +
                             auVar331._8_4_ * fStack_5a8 + auVar198._8_4_ * (float)uStack_598;
                        auVar189._12_4_ =
                             auVar201._12_4_ +
                             auVar199._12_4_ * uStack_588._4_4_ +
                             auVar331._12_4_ * fStack_5a4 + auVar198._12_4_ * uStack_598._4_4_;
                        local_6d0.context = context->user;
                        local_660 = vmovlps_avx(auVar189);
                        local_658 = vextractps_avx(auVar189,2);
                        local_64c = (int)local_628;
                        local_648 = (int)local_770;
                        local_644 = (local_6d0.context)->instID[0];
                        local_640 = (local_6d0.context)->instPrimID[0];
                        local_7e4 = -1;
                        local_6d0.valid = &local_7e4;
                        local_6d0.geometryUserPtr = pGVar130->userPtr;
                        local_6d0.ray = (RTCRayN *)ray;
                        local_6d0.hit = (RTCHitN *)&local_660;
                        local_6d0.N = 1;
                        if (pGVar130->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fa6c1b:
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_7c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar207 = ZEXT1664(auVar207._0_16_);
                            auVar331 = (*p_Var17)(&local_6d0);
                            auVar167._0_8_ = auVar331._8_8_;
                            auVar147._0_8_ = auVar331._0_8_;
                            auVar167._8_56_ = extraout_var_04;
                            auVar147._8_56_ = extraout_var_00;
                            if (*local_6d0.valid == 0) goto LAB_00fa6c63;
                          }
                          pRVar125 = (RTCIntersectArguments *)0x1;
                          goto LAB_00fa6d18;
                        }
                        auVar207 = ZEXT1664(auVar201);
                        auVar331 = (*pGVar130->occlusionFilterN)(&local_6d0);
                        auVar167._0_8_ = auVar331._8_8_;
                        auVar147._0_8_ = auVar331._0_8_;
                        auVar167._8_56_ = extraout_var_03;
                        auVar147._8_56_ = extraout_var;
                        if (*local_6d0.valid != 0) goto LAB_00fa6c1b;
LAB_00fa6c63:
                        auVar147 = ZEXT464((uint)local_480._0_4_);
                        ray->tfar = (float)local_480._0_4_;
                        uVar127 = local_7a0._0_8_ ^ 1L << ((ulong)local_7e0 & 0x3f);
                        lVar16 = 0;
                        if (uVar127 != 0) {
                          for (; (uVar127 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                          }
                        }
                        local_7e0 = (uint)lVar16;
                        uStack_7dc = (undefined4)((ulong)lVar16 >> 0x20);
                        pRVar125 = (RTCIntersectArguments *)0x0;
                        local_7a0._0_8_ = uVar127;
                        auVar317 = ZEXT3264(local_740);
                        pGVar130 = (Geometry *)local_7c0._0_8_;
                      } while (uVar127 != 0);
                    }
                  }
                }
                bVar131 = (bool)(bVar131 | (byte)pRVar125);
                fVar168 = (float)local_760._0_4_;
                fVar208 = (float)local_760._4_4_;
                fVar224 = fStack_758;
                fVar233 = fStack_754;
                fVar170 = fStack_750;
                fVar172 = fStack_74c;
                fVar209 = fStack_748;
                fVar210 = fStack_744;
                fVar269 = (float)local_700._0_4_;
                fVar274 = (float)local_700._4_4_;
                fVar275 = fStack_6f8;
                fVar276 = fStack_6f4;
                fVar225 = fStack_6f0;
                fVar226 = fStack_6ec;
                fVar234 = fStack_6e8;
                fVar301 = (float)local_720._0_4_;
                fVar303 = (float)local_720._4_4_;
                fVar304 = fStack_718;
                fVar305 = fStack_714;
                fVar235 = fStack_710;
                fVar329 = fStack_70c;
                fVar330 = fStack_708;
              }
            }
          }
          lVar128 = lVar128 + 8;
        } while ((int)lVar128 < (int)uVar126);
      }
      if (bVar131 != false) {
        return bVar131;
      }
      fVar135 = ray->tfar;
      auVar139._4_4_ = fVar135;
      auVar139._0_4_ = fVar135;
      auVar139._8_4_ = fVar135;
      auVar139._12_4_ = fVar135;
      auVar331 = vcmpps_avx(local_2d0,auVar139,2);
      uVar126 = vmovmskps_avx(auVar331);
      uVar122 = uVar122 & uVar122 + 0xf & uVar126;
    } while (uVar122 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }